

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void av1_highbd_dr_prediction_z3_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_left,int dx,int dy,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint16_t uVar4;
  undefined8 uVar5;
  ushort uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  uint16_t *puVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ptrdiff_t pitchSrc;
  undefined1 *puVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint16_t *puVar21;
  undefined1 (*pauVar22) [32];
  int iVar23;
  long lVar24;
  undefined1 (*pauVar25) [32];
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  ushort uVar116;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar170 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar187 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar189 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar191 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar279 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar280 [16];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar308 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar311 [16];
  undefined1 auVar329 [32];
  undefined1 auVar312 [16];
  undefined1 auVar330 [32];
  undefined1 auVar313 [16];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar314 [16];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [16];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar376 [16];
  undefined1 auVar381 [32];
  __m128i dstvec [8];
  undefined8 auStackY_27e0 [16];
  undefined8 auStackY_2760 [4];
  undefined1 auStackY_2740 [32];
  undefined1 auStackY_2720 [32];
  undefined1 auStackY_2700 [32];
  undefined8 auStackY_26e0 [2];
  undefined1 auStackY_26d0 [16];
  undefined1 auStackY_26c0 [16];
  undefined1 auStackY_26b0 [16];
  undefined1 auStackY_26a0 [16];
  undefined1 auStackY_2690 [8];
  undefined8 uStackY_2688;
  int in_stack_ffffffffffffd980;
  uint16_t *local_2670;
  ptrdiff_t local_2668;
  undefined1 local_2660 [24];
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined8 auStack_2260 [32];
  undefined1 auStack_2160 [32];
  undefined1 auStack_2140 [32];
  undefined1 auStack_2120 [32];
  undefined1 auStack_2100 [32];
  undefined1 auStack_20e0 [16];
  undefined1 auStack_20d0 [16];
  undefined1 auStack_20c0 [16];
  undefined1 auStack_20b0 [16];
  undefined1 auStack_20a0 [16];
  undefined1 auStack_2090 [16];
  undefined1 auStack_2080 [16];
  undefined1 auStack_2070 [16];
  undefined1 local_2060 [32];
  undefined1 local_2040 [32];
  undefined1 local_2020 [32];
  undefined1 local_2000 [32];
  undefined1 local_1fe0 [32];
  undefined1 local_1fc0 [32];
  undefined1 local_1fa0 [32];
  undefined1 local_1f80 [32];
  undefined1 local_1f60 [32];
  undefined1 local_1f40 [32];
  undefined1 local_1f20 [32];
  undefined1 local_1f00 [32];
  undefined1 local_1ee0 [32];
  undefined1 local_1ec0 [32];
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [32];
  undefined1 local_1e20 [32];
  undefined1 local_1e00 [32];
  undefined1 local_1de0 [32];
  undefined1 local_1dc0 [32];
  undefined1 local_1da0 [32];
  undefined1 local_1d80 [32];
  undefined1 local_1d60 [32];
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [32];
  undefined1 local_1c60 [32];
  undefined1 local_1c40 [32];
  undefined1 local_1c20 [32];
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [32];
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [32];
  undefined1 local_1b40 [32];
  undefined1 local_1b20 [32];
  undefined1 local_1b00 [32];
  undefined1 local_1ae0 [32];
  undefined1 local_1ac0 [32];
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [32];
  undefined1 local_19a0 [32];
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined1 local_1940 [32];
  undefined1 local_1920 [32];
  undefined1 local_1900 [32];
  undefined1 local_18e0 [32];
  undefined1 local_18c0 [32];
  undefined1 local_18a0 [32];
  undefined1 local_1880 [32];
  undefined1 auStack_1860 [6192];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  
  iVar14 = (int)left;
  bVar11 = (byte)upsample_left;
  local_2670 = left;
  local_2668 = stride;
  if (bw == bh) {
    if (bw < 0x10) {
      if (bw == 4) {
        iVar14 = 7 << (bVar11 & 0x1f);
        uVar4 = left[iVar14];
        auVar277._2_2_ = uVar4;
        auVar277._0_2_ = uVar4;
        auVar277._4_2_ = uVar4;
        auVar277._6_2_ = uVar4;
        auVar277._8_2_ = uVar4;
        auVar277._10_2_ = uVar4;
        auVar277._12_2_ = uVar4;
        auVar277._14_2_ = uVar4;
        if (bd < 0xc) {
          auVar310._0_2_ = (undefined2)iVar14;
          auVar310._2_2_ = auVar310._0_2_;
          auVar310._4_2_ = auVar310._0_2_;
          auVar310._6_2_ = auVar310._0_2_;
          auVar310._8_2_ = auVar310._0_2_;
          auVar310._10_2_ = auVar310._0_2_;
          auVar310._12_2_ = auVar310._0_2_;
          auVar310._14_2_ = auVar310._0_2_;
          lVar9 = 0;
          auVar354._8_2_ = 0x10;
          auVar354._0_8_ = 0x10001000100010;
          auVar354._10_2_ = 0x10;
          auVar354._12_2_ = 0x10;
          auVar354._14_2_ = 0x10;
          auVar210._8_2_ = 0x1f;
          auVar210._0_8_ = 0x1f001f001f001f;
          auVar210._10_2_ = 0x1f;
          auVar210._12_2_ = 0x1f;
          auVar210._14_2_ = 0x1f;
          auVar210._16_2_ = 0x1f;
          auVar210._18_2_ = 0x1f;
          auVar210._20_2_ = 0x1f;
          auVar210._22_2_ = 0x1f;
          auVar210._24_2_ = 0x1f;
          auVar210._26_2_ = 0x1f;
          auVar210._28_2_ = 0x1f;
          auVar210._30_2_ = 0x1f;
          lVar19 = 0;
          uVar13 = dy;
          do {
            uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
            lVar24 = lVar9;
            if ((int)uVar17 < iVar14) {
              auVar185 = *(undefined1 (*) [16])(left + (int)uVar17);
              auVar170._0_2_ = (undefined2)uVar17;
              if (upsample_left == 0) {
                auVar278 = *(undefined1 (*) [16])(left + (long)(int)uVar17 + 1);
                auVar377._2_2_ = auVar170._0_2_;
                auVar377._0_2_ = auVar170._0_2_;
                auVar377._4_2_ = auVar170._0_2_;
                auVar377._6_2_ = auVar170._0_2_;
                auVar377._8_2_ = auVar170._0_2_;
                auVar377._10_2_ = auVar170._0_2_;
                auVar377._12_2_ = auVar170._0_2_;
                auVar377._14_2_ = auVar170._0_2_;
                auVar279 = vpaddw_avx(auVar377,ZEXT816(0x7000600050004));
                auVar170 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 1,1);
                auVar170 = vpinsrw_avx(auVar170,uVar17 + 2,2);
                auVar170 = vpinsrw_avx(auVar170,uVar17 + 3,3);
                auVar279 = vpunpcklqdq_avx(auVar170,auVar279);
                uVar6 = (ushort)(uVar13 >> 1);
                uVar116 = uVar6 & 0x1f;
                auVar378._0_8_ =
                     CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
                auVar378._8_2_ = uVar116;
                auVar378._10_2_ = uVar116;
                auVar378._12_2_ = uVar116;
                auVar378._14_2_ = uVar116;
              }
              else {
                auVar185 = vpshufb_avx(auVar185,_DAT_00d475e0);
                auVar278 = vpsrldq_avx(auVar185,8);
                auVar170._2_2_ = auVar170._0_2_;
                auVar170._4_2_ = auVar170._0_2_;
                auVar170._6_2_ = auVar170._0_2_;
                auVar170._8_2_ = auVar170._0_2_;
                auVar170._10_2_ = auVar170._0_2_;
                auVar170._12_2_ = auVar170._0_2_;
                auVar170._14_2_ = auVar170._0_2_;
                auVar279 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 2,1);
                auVar279 = vpinsrw_avx(auVar279,uVar17 + 4,2);
                auVar378 = vpinsrw_avx(auVar279,uVar17 + 6,3);
                auVar279 = vpaddw_avx(auVar170,ZEXT816(0xe000c000a0008));
                auVar279 = vpunpcklqdq_avx(auVar378,auVar279);
                auVar381._0_2_ = (undefined2)uVar13;
                auVar381._2_2_ = auVar381._0_2_;
                auVar381._4_2_ = auVar381._0_2_;
                auVar381._6_2_ = auVar381._0_2_;
                auVar381._8_2_ = auVar381._0_2_;
                auVar381._10_2_ = auVar381._0_2_;
                auVar381._12_2_ = auVar381._0_2_;
                auVar381._14_2_ = auVar381._0_2_;
                auVar381._16_2_ = auVar381._0_2_;
                auVar381._18_2_ = auVar381._0_2_;
                auVar381._20_2_ = auVar381._0_2_;
                auVar381._22_2_ = auVar381._0_2_;
                auVar381._24_2_ = auVar381._0_2_;
                auVar381._26_2_ = auVar381._0_2_;
                auVar381._28_2_ = auVar381._0_2_;
                auVar381._30_2_ = auVar381._0_2_;
                auVar154 = vpsllw_avx2(auVar381,ZEXT416((uint)upsample_left));
                auVar154 = vpsrlw_avx2(auVar154,1);
                auVar154 = vpand_avx2(auVar154,auVar210);
                auVar378 = auVar154._0_16_;
              }
              auVar279 = vpcmpgtw_avx(auVar310,auVar279);
              auVar278 = vpsubw_avx(auVar278,auVar185);
              auVar278 = vpmullw_avx(auVar278,auVar378);
              auVar185 = vpsllw_avx(auVar185,5);
              auVar185 = vpaddw_avx(auVar185,auVar354);
              auVar185 = vpaddw_avx(auVar278,auVar185);
              auVar185 = vpsrlw_avx(auVar185,5);
              auVar185 = vpblendvb_avx(auVar277,auVar185,auVar279);
              *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar185;
              uVar13 = uVar13 + dy;
            }
            else {
              do {
                *(undefined1 (*) [16])(local_2060 + lVar24) = auVar277;
                lVar24 = lVar24 + 0x10;
              } while (lVar24 != 0x40);
            }
            if (iVar14 <= (int)uVar17) break;
            lVar19 = lVar19 + 1;
            lVar9 = lVar9 + 0x10;
          } while (lVar19 != 4);
        }
        else {
          auVar185._4_4_ = iVar14;
          auVar185._0_4_ = iVar14;
          auVar185._8_4_ = iVar14;
          auVar185._12_4_ = iVar14;
          lVar9 = 0;
          auVar278._8_4_ = 0x10;
          auVar278._0_8_ = 0x1000000010;
          auVar278._12_4_ = 0x10;
          auVar154._8_4_ = 0x1f;
          auVar154._0_8_ = 0x1f0000001f;
          auVar154._12_4_ = 0x1f;
          auVar154._16_4_ = 0x1f;
          auVar154._20_4_ = 0x1f;
          auVar154._24_4_ = 0x1f;
          auVar154._28_4_ = 0x1f;
          lVar19 = 0;
          uVar13 = dy;
          do {
            uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
            lVar24 = lVar9;
            if ((int)uVar17 < iVar14) {
              auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar17));
              auVar310 = auVar155._0_16_;
              if (upsample_left == 0) {
                auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 1));
                auVar170 = auVar155._0_16_;
                auVar354 = vpinsrd_avx(ZEXT416(uVar17),uVar17 + 1,1);
                auVar354 = vpinsrd_avx(auVar354,uVar17 + 2,2);
                auVar354 = vpinsrd_avx(auVar354,uVar17 + 3,3);
                uVar18 = uVar13 >> 1;
                auVar279._0_8_ = CONCAT44(uVar18,uVar18) & 0x1f0000001f;
                auVar279._8_4_ = uVar18 & 0x1f;
                auVar279._12_4_ = uVar18 & 0x1f;
              }
              else {
                auVar155 = vpshufd_avx2(auVar155,0xd8);
                auVar155 = vpermq_avx2(auVar155,0xd8);
                auVar310 = auVar155._0_16_;
                auVar170 = ZEXT116(0) * auVar277 + ZEXT116(1) * auVar155._16_16_;
                auVar354 = vpinsrd_avx(ZEXT416(uVar17),uVar17 + 2,1);
                auVar354 = vpinsrd_avx(auVar354,uVar17 + 4,2);
                auVar354 = vpinsrd_avx(auVar354,uVar17 + 6,3);
                auVar155._4_4_ = uVar13;
                auVar155._0_4_ = uVar13;
                auVar155._8_4_ = uVar13;
                auVar155._12_4_ = uVar13;
                auVar155._16_4_ = uVar13;
                auVar155._20_4_ = uVar13;
                auVar155._24_4_ = uVar13;
                auVar155._28_4_ = uVar13;
                auVar155 = vpslld_avx2(auVar155,ZEXT416((uint)upsample_left));
                auVar155 = vpsrld_avx2(auVar155,1);
                auVar155 = vpand_avx2(auVar155,auVar154);
                auVar279 = auVar155._0_16_;
              }
              auVar378 = vpcmpgtd_avx(auVar185,auVar354);
              auVar354 = vpsubd_avx(auVar170,auVar310);
              auVar354 = vpmulld_avx(auVar354,auVar279);
              auVar310 = vpslld_avx(auVar310,5);
              auVar310 = vpaddd_avx(auVar310,auVar278);
              auVar310 = vpaddd_avx(auVar354,auVar310);
              auVar310 = vpsrld_avx(auVar310,5);
              auVar354 = vpackusdw_avx(auVar310,auVar310);
              auVar310 = vpackssdw_avx(auVar378,auVar378);
              auVar310 = vpblendvb_avx(auVar277,auVar354,auVar310);
              *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar310;
              uVar13 = uVar13 + dy;
            }
            else {
              do {
                *(undefined1 (*) [16])(local_2060 + lVar24) = auVar277;
                lVar24 = lVar24 + 0x10;
              } while (lVar24 != 0x40);
            }
            if (iVar14 <= (int)uVar17) break;
            lVar19 = lVar19 + 1;
            lVar9 = lVar9 + 0x10;
          } while (lVar19 != 4);
        }
        auVar277 = vpunpcklwd_avx(local_2060._0_16_,local_2060._16_16_);
        auVar185 = vpunpcklwd_avx(local_2040._0_16_,local_2040._16_16_);
        auVar278 = vpunpckldq_avx(auVar277,auVar185);
        *(long *)dst = auVar278._0_8_;
        uVar5 = vpextrq_avx(auVar278,1);
        *(undefined8 *)(dst + stride) = uVar5;
        auVar277 = vpunpckhdq_avx(auVar277,auVar185);
        *(long *)(dst + stride * 2) = auVar277._0_8_;
        uVar5 = vpextrq_avx(auVar277,1);
        *(undefined8 *)(dst + stride * 3) = uVar5;
        return;
      }
      if (bw != 8) {
        return;
      }
      iVar14 = 0xf << (bVar11 & 0x1f);
      uVar4 = left[iVar14];
      auVar29._2_2_ = uVar4;
      auVar29._0_2_ = uVar4;
      auVar29._4_2_ = uVar4;
      auVar29._6_2_ = uVar4;
      auVar29._8_2_ = uVar4;
      auVar29._10_2_ = uVar4;
      auVar29._12_2_ = uVar4;
      auVar29._14_2_ = uVar4;
      auVar42._16_2_ = uVar4;
      auVar42._0_16_ = auVar29;
      auVar42._18_2_ = uVar4;
      auVar42._20_2_ = uVar4;
      auVar42._22_2_ = uVar4;
      auVar42._24_2_ = uVar4;
      auVar42._26_2_ = uVar4;
      auVar42._28_2_ = uVar4;
      auVar42._30_2_ = uVar4;
      if (bd < 0xc) {
        auVar62._0_2_ = (undefined2)iVar14;
        auVar62._2_2_ = auVar62._0_2_;
        auVar62._4_2_ = auVar62._0_2_;
        auVar62._6_2_ = auVar62._0_2_;
        auVar62._8_2_ = auVar62._0_2_;
        auVar62._10_2_ = auVar62._0_2_;
        auVar62._12_2_ = auVar62._0_2_;
        auVar62._14_2_ = auVar62._0_2_;
        lVar9 = 0;
        auVar90._8_2_ = 0x10;
        auVar90._0_8_ = 0x10001000100010;
        auVar90._10_2_ = 0x10;
        auVar90._12_2_ = 0x10;
        auVar90._14_2_ = 0x10;
        auVar151._8_2_ = 0x1f;
        auVar151._0_8_ = 0x1f001f001f001f;
        auVar151._10_2_ = 0x1f;
        auVar151._12_2_ = 0x1f;
        auVar151._14_2_ = 0x1f;
        auVar151._16_2_ = 0x1f;
        auVar151._18_2_ = 0x1f;
        auVar151._20_2_ = 0x1f;
        auVar151._22_2_ = 0x1f;
        auVar151._24_2_ = 0x1f;
        auVar151._26_2_ = 0x1f;
        auVar151._28_2_ = 0x1f;
        auVar151._30_2_ = 0x1f;
        lVar19 = 0;
        uVar13 = dy;
        do {
          uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
          lVar24 = lVar9;
          if ((int)uVar17 < iVar14) {
            auVar277 = *(undefined1 (*) [16])(left + (int)uVar17);
            if (upsample_left == 0) {
              auVar185 = *(undefined1 (*) [16])(left + (long)(int)uVar17 + 1);
              auVar278 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 1,1);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 2,2);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 3,3);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 4,4);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 5,5);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 6,6);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 7,7);
              uVar6 = (ushort)(uVar13 >> 1);
              uVar116 = uVar6 & 0x1f;
              auVar309._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar309._8_2_ = uVar116;
              auVar309._10_2_ = uVar116;
              auVar309._12_2_ = uVar116;
              auVar309._14_2_ = uVar116;
            }
            else {
              auVar185 = vpblendw_avx(auVar277,(undefined1  [16])0x0,0xaa);
              auVar278 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8),
                                      (undefined1  [16])0x0,0xaa);
              auVar354 = vpsrld_avx(auVar277,0x10);
              auVar277 = vpackusdw_avx(auVar185,auVar278);
              auVar310 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8),0x10);
              auVar185 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 2,1);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 4,2);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 6,3);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 8,4);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 10,5);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 0xc,6);
              auVar278 = vpinsrw_avx(auVar185,uVar17 + 0xe,7);
              auVar318._0_2_ = (undefined2)uVar13;
              auVar318._2_2_ = auVar318._0_2_;
              auVar318._4_2_ = auVar318._0_2_;
              auVar318._6_2_ = auVar318._0_2_;
              auVar318._8_2_ = auVar318._0_2_;
              auVar318._10_2_ = auVar318._0_2_;
              auVar318._12_2_ = auVar318._0_2_;
              auVar318._14_2_ = auVar318._0_2_;
              auVar318._16_2_ = auVar318._0_2_;
              auVar318._18_2_ = auVar318._0_2_;
              auVar318._20_2_ = auVar318._0_2_;
              auVar318._22_2_ = auVar318._0_2_;
              auVar318._24_2_ = auVar318._0_2_;
              auVar318._26_2_ = auVar318._0_2_;
              auVar318._28_2_ = auVar318._0_2_;
              auVar318._30_2_ = auVar318._0_2_;
              auVar154 = vpsllw_avx2(auVar318,ZEXT416((uint)upsample_left));
              auVar185 = vpackusdw_avx(auVar354,auVar310);
              auVar154 = vpsrlw_avx2(auVar154,1);
              auVar154 = vpand_avx2(auVar154,auVar151);
              auVar309 = auVar154._0_16_;
            }
            auVar310 = vpsllw_avx(auVar277,5);
            auVar310 = vpaddw_avx(auVar310,auVar90);
            auVar277 = vpsubw_avx(auVar185,auVar277);
            auVar277 = vpmullw_avx(auVar309,auVar277);
            auVar277 = vpaddw_avx(auVar310,auVar277);
            auVar185 = vpsrlw_avx(auVar277,5);
            auVar277 = vpcmpgtw_avx(auVar62,auVar278);
            auVar277 = vpblendvb_avx(auVar29,auVar185,auVar277);
            *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar277;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [16])(local_2060 + lVar24) = auVar29;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 != 0x80);
          }
          if (iVar14 <= (int)uVar17) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar19 != 8);
      }
      else {
        auVar73._4_4_ = iVar14;
        auVar73._0_4_ = iVar14;
        auVar73._8_4_ = iVar14;
        auVar73._12_4_ = iVar14;
        auVar73._16_4_ = iVar14;
        auVar73._20_4_ = iVar14;
        auVar73._24_4_ = iVar14;
        auVar73._28_4_ = iVar14;
        lVar9 = 0;
        auVar277 = vpmovsxbd_avx(ZEXT416(0x3020104));
        auVar101._8_4_ = 0x10;
        auVar101._0_8_ = 0x1000000010;
        auVar101._12_4_ = 0x10;
        auVar101._16_4_ = 0x10;
        auVar101._20_4_ = 0x10;
        auVar101._24_4_ = 0x10;
        auVar101._28_4_ = 0x10;
        auVar185 = vpmovsxbd_avx(ZEXT416(0x6040208));
        auVar175._8_4_ = 0x1f;
        auVar175._0_8_ = 0x1f0000001f;
        auVar175._12_4_ = 0x1f;
        auVar175._16_4_ = 0x1f;
        auVar175._20_4_ = 0x1f;
        auVar175._24_4_ = 0x1f;
        auVar175._28_4_ = 0x1f;
        lVar19 = 0;
        uVar13 = dy;
        do {
          iVar23 = (int)uVar13 >> (6 - bVar11 & 0x1f);
          lVar24 = lVar9;
          if (iVar23 < iVar14) {
            auVar219 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar23));
            if (upsample_left == 0) {
              auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 1));
              auVar311._4_4_ = iVar23;
              auVar311._0_4_ = iVar23;
              auVar311._8_4_ = iVar23;
              auVar311._12_4_ = iVar23;
              iVar1 = iVar23 + 5;
              iVar2 = iVar23 + 6;
              iVar3 = iVar23 + 7;
              auVar278 = vpaddd_avx(auVar311,auVar277);
              auVar155 = vpermq_avx2(ZEXT1632(auVar278),0xc4);
              auVar155 = vpblendd_avx2(auVar155,ZEXT1632(auVar311),1);
              auVar355._4_4_ = iVar1;
              auVar355._0_4_ = iVar1;
              auVar355._8_4_ = iVar1;
              auVar355._12_4_ = iVar1;
              auVar355._16_4_ = iVar1;
              auVar355._20_4_ = iVar1;
              auVar355._24_4_ = iVar1;
              auVar355._28_4_ = iVar1;
              auVar155 = vpblendd_avx2(auVar155,auVar355,0x20);
              auVar356._4_4_ = iVar2;
              auVar356._0_4_ = iVar2;
              auVar356._8_4_ = iVar2;
              auVar356._12_4_ = iVar2;
              auVar356._16_4_ = iVar2;
              auVar356._20_4_ = iVar2;
              auVar356._24_4_ = iVar2;
              auVar356._28_4_ = iVar2;
              auVar155 = vpblendd_avx2(auVar155,auVar356,0x40);
              auVar357._4_4_ = iVar3;
              auVar357._0_4_ = iVar3;
              auVar357._8_4_ = iVar3;
              auVar357._12_4_ = iVar3;
              auVar357._16_4_ = iVar3;
              auVar357._20_4_ = iVar3;
              auVar357._24_4_ = iVar3;
              auVar357._28_4_ = iVar3;
              auVar155 = vpblendd_avx2(auVar155,auVar357,0x80);
              uVar17 = uVar13 >> 1;
              uVar18 = uVar17 & 0x1f;
              auVar358._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f0000001f;
              auVar358._8_4_ = uVar18;
              auVar358._12_4_ = uVar18;
              auVar358._16_4_ = uVar18;
              auVar358._20_4_ = uVar18;
              auVar358._24_4_ = uVar18;
              auVar358._28_4_ = uVar18;
            }
            else {
              auVar155 = vpshufd_avx2(auVar219,0xd8);
              auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 8));
              auVar210 = vpermq_avx2(auVar155,0xd8);
              auVar154 = vpshufd_avx2(auVar154,0xd8);
              auVar381 = vpermq_avx2(auVar154,0xd8);
              auVar187._4_4_ = iVar23;
              auVar187._0_4_ = iVar23;
              auVar187._8_4_ = iVar23;
              auVar187._12_4_ = iVar23;
              iVar1 = iVar23 + 10;
              iVar2 = iVar23 + 0xc;
              iVar3 = iVar23 + 0xe;
              auVar278 = vpaddd_avx(auVar187,auVar185);
              auVar154 = vpermq_avx2(ZEXT1632(auVar278),0xc4);
              auVar154 = vpblendd_avx2(auVar154,ZEXT1632(auVar187),1);
              auVar326._4_4_ = iVar1;
              auVar326._0_4_ = iVar1;
              auVar326._8_4_ = iVar1;
              auVar326._12_4_ = iVar1;
              auVar326._16_4_ = iVar1;
              auVar326._20_4_ = iVar1;
              auVar326._24_4_ = iVar1;
              auVar326._28_4_ = iVar1;
              auVar154 = vpblendd_avx2(auVar154,auVar326,0x20);
              auVar327._4_4_ = iVar2;
              auVar327._0_4_ = iVar2;
              auVar327._8_4_ = iVar2;
              auVar327._12_4_ = iVar2;
              auVar327._16_4_ = iVar2;
              auVar327._20_4_ = iVar2;
              auVar327._24_4_ = iVar2;
              auVar327._28_4_ = iVar2;
              auVar154 = vpblendd_avx2(auVar154,auVar327,0x40);
              auVar328._4_4_ = iVar3;
              auVar328._0_4_ = iVar3;
              auVar328._8_4_ = iVar3;
              auVar328._12_4_ = iVar3;
              auVar328._16_4_ = iVar3;
              auVar328._20_4_ = iVar3;
              auVar328._24_4_ = iVar3;
              auVar328._28_4_ = iVar3;
              auVar155 = vpblendd_avx2(auVar154,auVar328,0x80);
              auVar218._4_4_ = uVar13;
              auVar218._0_4_ = uVar13;
              auVar218._8_4_ = uVar13;
              auVar218._12_4_ = uVar13;
              auVar218._16_4_ = uVar13;
              auVar218._20_4_ = uVar13;
              auVar218._24_4_ = uVar13;
              auVar218._28_4_ = uVar13;
              auVar154 = vpslld_avx2(auVar218,ZEXT416((uint)upsample_left));
              auVar219._0_16_ = ZEXT116(0) * auVar381._0_16_ + ZEXT116(1) * auVar210._0_16_;
              auVar219._16_16_ = ZEXT116(0) * auVar210._16_16_ + ZEXT116(1) * auVar381._0_16_;
              auVar154 = vpsrld_avx2(auVar154,1);
              auVar358 = vpand_avx2(auVar154,auVar175);
              auVar154 = vperm2i128_avx2(auVar210,auVar381,0x31);
            }
            auVar155 = vpcmpgtd_avx2(auVar73,auVar155);
            auVar154 = vpsubd_avx2(auVar154,auVar219);
            auVar210 = vpmulld_avx2(auVar154,auVar358);
            auVar154 = vpslld_avx2(auVar219,5);
            auVar154 = vpaddd_avx2(auVar154,auVar101);
            auVar154 = vpaddd_avx2(auVar210,auVar154);
            auVar154 = vpsrld_avx2(auVar154,5);
            auVar310 = vpackusdw_avx(auVar154._0_16_,auVar154._16_16_);
            auVar278 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
            auVar154 = vpblendvb_avx2(auVar42,ZEXT1632(auVar310),ZEXT1632(auVar278));
            *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar154._0_16_;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [16])(local_2060 + lVar24) = auVar29;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 != 0x80);
          }
          if (iVar14 <= iVar23) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar19 != 8);
      }
      auVar277 = vpunpcklwd_avx(local_2060._0_16_,local_2060._16_16_);
      auVar185 = vpunpcklwd_avx(local_2040._0_16_,local_2040._16_16_);
      auVar278 = vpunpcklwd_avx(local_2020._0_16_,local_2020._16_16_);
      auVar310 = vpunpcklwd_avx(local_2000._0_16_,local_2000._16_16_);
      auVar354 = vpunpckldq_avx(auVar277,auVar185);
      auVar279 = vpunpckldq_avx(auVar278,auVar310);
      local_2660._0_16_ = vpunpcklqdq_avx(auVar354,auVar279);
      unique0x00102d80 = vpunpckhqdq_avx(auVar354,auVar279);
      auVar277 = vpunpckhdq_avx(auVar277,auVar185);
      auVar185 = vpunpckhdq_avx(auVar278,auVar310);
      local_2640._0_16_ = vpunpcklqdq_avx(auVar277,auVar185);
      local_2640._16_16_ = vpunpckhqdq_avx(auVar277,auVar185);
      auVar277 = vpunpckhwd_avx(local_2060._0_16_,local_2060._16_16_);
      auVar185 = vpunpckhwd_avx(local_2040._0_16_,local_2040._16_16_);
      auVar278 = vpunpckhwd_avx(local_2020._0_16_,local_2020._16_16_);
      auVar310 = vpunpckhwd_avx(local_2000._0_16_,local_2000._16_16_);
      auVar354 = vpunpckldq_avx(auVar277,auVar185);
      auVar279 = vpunpckldq_avx(auVar278,auVar310);
      local_2620._0_16_ = vpunpcklqdq_avx(auVar354,auVar279);
      local_2620._16_16_ = vpunpckhqdq_avx(auVar354,auVar279);
      auVar277 = vpunpckhdq_avx(auVar277,auVar185);
      auVar185 = vpunpckhdq_avx(auVar278,auVar310);
      local_2600._0_16_ = vpunpcklqdq_avx(auVar277,auVar185);
      local_2600._16_16_ = vpunpckhqdq_avx(auVar277,auVar185);
      lVar9 = 0;
      do {
        uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
        *(undefined8 *)dst = *(undefined8 *)(local_2660 + lVar9);
        *(undefined8 *)(dst + 4) = uVar5;
        lVar9 = lVar9 + 0x10;
        dst = dst + stride;
      } while (lVar9 != 0x80);
      return;
    }
    if (bw == 0x10) {
      uVar4 = left[0x1f];
      auVar32._2_2_ = uVar4;
      auVar32._0_2_ = uVar4;
      auVar32._4_2_ = uVar4;
      auVar32._6_2_ = uVar4;
      auVar32._8_2_ = uVar4;
      auVar32._10_2_ = uVar4;
      auVar32._12_2_ = uVar4;
      auVar32._14_2_ = uVar4;
      auVar44._16_2_ = uVar4;
      auVar44._0_16_ = auVar32;
      auVar44._18_2_ = uVar4;
      auVar44._20_2_ = uVar4;
      auVar44._22_2_ = uVar4;
      auVar44._24_2_ = uVar4;
      auVar44._26_2_ = uVar4;
      auVar44._28_2_ = uVar4;
      auVar44._30_2_ = uVar4;
      lVar9 = 0;
      if (bd < 0xc) {
        auVar69._8_2_ = 0x10;
        auVar69._0_8_ = 0x10001000100010;
        auVar69._10_2_ = 0x10;
        auVar69._12_2_ = 0x10;
        auVar69._14_2_ = 0x10;
        auVar69._16_2_ = 0x10;
        auVar69._18_2_ = 0x10;
        auVar69._20_2_ = 0x10;
        auVar69._22_2_ = 0x10;
        auVar69._24_2_ = 0x10;
        auVar69._26_2_ = 0x10;
        auVar69._28_2_ = 0x10;
        auVar69._30_2_ = 0x10;
        auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar97._8_2_ = 0x1e;
        auVar97._0_8_ = 0x1e001e001e001e;
        auVar97._10_2_ = 0x1e;
        auVar97._12_2_ = 0x1e;
        auVar97._14_2_ = 0x1e;
        auVar97._16_2_ = 0x1e;
        auVar97._18_2_ = 0x1e;
        auVar97._20_2_ = 0x1e;
        auVar97._22_2_ = 0x1e;
        auVar97._24_2_ = 0x1e;
        auVar97._26_2_ = 0x1e;
        auVar97._28_2_ = 0x1e;
        auVar97._30_2_ = 0x1e;
        lVar19 = 0;
        uVar13 = dy;
        do {
          uVar17 = (int)uVar13 >> 6;
          lVar24 = lVar9;
          if ((int)uVar17 < 0x1f) {
            uVar6 = (ushort)(uVar13 >> 1);
            uVar116 = uVar6 & 0x1f;
            auVar118._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar118._8_2_ = uVar116;
            auVar118._10_2_ = uVar116;
            auVar118._12_2_ = uVar116;
            auVar118._14_2_ = uVar116;
            auVar118._16_2_ = uVar116;
            auVar118._18_2_ = uVar116;
            auVar118._20_2_ = uVar116;
            auVar118._22_2_ = uVar116;
            auVar118._24_2_ = uVar116;
            auVar118._26_2_ = uVar116;
            auVar118._28_2_ = uVar116;
            auVar118._30_2_ = uVar116;
            auVar154 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar17 + 1),
                                   *(undefined1 (*) [32])(left + (int)uVar17));
            auVar155 = vpmullw_avx2(auVar154,auVar118);
            auVar154 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar17),5);
            auVar154 = vpaddw_avx2(auVar154,auVar69);
            auVar154 = vpaddw_avx2(auVar155,auVar154);
            auVar155 = vpsrlw_avx2(auVar154,5);
            auVar141._0_2_ = (undefined2)uVar17;
            auVar141._2_2_ = auVar141._0_2_;
            auVar141._4_2_ = auVar141._0_2_;
            auVar141._6_2_ = auVar141._0_2_;
            auVar141._8_2_ = auVar141._0_2_;
            auVar141._10_2_ = auVar141._0_2_;
            auVar141._12_2_ = auVar141._0_2_;
            auVar141._14_2_ = auVar141._0_2_;
            auVar185 = vpaddw_avx(auVar141,auVar277);
            auVar278 = vpslldq_avx(auVar185,2);
            auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar17),1);
            auVar185 = vpsrldq_avx(auVar185,0xe);
            auVar153._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar32;
            auVar153._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar185;
            auVar202._0_2_ = (undefined2)(uVar17 + 9);
            auVar202._2_2_ = auVar202._0_2_;
            auVar202._4_2_ = auVar202._0_2_;
            auVar202._6_2_ = auVar202._0_2_;
            auVar202._8_2_ = auVar202._0_2_;
            auVar202._10_2_ = auVar202._0_2_;
            auVar202._12_2_ = auVar202._0_2_;
            auVar202._14_2_ = auVar202._0_2_;
            auVar202._16_2_ = auVar202._0_2_;
            auVar202._18_2_ = auVar202._0_2_;
            auVar202._20_2_ = auVar202._0_2_;
            auVar202._22_2_ = auVar202._0_2_;
            auVar202._24_2_ = auVar202._0_2_;
            auVar202._26_2_ = auVar202._0_2_;
            auVar202._28_2_ = auVar202._0_2_;
            auVar202._30_2_ = auVar202._0_2_;
            auVar154 = vpblendw_avx2(auVar153,auVar202,2);
            auVar203._0_2_ = (undefined2)(uVar17 + 10);
            auVar203._2_2_ = auVar203._0_2_;
            auVar203._4_2_ = auVar203._0_2_;
            auVar203._6_2_ = auVar203._0_2_;
            auVar203._8_2_ = auVar203._0_2_;
            auVar203._10_2_ = auVar203._0_2_;
            auVar203._12_2_ = auVar203._0_2_;
            auVar203._14_2_ = auVar203._0_2_;
            auVar203._16_2_ = auVar203._0_2_;
            auVar203._18_2_ = auVar203._0_2_;
            auVar203._20_2_ = auVar203._0_2_;
            auVar203._22_2_ = auVar203._0_2_;
            auVar203._24_2_ = auVar203._0_2_;
            auVar203._26_2_ = auVar203._0_2_;
            auVar203._28_2_ = auVar203._0_2_;
            auVar203._30_2_ = auVar203._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar203,4);
            auVar204._0_2_ = (undefined2)(uVar17 + 0xb);
            auVar204._2_2_ = auVar204._0_2_;
            auVar204._4_2_ = auVar204._0_2_;
            auVar204._6_2_ = auVar204._0_2_;
            auVar204._8_2_ = auVar204._0_2_;
            auVar204._10_2_ = auVar204._0_2_;
            auVar204._12_2_ = auVar204._0_2_;
            auVar204._14_2_ = auVar204._0_2_;
            auVar204._16_2_ = auVar204._0_2_;
            auVar204._18_2_ = auVar204._0_2_;
            auVar204._20_2_ = auVar204._0_2_;
            auVar204._22_2_ = auVar204._0_2_;
            auVar204._24_2_ = auVar204._0_2_;
            auVar204._26_2_ = auVar204._0_2_;
            auVar204._28_2_ = auVar204._0_2_;
            auVar204._30_2_ = auVar204._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar204,8);
            auVar205._0_2_ = (undefined2)(uVar17 + 0xc);
            auVar205._2_2_ = auVar205._0_2_;
            auVar205._4_2_ = auVar205._0_2_;
            auVar205._6_2_ = auVar205._0_2_;
            auVar205._8_2_ = auVar205._0_2_;
            auVar205._10_2_ = auVar205._0_2_;
            auVar205._12_2_ = auVar205._0_2_;
            auVar205._14_2_ = auVar205._0_2_;
            auVar205._16_2_ = auVar205._0_2_;
            auVar205._18_2_ = auVar205._0_2_;
            auVar205._20_2_ = auVar205._0_2_;
            auVar205._22_2_ = auVar205._0_2_;
            auVar205._24_2_ = auVar205._0_2_;
            auVar205._26_2_ = auVar205._0_2_;
            auVar205._28_2_ = auVar205._0_2_;
            auVar205._30_2_ = auVar205._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar205,0x10);
            auVar206._0_2_ = (undefined2)(uVar17 + 0xd);
            auVar206._2_2_ = auVar206._0_2_;
            auVar206._4_2_ = auVar206._0_2_;
            auVar206._6_2_ = auVar206._0_2_;
            auVar206._8_2_ = auVar206._0_2_;
            auVar206._10_2_ = auVar206._0_2_;
            auVar206._12_2_ = auVar206._0_2_;
            auVar206._14_2_ = auVar206._0_2_;
            auVar206._16_2_ = auVar206._0_2_;
            auVar206._18_2_ = auVar206._0_2_;
            auVar206._20_2_ = auVar206._0_2_;
            auVar206._22_2_ = auVar206._0_2_;
            auVar206._24_2_ = auVar206._0_2_;
            auVar206._26_2_ = auVar206._0_2_;
            auVar206._28_2_ = auVar206._0_2_;
            auVar206._30_2_ = auVar206._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar206,0x20);
            auVar207._0_2_ = (undefined2)(uVar17 + 0xe);
            auVar207._2_2_ = auVar207._0_2_;
            auVar207._4_2_ = auVar207._0_2_;
            auVar207._6_2_ = auVar207._0_2_;
            auVar207._8_2_ = auVar207._0_2_;
            auVar207._10_2_ = auVar207._0_2_;
            auVar207._12_2_ = auVar207._0_2_;
            auVar207._14_2_ = auVar207._0_2_;
            auVar207._16_2_ = auVar207._0_2_;
            auVar207._18_2_ = auVar207._0_2_;
            auVar207._20_2_ = auVar207._0_2_;
            auVar207._22_2_ = auVar207._0_2_;
            auVar207._24_2_ = auVar207._0_2_;
            auVar207._26_2_ = auVar207._0_2_;
            auVar207._28_2_ = auVar207._0_2_;
            auVar207._30_2_ = auVar207._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar207,0x40);
            auVar208._0_2_ = (undefined2)(uVar17 + 0xf);
            auVar208._2_2_ = auVar208._0_2_;
            auVar208._4_2_ = auVar208._0_2_;
            auVar208._6_2_ = auVar208._0_2_;
            auVar208._8_2_ = auVar208._0_2_;
            auVar208._10_2_ = auVar208._0_2_;
            auVar208._12_2_ = auVar208._0_2_;
            auVar208._14_2_ = auVar208._0_2_;
            auVar208._16_2_ = auVar208._0_2_;
            auVar208._18_2_ = auVar208._0_2_;
            auVar208._20_2_ = auVar208._0_2_;
            auVar208._22_2_ = auVar208._0_2_;
            auVar208._24_2_ = auVar208._0_2_;
            auVar208._26_2_ = auVar208._0_2_;
            auVar208._28_2_ = auVar208._0_2_;
            auVar208._30_2_ = auVar208._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar208,0x80);
            auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
            auVar154 = vpcmpgtw_avx2(auVar154,auVar97);
            auVar154 = vpblendvb_avx2(auVar155,auVar44,auVar154);
            *(undefined1 (*) [32])(local_2660 + lVar19 * 0x20) = auVar154;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [32])(local_2660 + lVar24) = auVar44;
              lVar24 = lVar24 + 0x20;
            } while (lVar24 != 0x200);
          }
          if (0x1e < (int)uVar17) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x20;
        } while (lVar19 != 0x10);
      }
      else {
        auVar71._8_4_ = 0x10;
        auVar71._0_8_ = 0x1000000010;
        auVar71._12_4_ = 0x10;
        auVar71._16_4_ = 0x10;
        auVar71._20_4_ = 0x10;
        auVar71._24_4_ = 0x10;
        auVar71._28_4_ = 0x10;
        auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar99._8_2_ = 0x1e;
        auVar99._0_8_ = 0x1e001e001e001e;
        auVar99._10_2_ = 0x1e;
        auVar99._12_2_ = 0x1e;
        auVar99._14_2_ = 0x1e;
        auVar99._16_2_ = 0x1e;
        auVar99._18_2_ = 0x1e;
        auVar99._20_2_ = 0x1e;
        auVar99._22_2_ = 0x1e;
        auVar99._24_2_ = 0x1e;
        auVar99._26_2_ = 0x1e;
        auVar99._28_2_ = 0x1e;
        auVar99._30_2_ = 0x1e;
        lVar19 = 0;
        uVar13 = dy;
        do {
          uVar17 = (int)uVar13 >> 6;
          lVar24 = lVar9;
          if ((int)uVar17 < 0x1f) {
            uVar18 = uVar13 >> 1;
            uVar16 = uVar18 & 0x1f;
            auVar120._0_8_ = CONCAT44(uVar18,uVar18) & 0x1f0000001f;
            auVar120._8_4_ = uVar16;
            auVar120._12_4_ = uVar16;
            auVar120._16_4_ = uVar16;
            auVar120._20_4_ = uVar16;
            auVar120._24_4_ = uVar16;
            auVar120._28_4_ = uVar16;
            auVar185 = auVar32;
            if ((int)uVar17 < 0x17) {
              auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8));
              auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 9));
              auVar155 = vpsubd_avx2(auVar155,auVar154);
              auVar154 = vpslld_avx2(auVar154,5);
              auVar155 = vpmulld_avx2(auVar155,auVar120);
              auVar154 = vpaddd_avx2(auVar154,auVar71);
              auVar154 = vpaddd_avx2(auVar155,auVar154);
              auVar154 = vpsrld_avx2(auVar154,5);
              auVar173._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar154._16_16_;
              auVar173._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
              auVar154 = vpackusdw_avx2(auVar154,auVar173);
              auVar185 = auVar154._0_16_;
            }
            auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar17));
            auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 1));
            auVar155 = vpsubd_avx2(auVar155,auVar154);
            auVar154 = vpslld_avx2(auVar154,5);
            auVar155 = vpmulld_avx2(auVar155,auVar120);
            auVar154 = vpaddd_avx2(auVar154,auVar71);
            auVar154 = vpaddd_avx2(auVar155,auVar154);
            auVar154 = vpsrld_avx2(auVar154,5);
            auVar154 = vpackusdw_avx2(auVar154,ZEXT1632(auVar154._16_16_));
            auVar121._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar154._0_16_;
            auVar121._16_16_ = ZEXT116(0) * auVar154._16_16_ + ZEXT116(1) * auVar185;
            auVar142._0_2_ = (undefined2)uVar17;
            auVar142._2_2_ = auVar142._0_2_;
            auVar142._4_2_ = auVar142._0_2_;
            auVar142._6_2_ = auVar142._0_2_;
            auVar142._8_2_ = auVar142._0_2_;
            auVar142._10_2_ = auVar142._0_2_;
            auVar142._12_2_ = auVar142._0_2_;
            auVar142._14_2_ = auVar142._0_2_;
            auVar185 = vpaddw_avx(auVar142,auVar277);
            auVar278 = vpslldq_avx(auVar185,2);
            auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar17),1);
            auVar185 = vpsrldq_avx(auVar185,0xe);
            auVar156._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar32;
            auVar156._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar185;
            auVar211._0_2_ = (undefined2)(uVar17 + 9);
            auVar211._2_2_ = auVar211._0_2_;
            auVar211._4_2_ = auVar211._0_2_;
            auVar211._6_2_ = auVar211._0_2_;
            auVar211._8_2_ = auVar211._0_2_;
            auVar211._10_2_ = auVar211._0_2_;
            auVar211._12_2_ = auVar211._0_2_;
            auVar211._14_2_ = auVar211._0_2_;
            auVar211._16_2_ = auVar211._0_2_;
            auVar211._18_2_ = auVar211._0_2_;
            auVar211._20_2_ = auVar211._0_2_;
            auVar211._22_2_ = auVar211._0_2_;
            auVar211._24_2_ = auVar211._0_2_;
            auVar211._26_2_ = auVar211._0_2_;
            auVar211._28_2_ = auVar211._0_2_;
            auVar211._30_2_ = auVar211._0_2_;
            auVar154 = vpblendw_avx2(auVar156,auVar211,2);
            auVar212._0_2_ = (undefined2)(uVar17 + 10);
            auVar212._2_2_ = auVar212._0_2_;
            auVar212._4_2_ = auVar212._0_2_;
            auVar212._6_2_ = auVar212._0_2_;
            auVar212._8_2_ = auVar212._0_2_;
            auVar212._10_2_ = auVar212._0_2_;
            auVar212._12_2_ = auVar212._0_2_;
            auVar212._14_2_ = auVar212._0_2_;
            auVar212._16_2_ = auVar212._0_2_;
            auVar212._18_2_ = auVar212._0_2_;
            auVar212._20_2_ = auVar212._0_2_;
            auVar212._22_2_ = auVar212._0_2_;
            auVar212._24_2_ = auVar212._0_2_;
            auVar212._26_2_ = auVar212._0_2_;
            auVar212._28_2_ = auVar212._0_2_;
            auVar212._30_2_ = auVar212._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar212,4);
            auVar213._0_2_ = (undefined2)(uVar17 + 0xb);
            auVar213._2_2_ = auVar213._0_2_;
            auVar213._4_2_ = auVar213._0_2_;
            auVar213._6_2_ = auVar213._0_2_;
            auVar213._8_2_ = auVar213._0_2_;
            auVar213._10_2_ = auVar213._0_2_;
            auVar213._12_2_ = auVar213._0_2_;
            auVar213._14_2_ = auVar213._0_2_;
            auVar213._16_2_ = auVar213._0_2_;
            auVar213._18_2_ = auVar213._0_2_;
            auVar213._20_2_ = auVar213._0_2_;
            auVar213._22_2_ = auVar213._0_2_;
            auVar213._24_2_ = auVar213._0_2_;
            auVar213._26_2_ = auVar213._0_2_;
            auVar213._28_2_ = auVar213._0_2_;
            auVar213._30_2_ = auVar213._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar213,8);
            auVar214._0_2_ = (undefined2)(uVar17 + 0xc);
            auVar214._2_2_ = auVar214._0_2_;
            auVar214._4_2_ = auVar214._0_2_;
            auVar214._6_2_ = auVar214._0_2_;
            auVar214._8_2_ = auVar214._0_2_;
            auVar214._10_2_ = auVar214._0_2_;
            auVar214._12_2_ = auVar214._0_2_;
            auVar214._14_2_ = auVar214._0_2_;
            auVar214._16_2_ = auVar214._0_2_;
            auVar214._18_2_ = auVar214._0_2_;
            auVar214._20_2_ = auVar214._0_2_;
            auVar214._22_2_ = auVar214._0_2_;
            auVar214._24_2_ = auVar214._0_2_;
            auVar214._26_2_ = auVar214._0_2_;
            auVar214._28_2_ = auVar214._0_2_;
            auVar214._30_2_ = auVar214._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar214,0x10);
            auVar215._0_2_ = (undefined2)(uVar17 + 0xd);
            auVar215._2_2_ = auVar215._0_2_;
            auVar215._4_2_ = auVar215._0_2_;
            auVar215._6_2_ = auVar215._0_2_;
            auVar215._8_2_ = auVar215._0_2_;
            auVar215._10_2_ = auVar215._0_2_;
            auVar215._12_2_ = auVar215._0_2_;
            auVar215._14_2_ = auVar215._0_2_;
            auVar215._16_2_ = auVar215._0_2_;
            auVar215._18_2_ = auVar215._0_2_;
            auVar215._20_2_ = auVar215._0_2_;
            auVar215._22_2_ = auVar215._0_2_;
            auVar215._24_2_ = auVar215._0_2_;
            auVar215._26_2_ = auVar215._0_2_;
            auVar215._28_2_ = auVar215._0_2_;
            auVar215._30_2_ = auVar215._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar215,0x20);
            auVar216._0_2_ = (undefined2)(uVar17 + 0xe);
            auVar216._2_2_ = auVar216._0_2_;
            auVar216._4_2_ = auVar216._0_2_;
            auVar216._6_2_ = auVar216._0_2_;
            auVar216._8_2_ = auVar216._0_2_;
            auVar216._10_2_ = auVar216._0_2_;
            auVar216._12_2_ = auVar216._0_2_;
            auVar216._14_2_ = auVar216._0_2_;
            auVar216._16_2_ = auVar216._0_2_;
            auVar216._18_2_ = auVar216._0_2_;
            auVar216._20_2_ = auVar216._0_2_;
            auVar216._22_2_ = auVar216._0_2_;
            auVar216._24_2_ = auVar216._0_2_;
            auVar216._26_2_ = auVar216._0_2_;
            auVar216._28_2_ = auVar216._0_2_;
            auVar216._30_2_ = auVar216._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar216,0x40);
            auVar217._0_2_ = (undefined2)(uVar17 + 0xf);
            auVar217._2_2_ = auVar217._0_2_;
            auVar217._4_2_ = auVar217._0_2_;
            auVar217._6_2_ = auVar217._0_2_;
            auVar217._8_2_ = auVar217._0_2_;
            auVar217._10_2_ = auVar217._0_2_;
            auVar217._12_2_ = auVar217._0_2_;
            auVar217._14_2_ = auVar217._0_2_;
            auVar217._16_2_ = auVar217._0_2_;
            auVar217._18_2_ = auVar217._0_2_;
            auVar217._20_2_ = auVar217._0_2_;
            auVar217._22_2_ = auVar217._0_2_;
            auVar217._24_2_ = auVar217._0_2_;
            auVar217._26_2_ = auVar217._0_2_;
            auVar217._28_2_ = auVar217._0_2_;
            auVar217._30_2_ = auVar217._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar217,0x80);
            auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
            auVar154 = vpcmpgtw_avx2(auVar154,auVar99);
            auVar154 = vpblendvb_avx2(auVar121,auVar44,auVar154);
            *(undefined1 (*) [32])(local_2660 + lVar19 * 0x20) = auVar154;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [32])(local_2660 + lVar24) = auVar44;
              lVar24 = lVar24 + 0x20;
            } while (lVar24 != 0x200);
          }
          if (0x1e < (int)uVar17) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x20;
        } while (lVar19 != 0x10);
      }
      auVar154 = vpunpcklwd_avx2(_local_2660,local_2640);
      auVar155 = vpunpcklwd_avx2(local_2620,local_2600);
      auVar210 = vpunpcklwd_avx2(local_25e0,local_25c0);
      auVar381 = vpunpcklwd_avx2(local_25a0,local_2580);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_2060 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_2040 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_2020 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2000 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(_local_2660,local_2640);
      auVar155 = vpunpckhwd_avx2(local_2620,local_2600);
      auVar210 = vpunpckhwd_avx2(local_25e0,local_25c0);
      auVar381 = vpunpckhwd_avx2(local_25a0,local_2580);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_1fe0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_1fc0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_1fa0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_1f80 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpcklwd_avx2(local_2560,local_2540);
      auVar155 = vpunpcklwd_avx2(local_2520,local_2500);
      auVar210 = vpunpcklwd_avx2(local_24e0,local_24c0);
      auVar381 = vpunpcklwd_avx2(local_24a0,local_2480);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_1f60 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_1f40 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_1f20 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_1f00 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(local_2560,local_2540);
      auVar155 = vpunpckhwd_avx2(local_2520,local_2500);
      auVar210 = vpunpckhwd_avx2(local_24e0,local_24c0);
      auVar381 = vpunpckhwd_avx2(local_24a0,local_2480);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_1ee0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_1ec0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_1ea0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_1e80 = vpunpckhqdq_avx2(auVar154,auVar155);
      lVar9 = 0;
      do {
        auVar154 = *(undefined1 (*) [32])(local_1f60 + lVar9);
        auVar155 = vperm2i128_avx2(auVar154,*(undefined1 (*) [32])(local_2060 + lVar9),2);
        auVar46._0_16_ =
             ZEXT116(1) * *(undefined1 (*) [16])(local_2060 + lVar9 + 0x10) +
             ZEXT116(0) * auVar154._0_16_;
        auVar46._16_16_ =
             ZEXT116(1) * auVar154._16_16_ +
             ZEXT116(0) * *(undefined1 (*) [16])(local_2060 + lVar9 + 0x10);
        *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar155;
        *(undefined1 (*) [32])(auStack_2160 + lVar9) = auVar46;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x100);
      lVar9 = 0;
      do {
        uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
        uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
        uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
        *(undefined8 *)dst = *(undefined8 *)((long)auStack_2260 + lVar9);
        *(undefined8 *)(dst + 4) = uVar5;
        *(undefined8 *)(dst + 8) = uVar7;
        *(undefined8 *)(dst + 0xc) = uVar8;
        lVar9 = lVar9 + 0x20;
        dst = dst + stride;
      } while (lVar9 != 0x200);
      return;
    }
    if (bw == 0x20) {
      uVar4 = left[0x3f];
      auVar33._2_2_ = uVar4;
      auVar33._0_2_ = uVar4;
      auVar33._4_2_ = uVar4;
      auVar33._6_2_ = uVar4;
      auVar33._8_2_ = uVar4;
      auVar33._10_2_ = uVar4;
      auVar33._12_2_ = uVar4;
      auVar33._14_2_ = uVar4;
      auVar45._16_2_ = uVar4;
      auVar45._0_16_ = auVar33;
      auVar45._18_2_ = uVar4;
      auVar45._20_2_ = uVar4;
      auVar45._22_2_ = uVar4;
      auVar45._24_2_ = uVar4;
      auVar45._26_2_ = uVar4;
      auVar45._28_2_ = uVar4;
      auVar45._30_2_ = uVar4;
      lVar9 = -0x400;
      uVar12 = 0;
      if (bd < 0xc) {
        auVar70._8_2_ = 0x10;
        auVar70._0_8_ = 0x10001000100010;
        auVar70._10_2_ = 0x10;
        auVar70._12_2_ = 0x10;
        auVar70._14_2_ = 0x10;
        auVar70._16_2_ = 0x10;
        auVar70._18_2_ = 0x10;
        auVar70._20_2_ = 0x10;
        auVar70._22_2_ = 0x10;
        auVar70._24_2_ = 0x10;
        auVar70._26_2_ = 0x10;
        auVar70._28_2_ = 0x10;
        auVar70._30_2_ = 0x10;
        auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar98._8_2_ = 0x3e;
        auVar98._0_8_ = 0x3e003e003e003e;
        auVar98._10_2_ = 0x3e;
        auVar98._12_2_ = 0x3e;
        auVar98._14_2_ = 0x3e;
        auVar98._16_2_ = 0x3e;
        auVar98._18_2_ = 0x3e;
        auVar98._20_2_ = 0x3e;
        auVar98._22_2_ = 0x3e;
        auVar98._24_2_ = 0x3e;
        auVar98._26_2_ = 0x3e;
        auVar98._28_2_ = 0x3e;
        auVar98._30_2_ = 0x3e;
        uVar13 = dy;
        do {
          iVar14 = (int)uVar13 >> 6;
          lVar19 = lVar9;
          if (iVar14 < 0x3f) {
            uVar6 = (ushort)(uVar13 >> 1);
            uVar116 = uVar6 & 0x1f;
            auVar119._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar119._8_2_ = uVar116;
            auVar119._10_2_ = uVar116;
            auVar119._12_2_ = uVar116;
            auVar119._14_2_ = uVar116;
            auVar119._16_2_ = uVar116;
            auVar119._18_2_ = uVar116;
            auVar119._20_2_ = uVar116;
            auVar119._22_2_ = uVar116;
            auVar119._24_2_ = uVar116;
            auVar119._26_2_ = uVar116;
            auVar119._28_2_ = uVar116;
            auVar119._30_2_ = uVar116;
            lVar19 = (long)iVar14;
            lVar24 = 0;
            do {
              auVar154 = auVar45;
              if (lVar19 + lVar24 < 0x3f) {
                auVar154 = vpsubw_avx2(*(undefined1 (*) [32])(left + lVar19 + lVar24 + 1),
                                       *(undefined1 (*) [32])(left + lVar19 + lVar24));
                auVar155 = vpmullw_avx2(auVar154,auVar119);
                auVar154 = vpsllw_avx2(*(undefined1 (*) [32])(left + lVar19 + lVar24),5);
                auVar154 = vpaddw_avx2(auVar154,auVar70);
                auVar154 = vpaddw_avx2(auVar155,auVar154);
                auVar155 = vpsrlw_avx2(auVar154,5);
                iVar23 = (int)lVar24;
                auVar169._0_2_ = (undefined2)(iVar14 + iVar23);
                auVar169._2_2_ = auVar169._0_2_;
                auVar169._4_2_ = auVar169._0_2_;
                auVar169._6_2_ = auVar169._0_2_;
                auVar169._8_2_ = auVar169._0_2_;
                auVar169._10_2_ = auVar169._0_2_;
                auVar169._12_2_ = auVar169._0_2_;
                auVar169._14_2_ = auVar169._0_2_;
                auVar185 = vpaddw_avx(auVar169,auVar277);
                auVar278 = vpslldq_avx(auVar185,2);
                auVar278 = vpblendw_avx(auVar278,ZEXT416((uint)(iVar14 + iVar23)),1);
                auVar185 = vpsrldq_avx(auVar185,0xe);
                auVar209._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar33;
                auVar209._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar185;
                auVar282._0_2_ = (undefined2)(iVar14 + 9 + iVar23);
                auVar282._2_2_ = auVar282._0_2_;
                auVar282._4_2_ = auVar282._0_2_;
                auVar282._6_2_ = auVar282._0_2_;
                auVar282._8_2_ = auVar282._0_2_;
                auVar282._10_2_ = auVar282._0_2_;
                auVar282._12_2_ = auVar282._0_2_;
                auVar282._14_2_ = auVar282._0_2_;
                auVar282._16_2_ = auVar282._0_2_;
                auVar282._18_2_ = auVar282._0_2_;
                auVar282._20_2_ = auVar282._0_2_;
                auVar282._22_2_ = auVar282._0_2_;
                auVar282._24_2_ = auVar282._0_2_;
                auVar282._26_2_ = auVar282._0_2_;
                auVar282._28_2_ = auVar282._0_2_;
                auVar282._30_2_ = auVar282._0_2_;
                auVar154 = vpblendw_avx2(auVar209,auVar282,2);
                auVar283._0_2_ = (undefined2)(iVar14 + 10 + iVar23);
                auVar283._2_2_ = auVar283._0_2_;
                auVar283._4_2_ = auVar283._0_2_;
                auVar283._6_2_ = auVar283._0_2_;
                auVar283._8_2_ = auVar283._0_2_;
                auVar283._10_2_ = auVar283._0_2_;
                auVar283._12_2_ = auVar283._0_2_;
                auVar283._14_2_ = auVar283._0_2_;
                auVar283._16_2_ = auVar283._0_2_;
                auVar283._18_2_ = auVar283._0_2_;
                auVar283._20_2_ = auVar283._0_2_;
                auVar283._22_2_ = auVar283._0_2_;
                auVar283._24_2_ = auVar283._0_2_;
                auVar283._26_2_ = auVar283._0_2_;
                auVar283._28_2_ = auVar283._0_2_;
                auVar283._30_2_ = auVar283._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar283,4);
                auVar284._0_2_ = (undefined2)(iVar14 + 0xb + iVar23);
                auVar284._2_2_ = auVar284._0_2_;
                auVar284._4_2_ = auVar284._0_2_;
                auVar284._6_2_ = auVar284._0_2_;
                auVar284._8_2_ = auVar284._0_2_;
                auVar284._10_2_ = auVar284._0_2_;
                auVar284._12_2_ = auVar284._0_2_;
                auVar284._14_2_ = auVar284._0_2_;
                auVar284._16_2_ = auVar284._0_2_;
                auVar284._18_2_ = auVar284._0_2_;
                auVar284._20_2_ = auVar284._0_2_;
                auVar284._22_2_ = auVar284._0_2_;
                auVar284._24_2_ = auVar284._0_2_;
                auVar284._26_2_ = auVar284._0_2_;
                auVar284._28_2_ = auVar284._0_2_;
                auVar284._30_2_ = auVar284._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar284,8);
                auVar285._0_2_ = (undefined2)(iVar14 + 0xc + iVar23);
                auVar285._2_2_ = auVar285._0_2_;
                auVar285._4_2_ = auVar285._0_2_;
                auVar285._6_2_ = auVar285._0_2_;
                auVar285._8_2_ = auVar285._0_2_;
                auVar285._10_2_ = auVar285._0_2_;
                auVar285._12_2_ = auVar285._0_2_;
                auVar285._14_2_ = auVar285._0_2_;
                auVar285._16_2_ = auVar285._0_2_;
                auVar285._18_2_ = auVar285._0_2_;
                auVar285._20_2_ = auVar285._0_2_;
                auVar285._22_2_ = auVar285._0_2_;
                auVar285._24_2_ = auVar285._0_2_;
                auVar285._26_2_ = auVar285._0_2_;
                auVar285._28_2_ = auVar285._0_2_;
                auVar285._30_2_ = auVar285._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar285,0x10);
                auVar286._0_2_ = (undefined2)(iVar14 + 0xd + iVar23);
                auVar286._2_2_ = auVar286._0_2_;
                auVar286._4_2_ = auVar286._0_2_;
                auVar286._6_2_ = auVar286._0_2_;
                auVar286._8_2_ = auVar286._0_2_;
                auVar286._10_2_ = auVar286._0_2_;
                auVar286._12_2_ = auVar286._0_2_;
                auVar286._14_2_ = auVar286._0_2_;
                auVar286._16_2_ = auVar286._0_2_;
                auVar286._18_2_ = auVar286._0_2_;
                auVar286._20_2_ = auVar286._0_2_;
                auVar286._22_2_ = auVar286._0_2_;
                auVar286._24_2_ = auVar286._0_2_;
                auVar286._26_2_ = auVar286._0_2_;
                auVar286._28_2_ = auVar286._0_2_;
                auVar286._30_2_ = auVar286._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar286,0x20);
                auVar287._0_2_ = (undefined2)(iVar14 + 0xe + iVar23);
                auVar287._2_2_ = auVar287._0_2_;
                auVar287._4_2_ = auVar287._0_2_;
                auVar287._6_2_ = auVar287._0_2_;
                auVar287._8_2_ = auVar287._0_2_;
                auVar287._10_2_ = auVar287._0_2_;
                auVar287._12_2_ = auVar287._0_2_;
                auVar287._14_2_ = auVar287._0_2_;
                auVar287._16_2_ = auVar287._0_2_;
                auVar287._18_2_ = auVar287._0_2_;
                auVar287._20_2_ = auVar287._0_2_;
                auVar287._22_2_ = auVar287._0_2_;
                auVar287._24_2_ = auVar287._0_2_;
                auVar287._26_2_ = auVar287._0_2_;
                auVar287._28_2_ = auVar287._0_2_;
                auVar287._30_2_ = auVar287._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar287,0x40);
                auVar288._0_2_ = (undefined2)(iVar14 + 0xf + iVar23);
                auVar288._2_2_ = auVar288._0_2_;
                auVar288._4_2_ = auVar288._0_2_;
                auVar288._6_2_ = auVar288._0_2_;
                auVar288._8_2_ = auVar288._0_2_;
                auVar288._10_2_ = auVar288._0_2_;
                auVar288._12_2_ = auVar288._0_2_;
                auVar288._14_2_ = auVar288._0_2_;
                auVar288._16_2_ = auVar288._0_2_;
                auVar288._18_2_ = auVar288._0_2_;
                auVar288._20_2_ = auVar288._0_2_;
                auVar288._22_2_ = auVar288._0_2_;
                auVar288._24_2_ = auVar288._0_2_;
                auVar288._26_2_ = auVar288._0_2_;
                auVar288._28_2_ = auVar288._0_2_;
                auVar288._30_2_ = auVar288._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar288,0x80);
                auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
                auVar154 = vpcmpgtw_avx2(auVar154,auVar98);
                auVar154 = vpblendvb_avx2(auVar155,auVar45,auVar154);
              }
              uVar20 = uVar12 | 0x20;
              if (lVar24 == 0) {
                uVar20 = uVar12;
              }
              *(undefined1 (*) [32])(local_2060 + uVar20 * 0x20) = auVar154;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 == 0x10);
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [32])(local_1c60 + lVar19) = auVar45;
              *(undefined1 (*) [32])(auStack_1860 + lVar19) = auVar45;
              lVar19 = lVar19 + 0x20;
            } while (lVar19 != 0);
          }
          if (0x3e < iVar14) break;
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar12 != 0x20);
      }
      else {
        auVar72._8_4_ = 0x10;
        auVar72._0_8_ = 0x1000000010;
        auVar72._12_4_ = 0x10;
        auVar72._16_4_ = 0x10;
        auVar72._20_4_ = 0x10;
        auVar72._24_4_ = 0x10;
        auVar72._28_4_ = 0x10;
        auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar100._8_2_ = 0x3e;
        auVar100._0_8_ = 0x3e003e003e003e;
        auVar100._10_2_ = 0x3e;
        auVar100._12_2_ = 0x3e;
        auVar100._14_2_ = 0x3e;
        auVar100._16_2_ = 0x3e;
        auVar100._18_2_ = 0x3e;
        auVar100._20_2_ = 0x3e;
        auVar100._22_2_ = 0x3e;
        auVar100._24_2_ = 0x3e;
        auVar100._26_2_ = 0x3e;
        auVar100._28_2_ = 0x3e;
        auVar100._30_2_ = 0x3e;
        uVar13 = dy;
        do {
          iVar14 = (int)uVar13 >> 6;
          lVar19 = lVar9;
          if (iVar14 < 0x3f) {
            uVar17 = uVar13 >> 1;
            uVar18 = uVar17 & 0x1f801f;
            auVar122._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f801f001f801f;
            auVar122._8_4_ = uVar18;
            auVar122._12_4_ = uVar18;
            auVar122._16_4_ = uVar18;
            auVar122._20_4_ = uVar18;
            auVar122._24_4_ = uVar18;
            auVar122._28_4_ = uVar18;
            lVar19 = (long)iVar14;
            lVar24 = 0;
            do {
              auVar154 = auVar45;
              if (lVar19 + lVar24 < 0x3f) {
                auVar185 = auVar33;
                if (lVar19 + lVar24 < 0x37) {
                  auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24 + 8));
                  auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24 + 9));
                  auVar155 = vpsubd_avx2(auVar155,auVar154);
                  auVar154 = vpslld_avx2(auVar154,5);
                  auVar155 = vpmulld_avx2(auVar155,auVar122);
                  auVar154 = vpaddd_avx2(auVar154,auVar72);
                  auVar154 = vpaddd_avx2(auVar155,auVar154);
                  auVar154 = vpsrld_avx2(auVar154,5);
                  auVar174._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar154._16_16_;
                  auVar174._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar33;
                  auVar154 = vpackusdw_avx2(auVar154,auVar174);
                  auVar185 = auVar154._0_16_;
                }
                auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24));
                auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24 + 1));
                auVar155 = vpsubd_avx2(auVar155,auVar154);
                auVar154 = vpslld_avx2(auVar154,5);
                auVar155 = vpmulld_avx2(auVar155,auVar122);
                auVar154 = vpaddd_avx2(auVar154,auVar72);
                auVar154 = vpaddd_avx2(auVar155,auVar154);
                auVar154 = vpsrld_avx2(auVar154,5);
                auVar154 = vpackusdw_avx2(auVar154,ZEXT1632(auVar154._16_16_));
                iVar23 = (int)lVar24;
                auVar186._0_2_ = (undefined2)(iVar14 + iVar23);
                auVar186._2_2_ = auVar186._0_2_;
                auVar186._4_2_ = auVar186._0_2_;
                auVar186._6_2_ = auVar186._0_2_;
                auVar186._8_2_ = auVar186._0_2_;
                auVar186._10_2_ = auVar186._0_2_;
                auVar186._12_2_ = auVar186._0_2_;
                auVar186._14_2_ = auVar186._0_2_;
                auVar278 = vpaddw_avx(auVar186,auVar277);
                auVar310 = vpslldq_avx(auVar278,2);
                auVar310 = vpblendw_avx(auVar310,ZEXT416((uint)(iVar14 + iVar23)),1);
                auVar278 = vpsrldq_avx(auVar278,0xe);
                auVar289._0_16_ = ZEXT116(0) * auVar278 + ZEXT116(1) * auVar33;
                auVar289._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar278;
                auVar319._0_2_ = (undefined2)(iVar14 + 9 + iVar23);
                auVar319._2_2_ = auVar319._0_2_;
                auVar319._4_2_ = auVar319._0_2_;
                auVar319._6_2_ = auVar319._0_2_;
                auVar319._8_2_ = auVar319._0_2_;
                auVar319._10_2_ = auVar319._0_2_;
                auVar319._12_2_ = auVar319._0_2_;
                auVar319._14_2_ = auVar319._0_2_;
                auVar319._16_2_ = auVar319._0_2_;
                auVar319._18_2_ = auVar319._0_2_;
                auVar319._20_2_ = auVar319._0_2_;
                auVar319._22_2_ = auVar319._0_2_;
                auVar319._24_2_ = auVar319._0_2_;
                auVar319._26_2_ = auVar319._0_2_;
                auVar319._28_2_ = auVar319._0_2_;
                auVar319._30_2_ = auVar319._0_2_;
                auVar155 = vpblendw_avx2(auVar289,auVar319,2);
                auVar320._0_2_ = (undefined2)(iVar14 + 10 + iVar23);
                auVar320._2_2_ = auVar320._0_2_;
                auVar320._4_2_ = auVar320._0_2_;
                auVar320._6_2_ = auVar320._0_2_;
                auVar320._8_2_ = auVar320._0_2_;
                auVar320._10_2_ = auVar320._0_2_;
                auVar320._12_2_ = auVar320._0_2_;
                auVar320._14_2_ = auVar320._0_2_;
                auVar320._16_2_ = auVar320._0_2_;
                auVar320._18_2_ = auVar320._0_2_;
                auVar320._20_2_ = auVar320._0_2_;
                auVar320._22_2_ = auVar320._0_2_;
                auVar320._24_2_ = auVar320._0_2_;
                auVar320._26_2_ = auVar320._0_2_;
                auVar320._28_2_ = auVar320._0_2_;
                auVar320._30_2_ = auVar320._0_2_;
                auVar155 = vpblendw_avx2(auVar155,auVar320,4);
                auVar321._0_2_ = (undefined2)(iVar14 + 0xb + iVar23);
                auVar321._2_2_ = auVar321._0_2_;
                auVar321._4_2_ = auVar321._0_2_;
                auVar321._6_2_ = auVar321._0_2_;
                auVar321._8_2_ = auVar321._0_2_;
                auVar321._10_2_ = auVar321._0_2_;
                auVar321._12_2_ = auVar321._0_2_;
                auVar321._14_2_ = auVar321._0_2_;
                auVar321._16_2_ = auVar321._0_2_;
                auVar321._18_2_ = auVar321._0_2_;
                auVar321._20_2_ = auVar321._0_2_;
                auVar321._22_2_ = auVar321._0_2_;
                auVar321._24_2_ = auVar321._0_2_;
                auVar321._26_2_ = auVar321._0_2_;
                auVar321._28_2_ = auVar321._0_2_;
                auVar321._30_2_ = auVar321._0_2_;
                auVar155 = vpblendw_avx2(auVar155,auVar321,8);
                auVar322._0_2_ = (undefined2)(iVar14 + 0xc + iVar23);
                auVar322._2_2_ = auVar322._0_2_;
                auVar322._4_2_ = auVar322._0_2_;
                auVar322._6_2_ = auVar322._0_2_;
                auVar322._8_2_ = auVar322._0_2_;
                auVar322._10_2_ = auVar322._0_2_;
                auVar322._12_2_ = auVar322._0_2_;
                auVar322._14_2_ = auVar322._0_2_;
                auVar322._16_2_ = auVar322._0_2_;
                auVar322._18_2_ = auVar322._0_2_;
                auVar322._20_2_ = auVar322._0_2_;
                auVar322._22_2_ = auVar322._0_2_;
                auVar322._24_2_ = auVar322._0_2_;
                auVar322._26_2_ = auVar322._0_2_;
                auVar322._28_2_ = auVar322._0_2_;
                auVar322._30_2_ = auVar322._0_2_;
                auVar155 = vpblendw_avx2(auVar155,auVar322,0x10);
                auVar323._0_2_ = (undefined2)(iVar14 + 0xd + iVar23);
                auVar323._2_2_ = auVar323._0_2_;
                auVar323._4_2_ = auVar323._0_2_;
                auVar323._6_2_ = auVar323._0_2_;
                auVar323._8_2_ = auVar323._0_2_;
                auVar323._10_2_ = auVar323._0_2_;
                auVar323._12_2_ = auVar323._0_2_;
                auVar323._14_2_ = auVar323._0_2_;
                auVar323._16_2_ = auVar323._0_2_;
                auVar323._18_2_ = auVar323._0_2_;
                auVar323._20_2_ = auVar323._0_2_;
                auVar323._22_2_ = auVar323._0_2_;
                auVar323._24_2_ = auVar323._0_2_;
                auVar323._26_2_ = auVar323._0_2_;
                auVar323._28_2_ = auVar323._0_2_;
                auVar323._30_2_ = auVar323._0_2_;
                auVar155 = vpblendw_avx2(auVar155,auVar323,0x20);
                auVar324._0_2_ = (undefined2)(iVar14 + 0xe + iVar23);
                auVar324._2_2_ = auVar324._0_2_;
                auVar324._4_2_ = auVar324._0_2_;
                auVar324._6_2_ = auVar324._0_2_;
                auVar324._8_2_ = auVar324._0_2_;
                auVar324._10_2_ = auVar324._0_2_;
                auVar324._12_2_ = auVar324._0_2_;
                auVar324._14_2_ = auVar324._0_2_;
                auVar324._16_2_ = auVar324._0_2_;
                auVar324._18_2_ = auVar324._0_2_;
                auVar324._20_2_ = auVar324._0_2_;
                auVar324._22_2_ = auVar324._0_2_;
                auVar324._24_2_ = auVar324._0_2_;
                auVar324._26_2_ = auVar324._0_2_;
                auVar324._28_2_ = auVar324._0_2_;
                auVar324._30_2_ = auVar324._0_2_;
                auVar155 = vpblendw_avx2(auVar155,auVar324,0x40);
                auVar325._0_2_ = (undefined2)(iVar14 + 0xf + iVar23);
                auVar325._2_2_ = auVar325._0_2_;
                auVar325._4_2_ = auVar325._0_2_;
                auVar325._6_2_ = auVar325._0_2_;
                auVar325._8_2_ = auVar325._0_2_;
                auVar325._10_2_ = auVar325._0_2_;
                auVar325._12_2_ = auVar325._0_2_;
                auVar325._14_2_ = auVar325._0_2_;
                auVar325._16_2_ = auVar325._0_2_;
                auVar325._18_2_ = auVar325._0_2_;
                auVar325._20_2_ = auVar325._0_2_;
                auVar325._22_2_ = auVar325._0_2_;
                auVar325._24_2_ = auVar325._0_2_;
                auVar325._26_2_ = auVar325._0_2_;
                auVar325._28_2_ = auVar325._0_2_;
                auVar325._30_2_ = auVar325._0_2_;
                auVar155 = vpblendw_avx2(auVar155,auVar325,0x80);
                auVar155 = vpblendd_avx2(ZEXT1632(auVar310),auVar155,0xf0);
                auVar155 = vpcmpgtw_avx2(auVar155,auVar100);
                auVar157._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar154._0_16_;
                auVar157._16_16_ = ZEXT116(0) * auVar154._16_16_ + ZEXT116(1) * auVar185;
                auVar154 = vpblendvb_avx2(auVar157,auVar45,auVar155);
              }
              uVar20 = uVar12 | 0x20;
              if (lVar24 == 0) {
                uVar20 = uVar12;
              }
              *(undefined1 (*) [32])(local_2060 + uVar20 * 0x20) = auVar154;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 == 0x10);
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [32])(local_1c60 + lVar19) = auVar45;
              *(undefined1 (*) [32])(auStack_1860 + lVar19) = auVar45;
              lVar19 = lVar19 + 0x20;
            } while (lVar19 != 0);
          }
          if (0x3e < iVar14) break;
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar12 != 0x20);
      }
      auVar154 = vpunpcklwd_avx2(local_2060,local_2040);
      auVar155 = vpunpcklwd_avx2(local_2020,local_2000);
      auVar210 = vpunpcklwd_avx2(local_1fe0,local_1fc0);
      auVar381 = vpunpcklwd_avx2(local_1fa0,local_1f80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      _local_2660 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_2640 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_2620 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2600 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(local_2060,local_2040);
      auVar155 = vpunpckhwd_avx2(local_2020,local_2000);
      auVar210 = vpunpckhwd_avx2(local_1fe0,local_1fc0);
      auVar381 = vpunpckhwd_avx2(local_1fa0,local_1f80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_25e0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_25c0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_25a0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2580 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpcklwd_avx2(local_1f60,local_1f40);
      auVar155 = vpunpcklwd_avx2(local_1f20,local_1f00);
      auVar210 = vpunpcklwd_avx2(local_1ee0,local_1ec0);
      auVar381 = vpunpcklwd_avx2(local_1ea0,local_1e80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_2560 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_2540 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_2520 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2500 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(local_1f60,local_1f40);
      auVar155 = vpunpckhwd_avx2(local_1f20,local_1f00);
      auVar210 = vpunpckhwd_avx2(local_1ee0,local_1ec0);
      auVar381 = vpunpckhwd_avx2(local_1ea0,local_1e80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_24e0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_24c0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_24a0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2480 = vpunpckhqdq_avx2(auVar154,auVar155);
      lVar9 = 0;
      do {
        auVar154 = *(undefined1 (*) [32])(local_2560 + lVar9);
        auVar155 = vperm2i128_avx2(auVar154,*(undefined1 (*) [32])(local_2660 + lVar9),2);
        auVar47._0_16_ =
             ZEXT116(1) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10) +
             ZEXT116(0) * auVar154._0_16_;
        auVar47._16_16_ =
             ZEXT116(1) * auVar154._16_16_ +
             ZEXT116(0) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10);
        *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar155;
        *(undefined1 (*) [32])(auStack_2160 + lVar9) = auVar47;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x100);
      lVar9 = 0;
      puVar10 = dst;
      do {
        uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
        uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
        uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
        *(undefined8 *)puVar10 = *(undefined8 *)((long)auStack_2260 + lVar9);
        *(undefined8 *)(puVar10 + 4) = uVar5;
        *(undefined8 *)(puVar10 + 8) = uVar7;
        *(undefined8 *)(puVar10 + 0xc) = uVar8;
        lVar9 = lVar9 + 0x20;
        puVar10 = puVar10 + stride;
      } while (lVar9 != 0x200);
      auVar154 = vpunpcklwd_avx2(local_1e60,local_1e40);
      auVar155 = vpunpcklwd_avx2(local_1e20,local_1e00);
      auVar210 = vpunpcklwd_avx2(local_1de0,local_1dc0);
      auVar381 = vpunpcklwd_avx2(local_1da0,local_1d80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      _local_2660 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_2640 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_2620 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2600 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(local_1e60,local_1e40);
      auVar155 = vpunpckhwd_avx2(local_1e20,local_1e00);
      auVar210 = vpunpckhwd_avx2(local_1de0,local_1dc0);
      auVar381 = vpunpckhwd_avx2(local_1da0,local_1d80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_25e0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_25c0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_25a0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2580 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpcklwd_avx2(local_1d60,local_1d40);
      auVar155 = vpunpcklwd_avx2(local_1d20,local_1d00);
      auVar210 = vpunpcklwd_avx2(local_1ce0,local_1cc0);
      auVar381 = vpunpcklwd_avx2(local_1ca0,local_1c80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_2560 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_2540 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_2520 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2500 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(local_1d60,local_1d40);
      auVar155 = vpunpckhwd_avx2(local_1d20,local_1d00);
      auVar210 = vpunpckhwd_avx2(local_1ce0,local_1cc0);
      auVar381 = vpunpckhwd_avx2(local_1ca0,local_1c80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_24e0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_24c0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_24a0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2480 = vpunpckhqdq_avx2(auVar154,auVar155);
      lVar9 = 0;
      do {
        auVar154 = *(undefined1 (*) [32])(local_2560 + lVar9);
        auVar155 = vperm2i128_avx2(auVar154,*(undefined1 (*) [32])(local_2660 + lVar9),2);
        auVar48._0_16_ =
             ZEXT116(1) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10) +
             ZEXT116(0) * auVar154._0_16_;
        auVar48._16_16_ =
             ZEXT116(1) * auVar154._16_16_ +
             ZEXT116(0) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10);
        *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar155;
        *(undefined1 (*) [32])(auStack_2160 + lVar9) = auVar48;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x100);
      puVar10 = dst + 0x10;
      lVar9 = 0;
      do {
        uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
        uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
        uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
        *(undefined8 *)puVar10 = *(undefined8 *)((long)auStack_2260 + lVar9);
        *(undefined8 *)(puVar10 + 4) = uVar5;
        *(undefined8 *)(puVar10 + 8) = uVar7;
        *(undefined8 *)(puVar10 + 0xc) = uVar8;
        lVar9 = lVar9 + 0x20;
        puVar10 = puVar10 + stride;
      } while (lVar9 != 0x200);
      auVar154 = vpunpcklwd_avx2(local_1c60,local_1c40);
      auVar155 = vpunpcklwd_avx2(local_1c20,local_1c00);
      auVar210 = vpunpcklwd_avx2(local_1be0,local_1bc0);
      auVar381 = vpunpcklwd_avx2(local_1ba0,local_1b80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      _local_2660 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_2640 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_2620 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2600 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(local_1c60,local_1c40);
      auVar155 = vpunpckhwd_avx2(local_1c20,local_1c00);
      auVar210 = vpunpckhwd_avx2(local_1be0,local_1bc0);
      auVar381 = vpunpckhwd_avx2(local_1ba0,local_1b80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_25e0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_25c0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_25a0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2580 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpcklwd_avx2(local_1b60,local_1b40);
      auVar155 = vpunpcklwd_avx2(local_1b20,local_1b00);
      auVar210 = vpunpcklwd_avx2(local_1ae0,local_1ac0);
      auVar381 = vpunpcklwd_avx2(local_1aa0,local_1a80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_2560 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_2540 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_2520 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2500 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(local_1b60,local_1b40);
      auVar155 = vpunpckhwd_avx2(local_1b20,local_1b00);
      auVar210 = vpunpckhwd_avx2(local_1ae0,local_1ac0);
      auVar381 = vpunpckhwd_avx2(local_1aa0,local_1a80);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_24e0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_24c0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_24a0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2480 = vpunpckhqdq_avx2(auVar154,auVar155);
      lVar9 = 0;
      do {
        auVar154 = *(undefined1 (*) [32])(local_2560 + lVar9);
        auVar155 = vperm2i128_avx2(auVar154,*(undefined1 (*) [32])(local_2660 + lVar9),2);
        auVar49._0_16_ =
             ZEXT116(1) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10) +
             ZEXT116(0) * auVar154._0_16_;
        auVar49._16_16_ =
             ZEXT116(1) * auVar154._16_16_ +
             ZEXT116(0) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10);
        *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar155;
        *(undefined1 (*) [32])(auStack_2160 + lVar9) = auVar49;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x100);
      puVar10 = dst + stride * 0x10;
      lVar9 = 0;
      do {
        uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
        uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
        uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
        *(undefined8 *)puVar10 = *(undefined8 *)((long)auStack_2260 + lVar9);
        *(undefined8 *)(puVar10 + 4) = uVar5;
        *(undefined8 *)(puVar10 + 8) = uVar7;
        *(undefined8 *)(puVar10 + 0xc) = uVar8;
        puVar10 = puVar10 + stride;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x200);
      auVar154 = vpunpcklwd_avx2(local_1a60,local_1a40);
      auVar155 = vpunpcklwd_avx2(local_1a20,local_1a00);
      auVar210 = vpunpcklwd_avx2(local_19e0,local_19c0);
      auVar381 = vpunpcklwd_avx2(local_19a0,local_1980);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      _local_2660 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_2640 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_2620 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2600 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(local_1a60,local_1a40);
      auVar155 = vpunpckhwd_avx2(local_1a20,local_1a00);
      auVar210 = vpunpckhwd_avx2(local_19e0,local_19c0);
      auVar381 = vpunpckhwd_avx2(local_19a0,local_1980);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_25e0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_25c0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_25a0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2580 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpcklwd_avx2(local_1960,local_1940);
      auVar155 = vpunpcklwd_avx2(local_1920,local_1900);
      auVar210 = vpunpcklwd_avx2(local_18e0,local_18c0);
      auVar381 = vpunpcklwd_avx2(local_18a0,local_1880);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_2560 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_2540 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_2520 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2500 = vpunpckhqdq_avx2(auVar154,auVar155);
      auVar154 = vpunpckhwd_avx2(local_1960,local_1940);
      auVar155 = vpunpckhwd_avx2(local_1920,local_1900);
      auVar210 = vpunpckhwd_avx2(local_18e0,local_18c0);
      auVar381 = vpunpckhwd_avx2(local_18a0,local_1880);
      auVar42 = vpunpckldq_avx2(auVar154,auVar155);
      auVar73 = vpunpckldq_avx2(auVar210,auVar381);
      local_24e0 = vpunpcklqdq_avx2(auVar42,auVar73);
      local_24c0 = vpunpckhqdq_avx2(auVar42,auVar73);
      auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
      auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
      local_24a0 = vpunpcklqdq_avx2(auVar154,auVar155);
      local_2480 = vpunpckhqdq_avx2(auVar154,auVar155);
      lVar9 = 0;
      do {
        auVar154 = *(undefined1 (*) [32])(local_2560 + lVar9);
        auVar155 = vperm2i128_avx2(auVar154,*(undefined1 (*) [32])(local_2660 + lVar9),2);
        auVar50._0_16_ =
             ZEXT116(1) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10) +
             ZEXT116(0) * auVar154._0_16_;
        auVar50._16_16_ =
             ZEXT116(1) * auVar154._16_16_ +
             ZEXT116(0) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10);
        *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar155;
        *(undefined1 (*) [32])(auStack_2160 + lVar9) = auVar50;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x100);
      puVar10 = dst + stride * 0x10 + 0x10;
      lVar9 = 0;
      do {
        uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
        uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
        uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
        *(undefined8 *)puVar10 = *(undefined8 *)((long)auStack_2260 + lVar9);
        *(undefined8 *)(puVar10 + 4) = uVar5;
        *(undefined8 *)(puVar10 + 8) = uVar7;
        *(undefined8 *)(puVar10 + 0xc) = uVar8;
        puVar10 = puVar10 + stride;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x200);
      return;
    }
    if (bw != 0x40) {
      return;
    }
    if (bd < 0xc) {
      uStackY_2688 = 0x9948b8;
      highbd_dr_prediction_z1_64xN_avx2(0x40,(uint16_t *)local_2060,0x40,left,dy,iVar14);
    }
    else {
      uStackY_2688 = 0x9967a0;
      highbd_dr_prediction_32bit_z1_64xN_avx2(0x40,(uint16_t *)local_2060,0x40,left,dy,iVar14);
    }
    iVar14 = 0x40;
LAB_009999cc:
    pitchSrc = 0x40;
    iVar23 = 0x40;
LAB_009999d2:
    uStackY_2688 = 0x9999d7;
    highbd_transpose((uint16_t *)local_2060,pitchSrc,dst,stride,iVar14,iVar23);
  }
  else {
    if (bw < bh) {
      if (bw * 2 == bh) {
        switch(bw << 0x1e | bw - 4U >> 2) {
        case 0:
          iVar14 = 0xb << (bVar11 & 0x1f);
          uVar4 = left[iVar14];
          auVar27._2_2_ = uVar4;
          auVar27._0_2_ = uVar4;
          auVar27._4_2_ = uVar4;
          auVar27._6_2_ = uVar4;
          auVar27._8_2_ = uVar4;
          auVar27._10_2_ = uVar4;
          auVar27._12_2_ = uVar4;
          auVar27._14_2_ = uVar4;
          auVar41._16_2_ = uVar4;
          auVar41._0_16_ = auVar27;
          auVar41._18_2_ = uVar4;
          auVar41._20_2_ = uVar4;
          auVar41._22_2_ = uVar4;
          auVar41._24_2_ = uVar4;
          auVar41._26_2_ = uVar4;
          auVar41._28_2_ = uVar4;
          auVar41._30_2_ = uVar4;
          if (bd < 0xc) {
            auVar60._0_2_ = (undefined2)iVar14;
            auVar60._2_2_ = auVar60._0_2_;
            auVar60._4_2_ = auVar60._0_2_;
            auVar60._6_2_ = auVar60._0_2_;
            auVar60._8_2_ = auVar60._0_2_;
            auVar60._10_2_ = auVar60._0_2_;
            auVar60._12_2_ = auVar60._0_2_;
            auVar60._14_2_ = auVar60._0_2_;
            lVar9 = 0;
            auVar88._8_2_ = 0x10;
            auVar88._0_8_ = 0x10001000100010;
            auVar88._10_2_ = 0x10;
            auVar88._12_2_ = 0x10;
            auVar88._14_2_ = 0x10;
            auVar150._8_2_ = 0x1f;
            auVar150._0_8_ = 0x1f001f001f001f;
            auVar150._10_2_ = 0x1f;
            auVar150._12_2_ = 0x1f;
            auVar150._14_2_ = 0x1f;
            auVar150._16_2_ = 0x1f;
            auVar150._18_2_ = 0x1f;
            auVar150._20_2_ = 0x1f;
            auVar150._22_2_ = 0x1f;
            auVar150._24_2_ = 0x1f;
            auVar150._26_2_ = 0x1f;
            auVar150._28_2_ = 0x1f;
            auVar150._30_2_ = 0x1f;
            lVar19 = 0;
            uVar13 = dy;
            do {
              uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
              lVar24 = lVar9;
              if ((int)uVar17 < iVar14) {
                auVar277 = *(undefined1 (*) [16])(left + (int)uVar17);
                if (upsample_left == 0) {
                  auVar185 = *(undefined1 (*) [16])(left + (long)(int)uVar17 + 1);
                  auVar278 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 1,1);
                  auVar278 = vpinsrw_avx(auVar278,uVar17 + 2,2);
                  auVar278 = vpinsrw_avx(auVar278,uVar17 + 3,3);
                  auVar278 = vpinsrw_avx(auVar278,uVar17 + 4,4);
                  auVar278 = vpinsrw_avx(auVar278,uVar17 + 5,5);
                  auVar278 = vpinsrw_avx(auVar278,uVar17 + 6,6);
                  auVar278 = vpinsrw_avx(auVar278,uVar17 + 7,7);
                  uVar6 = (ushort)(uVar13 >> 1);
                  uVar116 = uVar6 & 0x1f;
                  auVar308._0_8_ =
                       CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
                  auVar308._8_2_ = uVar116;
                  auVar308._10_2_ = uVar116;
                  auVar308._12_2_ = uVar116;
                  auVar308._14_2_ = uVar116;
                }
                else {
                  auVar185 = vpblendw_avx(auVar277,(undefined1  [16])0x0,0xaa);
                  auVar278 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8),
                                          (undefined1  [16])0x0,0xaa);
                  auVar354 = vpsrld_avx(auVar277,0x10);
                  auVar277 = vpackusdw_avx(auVar185,auVar278);
                  auVar310 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8),0x10);
                  auVar185 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 2,1);
                  auVar185 = vpinsrw_avx(auVar185,uVar17 + 4,2);
                  auVar185 = vpinsrw_avx(auVar185,uVar17 + 6,3);
                  auVar185 = vpinsrw_avx(auVar185,uVar17 + 8,4);
                  auVar185 = vpinsrw_avx(auVar185,uVar17 + 10,5);
                  auVar185 = vpinsrw_avx(auVar185,uVar17 + 0xc,6);
                  auVar278 = vpinsrw_avx(auVar185,uVar17 + 0xe,7);
                  auVar317._0_2_ = (undefined2)uVar13;
                  auVar317._2_2_ = auVar317._0_2_;
                  auVar317._4_2_ = auVar317._0_2_;
                  auVar317._6_2_ = auVar317._0_2_;
                  auVar317._8_2_ = auVar317._0_2_;
                  auVar317._10_2_ = auVar317._0_2_;
                  auVar317._12_2_ = auVar317._0_2_;
                  auVar317._14_2_ = auVar317._0_2_;
                  auVar317._16_2_ = auVar317._0_2_;
                  auVar317._18_2_ = auVar317._0_2_;
                  auVar317._20_2_ = auVar317._0_2_;
                  auVar317._22_2_ = auVar317._0_2_;
                  auVar317._24_2_ = auVar317._0_2_;
                  auVar317._26_2_ = auVar317._0_2_;
                  auVar317._28_2_ = auVar317._0_2_;
                  auVar317._30_2_ = auVar317._0_2_;
                  auVar154 = vpsllw_avx2(auVar317,ZEXT416((uint)upsample_left));
                  auVar185 = vpackusdw_avx(auVar354,auVar310);
                  auVar154 = vpsrlw_avx2(auVar154,1);
                  auVar154 = vpand_avx2(auVar154,auVar150);
                  auVar308 = auVar154._0_16_;
                }
                auVar310 = vpsllw_avx(auVar277,5);
                auVar310 = vpaddw_avx(auVar310,auVar88);
                auVar277 = vpsubw_avx(auVar185,auVar277);
                auVar277 = vpmullw_avx(auVar308,auVar277);
                auVar277 = vpaddw_avx(auVar310,auVar277);
                auVar185 = vpsrlw_avx(auVar277,5);
                auVar277 = vpcmpgtw_avx(auVar60,auVar278);
                auVar277 = vpblendvb_avx(auVar27,auVar185,auVar277);
                *(undefined1 (*) [16])(local_2660 + lVar19 * 0x10) = auVar277;
                uVar13 = uVar13 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [16])(local_2660 + lVar24) = auVar27;
                  lVar24 = lVar24 + 0x10;
                } while (lVar24 != 0x40);
              }
              if (iVar14 <= (int)uVar17) break;
              lVar19 = lVar19 + 1;
              lVar9 = lVar9 + 0x10;
            } while (lVar19 != 4);
          }
          else {
            auVar85._4_4_ = iVar14;
            auVar85._0_4_ = iVar14;
            auVar85._8_4_ = iVar14;
            auVar85._12_4_ = iVar14;
            auVar85._16_4_ = iVar14;
            auVar85._20_4_ = iVar14;
            auVar85._24_4_ = iVar14;
            auVar85._28_4_ = iVar14;
            lVar9 = 0;
            auVar277 = vpmovsxbd_avx(ZEXT416(0x3020104));
            auVar113._8_4_ = 0x10;
            auVar113._0_8_ = 0x1000000010;
            auVar113._12_4_ = 0x10;
            auVar113._16_4_ = 0x10;
            auVar113._20_4_ = 0x10;
            auVar113._24_4_ = 0x10;
            auVar113._28_4_ = 0x10;
            auVar185 = vpmovsxbd_avx(ZEXT416(0x6040208));
            auVar182._8_4_ = 0x1f;
            auVar182._0_8_ = 0x1f0000001f;
            auVar182._12_4_ = 0x1f;
            auVar182._16_4_ = 0x1f;
            auVar182._20_4_ = 0x1f;
            auVar182._24_4_ = 0x1f;
            auVar182._28_4_ = 0x1f;
            lVar19 = 0;
            uVar13 = dy;
            do {
              iVar23 = (int)uVar13 >> (6 - bVar11 & 0x1f);
              lVar24 = lVar9;
              if (iVar23 < iVar14) {
                auVar267 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar23));
                if (upsample_left == 0) {
                  auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 1));
                  auVar315._4_4_ = iVar23;
                  auVar315._0_4_ = iVar23;
                  auVar315._8_4_ = iVar23;
                  auVar315._12_4_ = iVar23;
                  iVar1 = iVar23 + 5;
                  iVar2 = iVar23 + 6;
                  iVar3 = iVar23 + 7;
                  auVar278 = vpaddd_avx(auVar315,auVar277);
                  auVar155 = vpermq_avx2(ZEXT1632(auVar278),0xc4);
                  auVar155 = vpblendd_avx2(auVar155,ZEXT1632(auVar315),1);
                  auVar363._4_4_ = iVar1;
                  auVar363._0_4_ = iVar1;
                  auVar363._8_4_ = iVar1;
                  auVar363._12_4_ = iVar1;
                  auVar363._16_4_ = iVar1;
                  auVar363._20_4_ = iVar1;
                  auVar363._24_4_ = iVar1;
                  auVar363._28_4_ = iVar1;
                  auVar155 = vpblendd_avx2(auVar155,auVar363,0x20);
                  auVar364._4_4_ = iVar2;
                  auVar364._0_4_ = iVar2;
                  auVar364._8_4_ = iVar2;
                  auVar364._12_4_ = iVar2;
                  auVar364._16_4_ = iVar2;
                  auVar364._20_4_ = iVar2;
                  auVar364._24_4_ = iVar2;
                  auVar364._28_4_ = iVar2;
                  auVar155 = vpblendd_avx2(auVar155,auVar364,0x40);
                  auVar365._4_4_ = iVar3;
                  auVar365._0_4_ = iVar3;
                  auVar365._8_4_ = iVar3;
                  auVar365._12_4_ = iVar3;
                  auVar365._16_4_ = iVar3;
                  auVar365._20_4_ = iVar3;
                  auVar365._24_4_ = iVar3;
                  auVar365._28_4_ = iVar3;
                  auVar155 = vpblendd_avx2(auVar155,auVar365,0x80);
                  uVar17 = uVar13 >> 1;
                  uVar18 = uVar17 & 0x1f;
                  auVar366._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f0000001f;
                  auVar366._8_4_ = uVar18;
                  auVar366._12_4_ = uVar18;
                  auVar366._16_4_ = uVar18;
                  auVar366._20_4_ = uVar18;
                  auVar366._24_4_ = uVar18;
                  auVar366._28_4_ = uVar18;
                }
                else {
                  auVar154 = vpshufd_avx2(auVar267,0xd8);
                  auVar210 = vpermq_avx2(auVar154,0xd8);
                  auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 8));
                  auVar154 = vpshufd_avx2(auVar154,0xd8);
                  auVar381 = vpermq_avx2(auVar154,0xd8);
                  auVar191._4_4_ = iVar23;
                  auVar191._0_4_ = iVar23;
                  auVar191._8_4_ = iVar23;
                  auVar191._12_4_ = iVar23;
                  iVar1 = iVar23 + 10;
                  iVar2 = iVar23 + 0xc;
                  iVar3 = iVar23 + 0xe;
                  auVar278 = vpaddd_avx(auVar191,auVar185);
                  auVar154 = vpermq_avx2(ZEXT1632(auVar278),0xc4);
                  auVar154 = vpblendd_avx2(auVar154,ZEXT1632(auVar191),1);
                  auVar348._4_4_ = iVar1;
                  auVar348._0_4_ = iVar1;
                  auVar348._8_4_ = iVar1;
                  auVar348._12_4_ = iVar1;
                  auVar348._16_4_ = iVar1;
                  auVar348._20_4_ = iVar1;
                  auVar348._24_4_ = iVar1;
                  auVar348._28_4_ = iVar1;
                  auVar154 = vpblendd_avx2(auVar154,auVar348,0x20);
                  auVar349._4_4_ = iVar2;
                  auVar349._0_4_ = iVar2;
                  auVar349._8_4_ = iVar2;
                  auVar349._12_4_ = iVar2;
                  auVar349._16_4_ = iVar2;
                  auVar349._20_4_ = iVar2;
                  auVar349._24_4_ = iVar2;
                  auVar349._28_4_ = iVar2;
                  auVar154 = vpblendd_avx2(auVar154,auVar349,0x40);
                  auVar350._4_4_ = iVar3;
                  auVar350._0_4_ = iVar3;
                  auVar350._8_4_ = iVar3;
                  auVar350._12_4_ = iVar3;
                  auVar350._16_4_ = iVar3;
                  auVar350._20_4_ = iVar3;
                  auVar350._24_4_ = iVar3;
                  auVar350._28_4_ = iVar3;
                  auVar155 = vpblendd_avx2(auVar154,auVar350,0x80);
                  auVar266._4_4_ = uVar13;
                  auVar266._0_4_ = uVar13;
                  auVar266._8_4_ = uVar13;
                  auVar266._12_4_ = uVar13;
                  auVar266._16_4_ = uVar13;
                  auVar266._20_4_ = uVar13;
                  auVar266._24_4_ = uVar13;
                  auVar266._28_4_ = uVar13;
                  auVar154 = vpslld_avx2(auVar266,ZEXT416((uint)upsample_left));
                  auVar267._0_16_ = ZEXT116(0) * auVar381._0_16_ + ZEXT116(1) * auVar210._0_16_;
                  auVar267._16_16_ = ZEXT116(0) * auVar210._16_16_ + ZEXT116(1) * auVar381._0_16_;
                  auVar154 = vpsrld_avx2(auVar154,1);
                  auVar366 = vpand_avx2(auVar154,auVar182);
                  auVar154 = vperm2i128_avx2(auVar210,auVar381,0x31);
                }
                auVar155 = vpcmpgtd_avx2(auVar85,auVar155);
                auVar154 = vpsubd_avx2(auVar154,auVar267);
                auVar210 = vpmulld_avx2(auVar154,auVar366);
                auVar154 = vpslld_avx2(auVar267,5);
                auVar154 = vpaddd_avx2(auVar154,auVar113);
                auVar154 = vpaddd_avx2(auVar210,auVar154);
                auVar154 = vpsrld_avx2(auVar154,5);
                auVar310 = vpackusdw_avx(auVar154._0_16_,auVar154._16_16_);
                auVar278 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
                auVar154 = vpblendvb_avx2(auVar41,ZEXT1632(auVar310),ZEXT1632(auVar278));
                *(undefined1 (*) [16])(local_2660 + lVar19 * 0x10) = auVar154._0_16_;
                uVar13 = uVar13 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [16])(local_2660 + lVar24) = auVar27;
                  lVar24 = lVar24 + 0x10;
                } while (lVar24 != 0x40);
              }
              if (iVar14 <= iVar23) break;
              lVar19 = lVar19 + 1;
              lVar9 = lVar9 + 0x10;
            } while (lVar19 != 4);
          }
          auVar277 = vpunpcklwd_avx(local_2660._0_16_,stack0xffffffffffffd9b0);
          auVar185 = vpunpcklwd_avx(local_2640._0_16_,local_2640._16_16_);
          auVar278 = vpunpckldq_avx(auVar277,auVar185);
          auVar277 = vpunpckhdq_avx(auVar277,auVar185);
          local_2060._8_8_ = 0;
          local_2060._0_8_ = auVar278._0_8_;
          local_2060._16_16_ = vpsrldq_avx(auVar278,8);
          local_2040._8_8_ = 0;
          local_2040._0_8_ = auVar277._0_8_;
          local_2040._16_16_ = vpsrldq_avx(auVar277,8);
          auVar277 = vpunpckhwd_avx(local_2660._0_16_,stack0xffffffffffffd9b0);
          auVar185 = vpunpckhwd_avx(local_2640._0_16_,local_2640._16_16_);
          auVar278 = vpunpckldq_avx(auVar277,auVar185);
          auVar277 = vpunpckhdq_avx(auVar277,auVar185);
          local_2020._8_8_ = 0;
          local_2020._0_8_ = auVar278._0_8_;
          local_2020._16_16_ = vpsrldq_avx(auVar278,8);
          local_2000._8_8_ = 0;
          local_2000._0_8_ = auVar277._0_8_;
          local_2000._16_16_ = vpsrldq_avx(auVar277,8);
          lVar9 = 0;
          do {
            *(undefined8 *)dst = *(undefined8 *)(local_2060 + lVar9);
            lVar9 = lVar9 + 0x10;
            dst = dst + stride;
          } while (lVar9 != 0x80);
          return;
        case 1:
          uVar4 = left[0x17];
          auVar39._2_2_ = uVar4;
          auVar39._0_2_ = uVar4;
          auVar39._4_2_ = uVar4;
          auVar39._6_2_ = uVar4;
          auVar39._8_2_ = uVar4;
          auVar39._10_2_ = uVar4;
          auVar39._12_2_ = uVar4;
          auVar39._14_2_ = uVar4;
          auVar56._16_2_ = uVar4;
          auVar56._0_16_ = auVar39;
          auVar56._18_2_ = uVar4;
          auVar56._20_2_ = uVar4;
          auVar56._22_2_ = uVar4;
          auVar56._24_2_ = uVar4;
          auVar56._26_2_ = uVar4;
          auVar56._28_2_ = uVar4;
          auVar56._30_2_ = uVar4;
          lVar9 = 0;
          if (bd < 0xc) {
            auVar78._8_2_ = 0x10;
            auVar78._0_8_ = 0x10001000100010;
            auVar78._10_2_ = 0x10;
            auVar78._12_2_ = 0x10;
            auVar78._14_2_ = 0x10;
            auVar78._16_2_ = 0x10;
            auVar78._18_2_ = 0x10;
            auVar78._20_2_ = 0x10;
            auVar78._22_2_ = 0x10;
            auVar78._24_2_ = 0x10;
            auVar78._26_2_ = 0x10;
            auVar78._28_2_ = 0x10;
            auVar78._30_2_ = 0x10;
            auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar106._8_2_ = 0x16;
            auVar106._0_8_ = 0x16001600160016;
            auVar106._10_2_ = 0x16;
            auVar106._12_2_ = 0x16;
            auVar106._14_2_ = 0x16;
            auVar106._16_2_ = 0x16;
            auVar106._18_2_ = 0x16;
            auVar106._20_2_ = 0x16;
            auVar106._22_2_ = 0x16;
            auVar106._24_2_ = 0x16;
            auVar106._26_2_ = 0x16;
            auVar106._28_2_ = 0x16;
            auVar106._30_2_ = 0x16;
            lVar19 = 0;
            uVar13 = dy;
            do {
              uVar17 = (int)uVar13 >> 6;
              lVar24 = lVar9;
              if ((int)uVar17 < 0x17) {
                uVar6 = (ushort)(uVar13 >> 1);
                uVar116 = uVar6 & 0x1f;
                auVar127._0_8_ =
                     CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
                auVar127._8_2_ = uVar116;
                auVar127._10_2_ = uVar116;
                auVar127._12_2_ = uVar116;
                auVar127._14_2_ = uVar116;
                auVar127._16_2_ = uVar116;
                auVar127._18_2_ = uVar116;
                auVar127._20_2_ = uVar116;
                auVar127._22_2_ = uVar116;
                auVar127._24_2_ = uVar116;
                auVar127._26_2_ = uVar116;
                auVar127._28_2_ = uVar116;
                auVar127._30_2_ = uVar116;
                auVar154 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar17 + 1),
                                       *(undefined1 (*) [32])(left + (int)uVar17));
                auVar155 = vpmullw_avx2(auVar154,auVar127);
                auVar154 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar17),5);
                auVar154 = vpaddw_avx2(auVar154,auVar78);
                auVar154 = vpaddw_avx2(auVar155,auVar154);
                auVar155 = vpsrlw_avx2(auVar154,5);
                auVar145._0_2_ = (undefined2)uVar17;
                auVar145._2_2_ = auVar145._0_2_;
                auVar145._4_2_ = auVar145._0_2_;
                auVar145._6_2_ = auVar145._0_2_;
                auVar145._8_2_ = auVar145._0_2_;
                auVar145._10_2_ = auVar145._0_2_;
                auVar145._12_2_ = auVar145._0_2_;
                auVar145._14_2_ = auVar145._0_2_;
                auVar185 = vpaddw_avx(auVar145,auVar277);
                auVar278 = vpslldq_avx(auVar185,2);
                auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar17),1);
                auVar185 = vpsrldq_avx(auVar185,0xe);
                auVar161._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar39;
                auVar161._16_16_ = ZEXT116(0) * auVar56._16_16_ + ZEXT116(1) * auVar185;
                auVar236._0_2_ = (undefined2)(uVar17 + 9);
                auVar236._2_2_ = auVar236._0_2_;
                auVar236._4_2_ = auVar236._0_2_;
                auVar236._6_2_ = auVar236._0_2_;
                auVar236._8_2_ = auVar236._0_2_;
                auVar236._10_2_ = auVar236._0_2_;
                auVar236._12_2_ = auVar236._0_2_;
                auVar236._14_2_ = auVar236._0_2_;
                auVar236._16_2_ = auVar236._0_2_;
                auVar236._18_2_ = auVar236._0_2_;
                auVar236._20_2_ = auVar236._0_2_;
                auVar236._22_2_ = auVar236._0_2_;
                auVar236._24_2_ = auVar236._0_2_;
                auVar236._26_2_ = auVar236._0_2_;
                auVar236._28_2_ = auVar236._0_2_;
                auVar236._30_2_ = auVar236._0_2_;
                auVar154 = vpblendw_avx2(auVar161,auVar236,2);
                auVar237._0_2_ = (undefined2)(uVar17 + 10);
                auVar237._2_2_ = auVar237._0_2_;
                auVar237._4_2_ = auVar237._0_2_;
                auVar237._6_2_ = auVar237._0_2_;
                auVar237._8_2_ = auVar237._0_2_;
                auVar237._10_2_ = auVar237._0_2_;
                auVar237._12_2_ = auVar237._0_2_;
                auVar237._14_2_ = auVar237._0_2_;
                auVar237._16_2_ = auVar237._0_2_;
                auVar237._18_2_ = auVar237._0_2_;
                auVar237._20_2_ = auVar237._0_2_;
                auVar237._22_2_ = auVar237._0_2_;
                auVar237._24_2_ = auVar237._0_2_;
                auVar237._26_2_ = auVar237._0_2_;
                auVar237._28_2_ = auVar237._0_2_;
                auVar237._30_2_ = auVar237._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar237,4);
                auVar238._0_2_ = (undefined2)(uVar17 + 0xb);
                auVar238._2_2_ = auVar238._0_2_;
                auVar238._4_2_ = auVar238._0_2_;
                auVar238._6_2_ = auVar238._0_2_;
                auVar238._8_2_ = auVar238._0_2_;
                auVar238._10_2_ = auVar238._0_2_;
                auVar238._12_2_ = auVar238._0_2_;
                auVar238._14_2_ = auVar238._0_2_;
                auVar238._16_2_ = auVar238._0_2_;
                auVar238._18_2_ = auVar238._0_2_;
                auVar238._20_2_ = auVar238._0_2_;
                auVar238._22_2_ = auVar238._0_2_;
                auVar238._24_2_ = auVar238._0_2_;
                auVar238._26_2_ = auVar238._0_2_;
                auVar238._28_2_ = auVar238._0_2_;
                auVar238._30_2_ = auVar238._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar238,8);
                auVar239._0_2_ = (undefined2)(uVar17 + 0xc);
                auVar239._2_2_ = auVar239._0_2_;
                auVar239._4_2_ = auVar239._0_2_;
                auVar239._6_2_ = auVar239._0_2_;
                auVar239._8_2_ = auVar239._0_2_;
                auVar239._10_2_ = auVar239._0_2_;
                auVar239._12_2_ = auVar239._0_2_;
                auVar239._14_2_ = auVar239._0_2_;
                auVar239._16_2_ = auVar239._0_2_;
                auVar239._18_2_ = auVar239._0_2_;
                auVar239._20_2_ = auVar239._0_2_;
                auVar239._22_2_ = auVar239._0_2_;
                auVar239._24_2_ = auVar239._0_2_;
                auVar239._26_2_ = auVar239._0_2_;
                auVar239._28_2_ = auVar239._0_2_;
                auVar239._30_2_ = auVar239._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar239,0x10);
                auVar240._0_2_ = (undefined2)(uVar17 + 0xd);
                auVar240._2_2_ = auVar240._0_2_;
                auVar240._4_2_ = auVar240._0_2_;
                auVar240._6_2_ = auVar240._0_2_;
                auVar240._8_2_ = auVar240._0_2_;
                auVar240._10_2_ = auVar240._0_2_;
                auVar240._12_2_ = auVar240._0_2_;
                auVar240._14_2_ = auVar240._0_2_;
                auVar240._16_2_ = auVar240._0_2_;
                auVar240._18_2_ = auVar240._0_2_;
                auVar240._20_2_ = auVar240._0_2_;
                auVar240._22_2_ = auVar240._0_2_;
                auVar240._24_2_ = auVar240._0_2_;
                auVar240._26_2_ = auVar240._0_2_;
                auVar240._28_2_ = auVar240._0_2_;
                auVar240._30_2_ = auVar240._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar240,0x20);
                auVar241._0_2_ = (undefined2)(uVar17 + 0xe);
                auVar241._2_2_ = auVar241._0_2_;
                auVar241._4_2_ = auVar241._0_2_;
                auVar241._6_2_ = auVar241._0_2_;
                auVar241._8_2_ = auVar241._0_2_;
                auVar241._10_2_ = auVar241._0_2_;
                auVar241._12_2_ = auVar241._0_2_;
                auVar241._14_2_ = auVar241._0_2_;
                auVar241._16_2_ = auVar241._0_2_;
                auVar241._18_2_ = auVar241._0_2_;
                auVar241._20_2_ = auVar241._0_2_;
                auVar241._22_2_ = auVar241._0_2_;
                auVar241._24_2_ = auVar241._0_2_;
                auVar241._26_2_ = auVar241._0_2_;
                auVar241._28_2_ = auVar241._0_2_;
                auVar241._30_2_ = auVar241._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar241,0x40);
                auVar242._0_2_ = (undefined2)(uVar17 + 0xf);
                auVar242._2_2_ = auVar242._0_2_;
                auVar242._4_2_ = auVar242._0_2_;
                auVar242._6_2_ = auVar242._0_2_;
                auVar242._8_2_ = auVar242._0_2_;
                auVar242._10_2_ = auVar242._0_2_;
                auVar242._12_2_ = auVar242._0_2_;
                auVar242._14_2_ = auVar242._0_2_;
                auVar242._16_2_ = auVar242._0_2_;
                auVar242._18_2_ = auVar242._0_2_;
                auVar242._20_2_ = auVar242._0_2_;
                auVar242._22_2_ = auVar242._0_2_;
                auVar242._24_2_ = auVar242._0_2_;
                auVar242._26_2_ = auVar242._0_2_;
                auVar242._28_2_ = auVar242._0_2_;
                auVar242._30_2_ = auVar242._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar242,0x80);
                auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
                auVar154 = vpcmpgtw_avx2(auVar154,auVar106);
                auVar154 = vpblendvb_avx2(auVar155,auVar56,auVar154);
                *(undefined1 (*) [32])(local_2060 + lVar19 * 0x20) = auVar154;
                uVar13 = uVar13 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [32])(local_2060 + lVar24) = auVar56;
                  lVar24 = lVar24 + 0x20;
                } while (lVar24 != 0x100);
              }
              if (0x16 < (int)uVar17) break;
              lVar19 = lVar19 + 1;
              lVar9 = lVar9 + 0x20;
            } while (lVar19 != 8);
          }
          else {
            auVar86._8_4_ = 0x10;
            auVar86._0_8_ = 0x1000000010;
            auVar86._12_4_ = 0x10;
            auVar86._16_4_ = 0x10;
            auVar86._20_4_ = 0x10;
            auVar86._24_4_ = 0x10;
            auVar86._28_4_ = 0x10;
            auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar114._8_2_ = 0x16;
            auVar114._0_8_ = 0x16001600160016;
            auVar114._10_2_ = 0x16;
            auVar114._12_2_ = 0x16;
            auVar114._14_2_ = 0x16;
            auVar114._16_2_ = 0x16;
            auVar114._18_2_ = 0x16;
            auVar114._20_2_ = 0x16;
            auVar114._22_2_ = 0x16;
            auVar114._24_2_ = 0x16;
            auVar114._26_2_ = 0x16;
            auVar114._28_2_ = 0x16;
            auVar114._30_2_ = 0x16;
            lVar19 = 0;
            uVar13 = dy;
            do {
              uVar17 = (int)uVar13 >> 6;
              lVar24 = lVar9;
              if ((int)uVar17 < 0x17) {
                uVar18 = uVar13 >> 1;
                uVar16 = uVar18 & 0x1f;
                auVar138._0_8_ = CONCAT44(uVar18,uVar18) & 0x1f0000001f;
                auVar138._8_4_ = uVar16;
                auVar138._12_4_ = uVar16;
                auVar138._16_4_ = uVar16;
                auVar138._20_4_ = uVar16;
                auVar138._24_4_ = uVar16;
                auVar138._28_4_ = uVar16;
                auVar185 = auVar39;
                if ((int)uVar17 < 0xf) {
                  auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8));
                  auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 9));
                  auVar155 = vpsubd_avx2(auVar155,auVar154);
                  auVar154 = vpslld_avx2(auVar154,5);
                  auVar155 = vpmulld_avx2(auVar155,auVar138);
                  auVar154 = vpaddd_avx2(auVar154,auVar86);
                  auVar154 = vpaddd_avx2(auVar155,auVar154);
                  auVar154 = vpsrld_avx2(auVar154,5);
                  auVar183._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar154._16_16_;
                  auVar183._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
                  auVar154 = vpackusdw_avx2(auVar154,auVar183);
                  auVar185 = auVar154._0_16_;
                }
                auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar17));
                auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 1));
                auVar155 = vpsubd_avx2(auVar155,auVar154);
                auVar154 = vpslld_avx2(auVar154,5);
                auVar155 = vpmulld_avx2(auVar155,auVar138);
                auVar154 = vpaddd_avx2(auVar154,auVar86);
                auVar154 = vpaddd_avx2(auVar155,auVar154);
                auVar154 = vpsrld_avx2(auVar154,5);
                auVar154 = vpackusdw_avx2(auVar154,ZEXT1632(auVar154._16_16_));
                auVar139._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar154._0_16_;
                auVar139._16_16_ = ZEXT116(0) * auVar154._16_16_ + ZEXT116(1) * auVar185;
                auVar149._0_2_ = (undefined2)uVar17;
                auVar149._2_2_ = auVar149._0_2_;
                auVar149._4_2_ = auVar149._0_2_;
                auVar149._6_2_ = auVar149._0_2_;
                auVar149._8_2_ = auVar149._0_2_;
                auVar149._10_2_ = auVar149._0_2_;
                auVar149._12_2_ = auVar149._0_2_;
                auVar149._14_2_ = auVar149._0_2_;
                auVar185 = vpaddw_avx(auVar149,auVar277);
                auVar278 = vpslldq_avx(auVar185,2);
                auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar17),1);
                auVar185 = vpsrldq_avx(auVar185,0xe);
                auVar168._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar39;
                auVar168._16_16_ = ZEXT116(0) * auVar56._16_16_ + ZEXT116(1) * auVar185;
                auVar268._0_2_ = (undefined2)(uVar17 + 9);
                auVar268._2_2_ = auVar268._0_2_;
                auVar268._4_2_ = auVar268._0_2_;
                auVar268._6_2_ = auVar268._0_2_;
                auVar268._8_2_ = auVar268._0_2_;
                auVar268._10_2_ = auVar268._0_2_;
                auVar268._12_2_ = auVar268._0_2_;
                auVar268._14_2_ = auVar268._0_2_;
                auVar268._16_2_ = auVar268._0_2_;
                auVar268._18_2_ = auVar268._0_2_;
                auVar268._20_2_ = auVar268._0_2_;
                auVar268._22_2_ = auVar268._0_2_;
                auVar268._24_2_ = auVar268._0_2_;
                auVar268._26_2_ = auVar268._0_2_;
                auVar268._28_2_ = auVar268._0_2_;
                auVar268._30_2_ = auVar268._0_2_;
                auVar154 = vpblendw_avx2(auVar168,auVar268,2);
                auVar269._0_2_ = (undefined2)(uVar17 + 10);
                auVar269._2_2_ = auVar269._0_2_;
                auVar269._4_2_ = auVar269._0_2_;
                auVar269._6_2_ = auVar269._0_2_;
                auVar269._8_2_ = auVar269._0_2_;
                auVar269._10_2_ = auVar269._0_2_;
                auVar269._12_2_ = auVar269._0_2_;
                auVar269._14_2_ = auVar269._0_2_;
                auVar269._16_2_ = auVar269._0_2_;
                auVar269._18_2_ = auVar269._0_2_;
                auVar269._20_2_ = auVar269._0_2_;
                auVar269._22_2_ = auVar269._0_2_;
                auVar269._24_2_ = auVar269._0_2_;
                auVar269._26_2_ = auVar269._0_2_;
                auVar269._28_2_ = auVar269._0_2_;
                auVar269._30_2_ = auVar269._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar269,4);
                auVar270._0_2_ = (undefined2)(uVar17 + 0xb);
                auVar270._2_2_ = auVar270._0_2_;
                auVar270._4_2_ = auVar270._0_2_;
                auVar270._6_2_ = auVar270._0_2_;
                auVar270._8_2_ = auVar270._0_2_;
                auVar270._10_2_ = auVar270._0_2_;
                auVar270._12_2_ = auVar270._0_2_;
                auVar270._14_2_ = auVar270._0_2_;
                auVar270._16_2_ = auVar270._0_2_;
                auVar270._18_2_ = auVar270._0_2_;
                auVar270._20_2_ = auVar270._0_2_;
                auVar270._22_2_ = auVar270._0_2_;
                auVar270._24_2_ = auVar270._0_2_;
                auVar270._26_2_ = auVar270._0_2_;
                auVar270._28_2_ = auVar270._0_2_;
                auVar270._30_2_ = auVar270._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar270,8);
                auVar271._0_2_ = (undefined2)(uVar17 + 0xc);
                auVar271._2_2_ = auVar271._0_2_;
                auVar271._4_2_ = auVar271._0_2_;
                auVar271._6_2_ = auVar271._0_2_;
                auVar271._8_2_ = auVar271._0_2_;
                auVar271._10_2_ = auVar271._0_2_;
                auVar271._12_2_ = auVar271._0_2_;
                auVar271._14_2_ = auVar271._0_2_;
                auVar271._16_2_ = auVar271._0_2_;
                auVar271._18_2_ = auVar271._0_2_;
                auVar271._20_2_ = auVar271._0_2_;
                auVar271._22_2_ = auVar271._0_2_;
                auVar271._24_2_ = auVar271._0_2_;
                auVar271._26_2_ = auVar271._0_2_;
                auVar271._28_2_ = auVar271._0_2_;
                auVar271._30_2_ = auVar271._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar271,0x10);
                auVar272._0_2_ = (undefined2)(uVar17 + 0xd);
                auVar272._2_2_ = auVar272._0_2_;
                auVar272._4_2_ = auVar272._0_2_;
                auVar272._6_2_ = auVar272._0_2_;
                auVar272._8_2_ = auVar272._0_2_;
                auVar272._10_2_ = auVar272._0_2_;
                auVar272._12_2_ = auVar272._0_2_;
                auVar272._14_2_ = auVar272._0_2_;
                auVar272._16_2_ = auVar272._0_2_;
                auVar272._18_2_ = auVar272._0_2_;
                auVar272._20_2_ = auVar272._0_2_;
                auVar272._22_2_ = auVar272._0_2_;
                auVar272._24_2_ = auVar272._0_2_;
                auVar272._26_2_ = auVar272._0_2_;
                auVar272._28_2_ = auVar272._0_2_;
                auVar272._30_2_ = auVar272._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar272,0x20);
                auVar273._0_2_ = (undefined2)(uVar17 + 0xe);
                auVar273._2_2_ = auVar273._0_2_;
                auVar273._4_2_ = auVar273._0_2_;
                auVar273._6_2_ = auVar273._0_2_;
                auVar273._8_2_ = auVar273._0_2_;
                auVar273._10_2_ = auVar273._0_2_;
                auVar273._12_2_ = auVar273._0_2_;
                auVar273._14_2_ = auVar273._0_2_;
                auVar273._16_2_ = auVar273._0_2_;
                auVar273._18_2_ = auVar273._0_2_;
                auVar273._20_2_ = auVar273._0_2_;
                auVar273._22_2_ = auVar273._0_2_;
                auVar273._24_2_ = auVar273._0_2_;
                auVar273._26_2_ = auVar273._0_2_;
                auVar273._28_2_ = auVar273._0_2_;
                auVar273._30_2_ = auVar273._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar273,0x40);
                auVar274._0_2_ = (undefined2)(uVar17 + 0xf);
                auVar274._2_2_ = auVar274._0_2_;
                auVar274._4_2_ = auVar274._0_2_;
                auVar274._6_2_ = auVar274._0_2_;
                auVar274._8_2_ = auVar274._0_2_;
                auVar274._10_2_ = auVar274._0_2_;
                auVar274._12_2_ = auVar274._0_2_;
                auVar274._14_2_ = auVar274._0_2_;
                auVar274._16_2_ = auVar274._0_2_;
                auVar274._18_2_ = auVar274._0_2_;
                auVar274._20_2_ = auVar274._0_2_;
                auVar274._22_2_ = auVar274._0_2_;
                auVar274._24_2_ = auVar274._0_2_;
                auVar274._26_2_ = auVar274._0_2_;
                auVar274._28_2_ = auVar274._0_2_;
                auVar274._30_2_ = auVar274._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar274,0x80);
                auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
                auVar154 = vpcmpgtw_avx2(auVar154,auVar114);
                auVar154 = vpblendvb_avx2(auVar139,auVar56,auVar154);
                *(undefined1 (*) [32])(local_2060 + lVar19 * 0x20) = auVar154;
                uVar13 = uVar13 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [32])(local_2060 + lVar24) = auVar56;
                  lVar24 = lVar24 + 0x20;
                } while (lVar24 != 0x100);
              }
              if (0x16 < (int)uVar17) break;
              lVar19 = lVar19 + 1;
              lVar9 = lVar9 + 0x20;
            } while (lVar19 != 8);
          }
          auVar154 = vpunpcklwd_avx2(local_2060,local_2040);
          auVar155 = vpunpcklwd_avx2(local_2020,local_2000);
          auVar210 = vpunpcklwd_avx2(local_1fe0,local_1fc0);
          auVar381 = vpunpcklwd_avx2(local_1fa0,local_1f80);
          auVar42 = vpunpckldq_avx2(auVar154,auVar155);
          auVar73 = vpunpckldq_avx2(auVar210,auVar381);
          _local_2660 = vpunpcklqdq_avx2(auVar42,auVar73);
          local_2640 = vpunpckhqdq_avx2(auVar42,auVar73);
          auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
          auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
          local_2620 = vpunpcklqdq_avx2(auVar154,auVar155);
          local_2600 = vpunpckhqdq_avx2(auVar154,auVar155);
          auVar154 = vpunpckhwd_avx2(local_2060,local_2040);
          auVar155 = vpunpckhwd_avx2(local_2020,local_2000);
          auVar210 = vpunpckhwd_avx2(local_1fe0,local_1fc0);
          auVar381 = vpunpckhwd_avx2(local_1fa0,local_1f80);
          auVar42 = vpunpckldq_avx2(auVar154,auVar155);
          auVar73 = vpunpckldq_avx2(auVar210,auVar381);
          local_25e0 = vpunpcklqdq_avx2(auVar42,auVar73);
          local_25c0 = vpunpckhqdq_avx2(auVar42,auVar73);
          auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
          auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
          local_25a0 = vpunpcklqdq_avx2(auVar154,auVar155);
          local_2580 = vpunpckhqdq_avx2(auVar154,auVar155);
          lVar9 = 0;
          puVar10 = dst;
          do {
            uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
            *(undefined8 *)puVar10 = *(undefined8 *)(local_2660 + lVar9);
            *(undefined8 *)(puVar10 + 4) = uVar5;
            lVar9 = lVar9 + 0x20;
            puVar10 = puVar10 + stride;
          } while (lVar9 != 0x100);
          puVar10 = dst + stride * 8;
          lVar9 = 0;
          do {
            uVar5 = *(undefined8 *)(local_2640 + lVar9 + -8);
            *(undefined8 *)(puVar10 + 8) = *(undefined8 *)(local_2660 + lVar9 + 0x10);
            *(undefined8 *)(puVar10 + 0xc) = uVar5;
            lVar9 = lVar9 + 0x20;
            puVar10 = puVar10 + stride;
          } while (lVar9 != 0x100);
          return;
        default:
          return;
        case 3:
          uVar4 = left[0x2f];
          auVar37._2_2_ = uVar4;
          auVar37._0_2_ = uVar4;
          auVar37._4_2_ = uVar4;
          auVar37._6_2_ = uVar4;
          auVar37._8_2_ = uVar4;
          auVar37._10_2_ = uVar4;
          auVar37._12_2_ = uVar4;
          auVar37._14_2_ = uVar4;
          auVar54._16_2_ = uVar4;
          auVar54._0_16_ = auVar37;
          auVar54._18_2_ = uVar4;
          auVar54._20_2_ = uVar4;
          auVar54._22_2_ = uVar4;
          auVar54._24_2_ = uVar4;
          auVar54._26_2_ = uVar4;
          auVar54._28_2_ = uVar4;
          auVar54._30_2_ = uVar4;
          lVar9 = -0x200;
          uVar12 = 0;
          if (bd < 0xc) {
            auVar76._8_2_ = 0x10;
            auVar76._0_8_ = 0x10001000100010;
            auVar76._10_2_ = 0x10;
            auVar76._12_2_ = 0x10;
            auVar76._14_2_ = 0x10;
            auVar76._16_2_ = 0x10;
            auVar76._18_2_ = 0x10;
            auVar76._20_2_ = 0x10;
            auVar76._22_2_ = 0x10;
            auVar76._24_2_ = 0x10;
            auVar76._26_2_ = 0x10;
            auVar76._28_2_ = 0x10;
            auVar76._30_2_ = 0x10;
            auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar104._8_2_ = 0x2e;
            auVar104._0_8_ = 0x2e002e002e002e;
            auVar104._10_2_ = 0x2e;
            auVar104._12_2_ = 0x2e;
            auVar104._14_2_ = 0x2e;
            auVar104._16_2_ = 0x2e;
            auVar104._18_2_ = 0x2e;
            auVar104._20_2_ = 0x2e;
            auVar104._22_2_ = 0x2e;
            auVar104._24_2_ = 0x2e;
            auVar104._26_2_ = 0x2e;
            auVar104._28_2_ = 0x2e;
            auVar104._30_2_ = 0x2e;
            uVar13 = dy;
            do {
              iVar14 = (int)uVar13 >> 6;
              lVar19 = lVar9;
              if (iVar14 < 0x2f) {
                uVar6 = (ushort)(uVar13 >> 1);
                uVar116 = uVar6 & 0x1f;
                auVar125._0_8_ =
                     CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
                auVar125._8_2_ = uVar116;
                auVar125._10_2_ = uVar116;
                auVar125._12_2_ = uVar116;
                auVar125._14_2_ = uVar116;
                auVar125._16_2_ = uVar116;
                auVar125._18_2_ = uVar116;
                auVar125._20_2_ = uVar116;
                auVar125._22_2_ = uVar116;
                auVar125._24_2_ = uVar116;
                auVar125._26_2_ = uVar116;
                auVar125._28_2_ = uVar116;
                auVar125._30_2_ = uVar116;
                lVar19 = (long)iVar14;
                lVar24 = 0;
                do {
                  auVar154 = auVar54;
                  if (lVar19 + lVar24 < 0x2f) {
                    auVar154 = vpsubw_avx2(*(undefined1 (*) [32])(left + lVar19 + lVar24 + 1),
                                           *(undefined1 (*) [32])(left + lVar19 + lVar24));
                    auVar155 = vpmullw_avx2(auVar154,auVar125);
                    auVar154 = vpsllw_avx2(*(undefined1 (*) [32])(left + lVar19 + lVar24),5);
                    auVar154 = vpaddw_avx2(auVar154,auVar76);
                    auVar154 = vpaddw_avx2(auVar155,auVar154);
                    auVar155 = vpsrlw_avx2(auVar154,5);
                    iVar23 = (int)lVar24;
                    auVar172._0_2_ = (undefined2)(iVar14 + iVar23);
                    auVar172._2_2_ = auVar172._0_2_;
                    auVar172._4_2_ = auVar172._0_2_;
                    auVar172._6_2_ = auVar172._0_2_;
                    auVar172._8_2_ = auVar172._0_2_;
                    auVar172._10_2_ = auVar172._0_2_;
                    auVar172._12_2_ = auVar172._0_2_;
                    auVar172._14_2_ = auVar172._0_2_;
                    auVar185 = vpaddw_avx(auVar172,auVar277);
                    auVar278 = vpslldq_avx(auVar185,2);
                    auVar278 = vpblendw_avx(auVar278,ZEXT416((uint)(iVar14 + iVar23)),1);
                    auVar185 = vpsrldq_avx(auVar185,0xe);
                    auVar228._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar37;
                    auVar228._16_16_ = ZEXT116(0) * auVar54._16_16_ + ZEXT116(1) * auVar185;
                    auVar297._0_2_ = (undefined2)(iVar14 + 9 + iVar23);
                    auVar297._2_2_ = auVar297._0_2_;
                    auVar297._4_2_ = auVar297._0_2_;
                    auVar297._6_2_ = auVar297._0_2_;
                    auVar297._8_2_ = auVar297._0_2_;
                    auVar297._10_2_ = auVar297._0_2_;
                    auVar297._12_2_ = auVar297._0_2_;
                    auVar297._14_2_ = auVar297._0_2_;
                    auVar297._16_2_ = auVar297._0_2_;
                    auVar297._18_2_ = auVar297._0_2_;
                    auVar297._20_2_ = auVar297._0_2_;
                    auVar297._22_2_ = auVar297._0_2_;
                    auVar297._24_2_ = auVar297._0_2_;
                    auVar297._26_2_ = auVar297._0_2_;
                    auVar297._28_2_ = auVar297._0_2_;
                    auVar297._30_2_ = auVar297._0_2_;
                    auVar154 = vpblendw_avx2(auVar228,auVar297,2);
                    auVar298._0_2_ = (undefined2)(iVar14 + 10 + iVar23);
                    auVar298._2_2_ = auVar298._0_2_;
                    auVar298._4_2_ = auVar298._0_2_;
                    auVar298._6_2_ = auVar298._0_2_;
                    auVar298._8_2_ = auVar298._0_2_;
                    auVar298._10_2_ = auVar298._0_2_;
                    auVar298._12_2_ = auVar298._0_2_;
                    auVar298._14_2_ = auVar298._0_2_;
                    auVar298._16_2_ = auVar298._0_2_;
                    auVar298._18_2_ = auVar298._0_2_;
                    auVar298._20_2_ = auVar298._0_2_;
                    auVar298._22_2_ = auVar298._0_2_;
                    auVar298._24_2_ = auVar298._0_2_;
                    auVar298._26_2_ = auVar298._0_2_;
                    auVar298._28_2_ = auVar298._0_2_;
                    auVar298._30_2_ = auVar298._0_2_;
                    auVar154 = vpblendw_avx2(auVar154,auVar298,4);
                    auVar299._0_2_ = (undefined2)(iVar14 + 0xb + iVar23);
                    auVar299._2_2_ = auVar299._0_2_;
                    auVar299._4_2_ = auVar299._0_2_;
                    auVar299._6_2_ = auVar299._0_2_;
                    auVar299._8_2_ = auVar299._0_2_;
                    auVar299._10_2_ = auVar299._0_2_;
                    auVar299._12_2_ = auVar299._0_2_;
                    auVar299._14_2_ = auVar299._0_2_;
                    auVar299._16_2_ = auVar299._0_2_;
                    auVar299._18_2_ = auVar299._0_2_;
                    auVar299._20_2_ = auVar299._0_2_;
                    auVar299._22_2_ = auVar299._0_2_;
                    auVar299._24_2_ = auVar299._0_2_;
                    auVar299._26_2_ = auVar299._0_2_;
                    auVar299._28_2_ = auVar299._0_2_;
                    auVar299._30_2_ = auVar299._0_2_;
                    auVar154 = vpblendw_avx2(auVar154,auVar299,8);
                    auVar300._0_2_ = (undefined2)(iVar14 + 0xc + iVar23);
                    auVar300._2_2_ = auVar300._0_2_;
                    auVar300._4_2_ = auVar300._0_2_;
                    auVar300._6_2_ = auVar300._0_2_;
                    auVar300._8_2_ = auVar300._0_2_;
                    auVar300._10_2_ = auVar300._0_2_;
                    auVar300._12_2_ = auVar300._0_2_;
                    auVar300._14_2_ = auVar300._0_2_;
                    auVar300._16_2_ = auVar300._0_2_;
                    auVar300._18_2_ = auVar300._0_2_;
                    auVar300._20_2_ = auVar300._0_2_;
                    auVar300._22_2_ = auVar300._0_2_;
                    auVar300._24_2_ = auVar300._0_2_;
                    auVar300._26_2_ = auVar300._0_2_;
                    auVar300._28_2_ = auVar300._0_2_;
                    auVar300._30_2_ = auVar300._0_2_;
                    auVar154 = vpblendw_avx2(auVar154,auVar300,0x10);
                    auVar301._0_2_ = (undefined2)(iVar14 + 0xd + iVar23);
                    auVar301._2_2_ = auVar301._0_2_;
                    auVar301._4_2_ = auVar301._0_2_;
                    auVar301._6_2_ = auVar301._0_2_;
                    auVar301._8_2_ = auVar301._0_2_;
                    auVar301._10_2_ = auVar301._0_2_;
                    auVar301._12_2_ = auVar301._0_2_;
                    auVar301._14_2_ = auVar301._0_2_;
                    auVar301._16_2_ = auVar301._0_2_;
                    auVar301._18_2_ = auVar301._0_2_;
                    auVar301._20_2_ = auVar301._0_2_;
                    auVar301._22_2_ = auVar301._0_2_;
                    auVar301._24_2_ = auVar301._0_2_;
                    auVar301._26_2_ = auVar301._0_2_;
                    auVar301._28_2_ = auVar301._0_2_;
                    auVar301._30_2_ = auVar301._0_2_;
                    auVar154 = vpblendw_avx2(auVar154,auVar301,0x20);
                    auVar302._0_2_ = (undefined2)(iVar14 + 0xe + iVar23);
                    auVar302._2_2_ = auVar302._0_2_;
                    auVar302._4_2_ = auVar302._0_2_;
                    auVar302._6_2_ = auVar302._0_2_;
                    auVar302._8_2_ = auVar302._0_2_;
                    auVar302._10_2_ = auVar302._0_2_;
                    auVar302._12_2_ = auVar302._0_2_;
                    auVar302._14_2_ = auVar302._0_2_;
                    auVar302._16_2_ = auVar302._0_2_;
                    auVar302._18_2_ = auVar302._0_2_;
                    auVar302._20_2_ = auVar302._0_2_;
                    auVar302._22_2_ = auVar302._0_2_;
                    auVar302._24_2_ = auVar302._0_2_;
                    auVar302._26_2_ = auVar302._0_2_;
                    auVar302._28_2_ = auVar302._0_2_;
                    auVar302._30_2_ = auVar302._0_2_;
                    auVar154 = vpblendw_avx2(auVar154,auVar302,0x40);
                    auVar303._0_2_ = (undefined2)(iVar14 + 0xf + iVar23);
                    auVar303._2_2_ = auVar303._0_2_;
                    auVar303._4_2_ = auVar303._0_2_;
                    auVar303._6_2_ = auVar303._0_2_;
                    auVar303._8_2_ = auVar303._0_2_;
                    auVar303._10_2_ = auVar303._0_2_;
                    auVar303._12_2_ = auVar303._0_2_;
                    auVar303._14_2_ = auVar303._0_2_;
                    auVar303._16_2_ = auVar303._0_2_;
                    auVar303._18_2_ = auVar303._0_2_;
                    auVar303._20_2_ = auVar303._0_2_;
                    auVar303._22_2_ = auVar303._0_2_;
                    auVar303._24_2_ = auVar303._0_2_;
                    auVar303._26_2_ = auVar303._0_2_;
                    auVar303._28_2_ = auVar303._0_2_;
                    auVar303._30_2_ = auVar303._0_2_;
                    auVar154 = vpblendw_avx2(auVar154,auVar303,0x80);
                    auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
                    auVar154 = vpcmpgtw_avx2(auVar154,auVar104);
                    auVar154 = vpblendvb_avx2(auVar155,auVar54,auVar154);
                  }
                  uVar20 = uVar12 | 0x10;
                  if (lVar24 == 0) {
                    uVar20 = uVar12;
                  }
                  *(undefined1 (*) [32])(local_2060 + uVar20 * 0x20) = auVar154;
                  lVar24 = lVar24 + 0x10;
                } while (lVar24 == 0x10);
                uVar13 = uVar13 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [32])(local_1e60 + lVar19) = auVar54;
                  *(undefined1 (*) [32])(local_1c60 + lVar19) = auVar54;
                  lVar19 = lVar19 + 0x20;
                } while (lVar19 != 0);
              }
              if (0x2e < iVar14) break;
              uVar12 = uVar12 + 1;
              lVar9 = lVar9 + 0x20;
            } while (uVar12 != 0x10);
          }
          else {
            auVar83._8_4_ = 0x10;
            auVar83._0_8_ = 0x1000000010;
            auVar83._12_4_ = 0x10;
            auVar83._16_4_ = 0x10;
            auVar83._20_4_ = 0x10;
            auVar83._24_4_ = 0x10;
            auVar83._28_4_ = 0x10;
            auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar111._8_2_ = 0x2e;
            auVar111._0_8_ = 0x2e002e002e002e;
            auVar111._10_2_ = 0x2e;
            auVar111._12_2_ = 0x2e;
            auVar111._14_2_ = 0x2e;
            auVar111._16_2_ = 0x2e;
            auVar111._18_2_ = 0x2e;
            auVar111._20_2_ = 0x2e;
            auVar111._22_2_ = 0x2e;
            auVar111._24_2_ = 0x2e;
            auVar111._26_2_ = 0x2e;
            auVar111._28_2_ = 0x2e;
            auVar111._30_2_ = 0x2e;
            uVar13 = dy;
            do {
              iVar14 = (int)uVar13 >> 6;
              lVar19 = lVar9;
              if (iVar14 < 0x2f) {
                uVar17 = uVar13 >> 1;
                uVar18 = uVar17 & 0x1f801f;
                auVar134._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f801f001f801f;
                auVar134._8_4_ = uVar18;
                auVar134._12_4_ = uVar18;
                auVar134._16_4_ = uVar18;
                auVar134._20_4_ = uVar18;
                auVar134._24_4_ = uVar18;
                auVar134._28_4_ = uVar18;
                lVar19 = (long)iVar14;
                lVar24 = 0;
                do {
                  auVar154 = auVar54;
                  if (lVar19 + lVar24 < 0x2f) {
                    auVar185 = auVar37;
                    if (lVar19 + lVar24 < 0x27) {
                      auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24 + 8));
                      auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24 + 9));
                      auVar155 = vpsubd_avx2(auVar155,auVar154);
                      auVar154 = vpslld_avx2(auVar154,5);
                      auVar155 = vpmulld_avx2(auVar155,auVar134);
                      auVar154 = vpaddd_avx2(auVar154,auVar83);
                      auVar154 = vpaddd_avx2(auVar155,auVar154);
                      auVar154 = vpsrld_avx2(auVar154,5);
                      auVar180._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar154._16_16_;
                      auVar180._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar37;
                      auVar154 = vpackusdw_avx2(auVar154,auVar180);
                      auVar185 = auVar154._0_16_;
                    }
                    auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24));
                    auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24 + 1));
                    auVar155 = vpsubd_avx2(auVar155,auVar154);
                    auVar154 = vpslld_avx2(auVar154,5);
                    auVar155 = vpmulld_avx2(auVar155,auVar134);
                    auVar154 = vpaddd_avx2(auVar154,auVar83);
                    auVar154 = vpaddd_avx2(auVar155,auVar154);
                    auVar154 = vpsrld_avx2(auVar154,5);
                    auVar154 = vpackusdw_avx2(auVar154,ZEXT1632(auVar154._16_16_));
                    iVar23 = (int)lVar24;
                    auVar190._0_2_ = (undefined2)(iVar14 + iVar23);
                    auVar190._2_2_ = auVar190._0_2_;
                    auVar190._4_2_ = auVar190._0_2_;
                    auVar190._6_2_ = auVar190._0_2_;
                    auVar190._8_2_ = auVar190._0_2_;
                    auVar190._10_2_ = auVar190._0_2_;
                    auVar190._12_2_ = auVar190._0_2_;
                    auVar190._14_2_ = auVar190._0_2_;
                    auVar278 = vpaddw_avx(auVar190,auVar277);
                    auVar310 = vpslldq_avx(auVar278,2);
                    auVar310 = vpblendw_avx(auVar310,ZEXT416((uint)(iVar14 + iVar23)),1);
                    auVar278 = vpsrldq_avx(auVar278,0xe);
                    auVar306._0_16_ = ZEXT116(0) * auVar278 + ZEXT116(1) * auVar37;
                    auVar306._16_16_ = ZEXT116(0) * auVar54._16_16_ + ZEXT116(1) * auVar278;
                    auVar341._0_2_ = (undefined2)(iVar14 + 9 + iVar23);
                    auVar341._2_2_ = auVar341._0_2_;
                    auVar341._4_2_ = auVar341._0_2_;
                    auVar341._6_2_ = auVar341._0_2_;
                    auVar341._8_2_ = auVar341._0_2_;
                    auVar341._10_2_ = auVar341._0_2_;
                    auVar341._12_2_ = auVar341._0_2_;
                    auVar341._14_2_ = auVar341._0_2_;
                    auVar341._16_2_ = auVar341._0_2_;
                    auVar341._18_2_ = auVar341._0_2_;
                    auVar341._20_2_ = auVar341._0_2_;
                    auVar341._22_2_ = auVar341._0_2_;
                    auVar341._24_2_ = auVar341._0_2_;
                    auVar341._26_2_ = auVar341._0_2_;
                    auVar341._28_2_ = auVar341._0_2_;
                    auVar341._30_2_ = auVar341._0_2_;
                    auVar155 = vpblendw_avx2(auVar306,auVar341,2);
                    auVar342._0_2_ = (undefined2)(iVar14 + 10 + iVar23);
                    auVar342._2_2_ = auVar342._0_2_;
                    auVar342._4_2_ = auVar342._0_2_;
                    auVar342._6_2_ = auVar342._0_2_;
                    auVar342._8_2_ = auVar342._0_2_;
                    auVar342._10_2_ = auVar342._0_2_;
                    auVar342._12_2_ = auVar342._0_2_;
                    auVar342._14_2_ = auVar342._0_2_;
                    auVar342._16_2_ = auVar342._0_2_;
                    auVar342._18_2_ = auVar342._0_2_;
                    auVar342._20_2_ = auVar342._0_2_;
                    auVar342._22_2_ = auVar342._0_2_;
                    auVar342._24_2_ = auVar342._0_2_;
                    auVar342._26_2_ = auVar342._0_2_;
                    auVar342._28_2_ = auVar342._0_2_;
                    auVar342._30_2_ = auVar342._0_2_;
                    auVar155 = vpblendw_avx2(auVar155,auVar342,4);
                    auVar343._0_2_ = (undefined2)(iVar14 + 0xb + iVar23);
                    auVar343._2_2_ = auVar343._0_2_;
                    auVar343._4_2_ = auVar343._0_2_;
                    auVar343._6_2_ = auVar343._0_2_;
                    auVar343._8_2_ = auVar343._0_2_;
                    auVar343._10_2_ = auVar343._0_2_;
                    auVar343._12_2_ = auVar343._0_2_;
                    auVar343._14_2_ = auVar343._0_2_;
                    auVar343._16_2_ = auVar343._0_2_;
                    auVar343._18_2_ = auVar343._0_2_;
                    auVar343._20_2_ = auVar343._0_2_;
                    auVar343._22_2_ = auVar343._0_2_;
                    auVar343._24_2_ = auVar343._0_2_;
                    auVar343._26_2_ = auVar343._0_2_;
                    auVar343._28_2_ = auVar343._0_2_;
                    auVar343._30_2_ = auVar343._0_2_;
                    auVar155 = vpblendw_avx2(auVar155,auVar343,8);
                    auVar344._0_2_ = (undefined2)(iVar14 + 0xc + iVar23);
                    auVar344._2_2_ = auVar344._0_2_;
                    auVar344._4_2_ = auVar344._0_2_;
                    auVar344._6_2_ = auVar344._0_2_;
                    auVar344._8_2_ = auVar344._0_2_;
                    auVar344._10_2_ = auVar344._0_2_;
                    auVar344._12_2_ = auVar344._0_2_;
                    auVar344._14_2_ = auVar344._0_2_;
                    auVar344._16_2_ = auVar344._0_2_;
                    auVar344._18_2_ = auVar344._0_2_;
                    auVar344._20_2_ = auVar344._0_2_;
                    auVar344._22_2_ = auVar344._0_2_;
                    auVar344._24_2_ = auVar344._0_2_;
                    auVar344._26_2_ = auVar344._0_2_;
                    auVar344._28_2_ = auVar344._0_2_;
                    auVar344._30_2_ = auVar344._0_2_;
                    auVar155 = vpblendw_avx2(auVar155,auVar344,0x10);
                    auVar345._0_2_ = (undefined2)(iVar14 + 0xd + iVar23);
                    auVar345._2_2_ = auVar345._0_2_;
                    auVar345._4_2_ = auVar345._0_2_;
                    auVar345._6_2_ = auVar345._0_2_;
                    auVar345._8_2_ = auVar345._0_2_;
                    auVar345._10_2_ = auVar345._0_2_;
                    auVar345._12_2_ = auVar345._0_2_;
                    auVar345._14_2_ = auVar345._0_2_;
                    auVar345._16_2_ = auVar345._0_2_;
                    auVar345._18_2_ = auVar345._0_2_;
                    auVar345._20_2_ = auVar345._0_2_;
                    auVar345._22_2_ = auVar345._0_2_;
                    auVar345._24_2_ = auVar345._0_2_;
                    auVar345._26_2_ = auVar345._0_2_;
                    auVar345._28_2_ = auVar345._0_2_;
                    auVar345._30_2_ = auVar345._0_2_;
                    auVar155 = vpblendw_avx2(auVar155,auVar345,0x20);
                    auVar346._0_2_ = (undefined2)(iVar14 + 0xe + iVar23);
                    auVar346._2_2_ = auVar346._0_2_;
                    auVar346._4_2_ = auVar346._0_2_;
                    auVar346._6_2_ = auVar346._0_2_;
                    auVar346._8_2_ = auVar346._0_2_;
                    auVar346._10_2_ = auVar346._0_2_;
                    auVar346._12_2_ = auVar346._0_2_;
                    auVar346._14_2_ = auVar346._0_2_;
                    auVar346._16_2_ = auVar346._0_2_;
                    auVar346._18_2_ = auVar346._0_2_;
                    auVar346._20_2_ = auVar346._0_2_;
                    auVar346._22_2_ = auVar346._0_2_;
                    auVar346._24_2_ = auVar346._0_2_;
                    auVar346._26_2_ = auVar346._0_2_;
                    auVar346._28_2_ = auVar346._0_2_;
                    auVar346._30_2_ = auVar346._0_2_;
                    auVar155 = vpblendw_avx2(auVar155,auVar346,0x40);
                    auVar347._0_2_ = (undefined2)(iVar14 + 0xf + iVar23);
                    auVar347._2_2_ = auVar347._0_2_;
                    auVar347._4_2_ = auVar347._0_2_;
                    auVar347._6_2_ = auVar347._0_2_;
                    auVar347._8_2_ = auVar347._0_2_;
                    auVar347._10_2_ = auVar347._0_2_;
                    auVar347._12_2_ = auVar347._0_2_;
                    auVar347._14_2_ = auVar347._0_2_;
                    auVar347._16_2_ = auVar347._0_2_;
                    auVar347._18_2_ = auVar347._0_2_;
                    auVar347._20_2_ = auVar347._0_2_;
                    auVar347._22_2_ = auVar347._0_2_;
                    auVar347._24_2_ = auVar347._0_2_;
                    auVar347._26_2_ = auVar347._0_2_;
                    auVar347._28_2_ = auVar347._0_2_;
                    auVar347._30_2_ = auVar347._0_2_;
                    auVar155 = vpblendw_avx2(auVar155,auVar347,0x80);
                    auVar155 = vpblendd_avx2(ZEXT1632(auVar310),auVar155,0xf0);
                    auVar155 = vpcmpgtw_avx2(auVar155,auVar111);
                    auVar166._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar154._0_16_;
                    auVar166._16_16_ = ZEXT116(0) * auVar154._16_16_ + ZEXT116(1) * auVar185;
                    auVar154 = vpblendvb_avx2(auVar166,auVar54,auVar155);
                  }
                  uVar20 = uVar12 | 0x10;
                  if (lVar24 == 0) {
                    uVar20 = uVar12;
                  }
                  *(undefined1 (*) [32])(local_2060 + uVar20 * 0x20) = auVar154;
                  lVar24 = lVar24 + 0x10;
                } while (lVar24 == 0x10);
                uVar13 = uVar13 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [32])(local_1e60 + lVar19) = auVar54;
                  *(undefined1 (*) [32])(local_1c60 + lVar19) = auVar54;
                  lVar19 = lVar19 + 0x20;
                } while (lVar19 != 0);
              }
              if (0x2e < iVar14) break;
              uVar12 = uVar12 + 1;
              lVar9 = lVar9 + 0x20;
            } while (uVar12 != 0x10);
          }
          uVar12 = 0xfffffffffffffff8;
          lVar9 = 0xe0;
          do {
            auVar155 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_2140 + lVar9),
                                       *(undefined1 (*) [32])(auStack_2120 + lVar9));
            auVar210 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_2100 + lVar9),
                                       *(undefined1 (*) [32])(auStack_20e0 + lVar9));
            auVar381 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_20c0 + lVar9),
                                       *(undefined1 (*) [32])(auStack_20a0 + lVar9));
            auVar42 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_2080 + lVar9),
                                      *(undefined1 (*) [32])(local_2060 + lVar9));
            auVar154 = vpunpckldq_avx2(auVar155,auVar210);
            auVar73 = vpunpckldq_avx2(auVar381,auVar42);
            auVar101 = vpunpcklqdq_avx2(auVar154,auVar73);
            *(undefined1 (*) [32])(auStackY_2740 + lVar9) = auVar101;
            auVar154 = vpunpckhqdq_avx2(auVar154,auVar73);
            *(undefined1 (*) [32])(auStackY_2720 + lVar9) = auVar154;
            auVar154 = vpunpckhdq_avx2(auVar155,auVar210);
            auVar155 = vpunpckhdq_avx2(auVar381,auVar42);
            auVar210 = vpunpcklqdq_avx2(auVar154,auVar155);
            *(undefined1 (*) [32])(auStackY_2700 + lVar9) = auVar210;
            auVar154 = vpunpckhqdq_avx2(auVar154,auVar155);
            *(undefined1 (*) [32])((long)auStackY_26e0 + lVar9) = auVar154;
            auVar154 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_2140 + lVar9),
                                       *(undefined1 (*) [32])(auStack_2120 + lVar9));
            auVar155 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_2100 + lVar9),
                                       *(undefined1 (*) [32])(auStack_20e0 + lVar9));
            auVar210 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_20c0 + lVar9),
                                       *(undefined1 (*) [32])(auStack_20a0 + lVar9));
            auVar381 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_2080 + lVar9),
                                       *(undefined1 (*) [32])(local_2060 + lVar9));
            auVar42 = vpunpckldq_avx2(auVar154,auVar155);
            auVar73 = vpunpckldq_avx2(auVar210,auVar381);
            auVar101 = vpunpcklqdq_avx2(auVar42,auVar73);
            *(undefined1 (*) [32])(auStackY_26c0 + lVar9) = auVar101;
            auVar42 = vpunpckhqdq_avx2(auVar42,auVar73);
            *(undefined1 (*) [32])(auStackY_26a0 + lVar9) = auVar42;
            auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
            auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
            auVar210 = vpunpcklqdq_avx2(auVar154,auVar155);
            *(undefined1 (*) [32])(local_2660 + lVar9 + -0x20) = auVar210;
            auVar154 = vpunpckhqdq_avx2(auVar154,auVar155);
            *(undefined1 (*) [32])(local_2660 + lVar9) = auVar154;
            uVar12 = uVar12 + 8;
            lVar9 = lVar9 + 0x100;
          } while (uVar12 < 0x18);
          puVar10 = dst + 8;
          pauVar25 = (undefined1 (*) [32])(dst + stride * 8);
          puVar15 = local_2660;
          lVar9 = 0;
          do {
            lVar19 = 0;
            puVar21 = dst;
            do {
              uVar5 = *(undefined8 *)((long)(puVar15 + lVar19) + 8);
              *(undefined8 *)puVar21 = *(undefined8 *)(puVar15 + lVar19);
              *(undefined8 *)(puVar21 + 4) = uVar5;
              lVar19 = lVar19 + 0x20;
              puVar21 = puVar21 + stride;
            } while (lVar19 != 0x100);
            lVar19 = 0x100;
            puVar21 = puVar10;
            do {
              uVar5 = *(undefined8 *)((long)(puVar15 + lVar19) + 8);
              *(undefined8 *)puVar21 = *(undefined8 *)(puVar15 + lVar19);
              *(undefined8 *)(puVar21 + 4) = uVar5;
              lVar19 = lVar19 + 0x20;
              puVar21 = puVar21 + stride;
            } while (lVar19 != 0x200);
            lVar19 = 0x100;
            pauVar22 = pauVar25;
            do {
              auVar154 = vpblendd_avx2(ZEXT1632(*(undefined1 (*) [16])(puVar15 + lVar19 + -0xf0)),
                                       *(undefined1 (*) [32])(puVar15 + lVar19),0xf0);
              *pauVar22 = auVar154;
              lVar19 = lVar19 + 0x20;
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + stride * 2);
            } while (lVar19 != 0x200);
            puVar15 = puVar15 + 0x200;
            dst = dst + stride * 0x10;
            puVar10 = puVar10 + stride * 0x10;
            pauVar25 = pauVar25 + stride;
            bVar26 = lVar9 == 0;
            lVar9 = lVar9 + 0x10;
          } while (bVar26);
          return;
        case 7:
          if (bd < 0xc) {
            uStackY_2688 = 0x997713;
            highbd_dr_prediction_z1_64xN_avx2(0x20,(uint16_t *)local_2060,0x40,left,dy,iVar14);
          }
          else {
            uStackY_2688 = 0x9999b3;
            highbd_dr_prediction_32bit_z1_64xN_avx2(0x20,(uint16_t *)local_2060,0x40,left,dy,iVar14)
            ;
          }
          iVar14 = 0x20;
        }
      }
      else {
        if (bw != 0x10) {
          if (bw == 8) {
            uVar4 = left[0x27];
            auVar34._2_2_ = uVar4;
            auVar34._0_2_ = uVar4;
            auVar34._4_2_ = uVar4;
            auVar34._6_2_ = uVar4;
            auVar34._8_2_ = uVar4;
            auVar34._10_2_ = uVar4;
            auVar34._12_2_ = uVar4;
            auVar34._14_2_ = uVar4;
            auVar51._16_2_ = uVar4;
            auVar51._0_16_ = auVar34;
            auVar51._18_2_ = uVar4;
            auVar51._20_2_ = uVar4;
            auVar51._22_2_ = uVar4;
            auVar51._24_2_ = uVar4;
            auVar51._26_2_ = uVar4;
            auVar51._28_2_ = uVar4;
            auVar51._30_2_ = uVar4;
            lVar9 = -0x100;
            uVar12 = 0;
            if (bd < 0xc) {
              auVar74._8_2_ = 0x10;
              auVar74._0_8_ = 0x10001000100010;
              auVar74._10_2_ = 0x10;
              auVar74._12_2_ = 0x10;
              auVar74._14_2_ = 0x10;
              auVar74._16_2_ = 0x10;
              auVar74._18_2_ = 0x10;
              auVar74._20_2_ = 0x10;
              auVar74._22_2_ = 0x10;
              auVar74._24_2_ = 0x10;
              auVar74._26_2_ = 0x10;
              auVar74._28_2_ = 0x10;
              auVar74._30_2_ = 0x10;
              auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
              auVar102._8_2_ = 0x26;
              auVar102._0_8_ = 0x26002600260026;
              auVar102._10_2_ = 0x26;
              auVar102._12_2_ = 0x26;
              auVar102._14_2_ = 0x26;
              auVar102._16_2_ = 0x26;
              auVar102._18_2_ = 0x26;
              auVar102._20_2_ = 0x26;
              auVar102._22_2_ = 0x26;
              auVar102._24_2_ = 0x26;
              auVar102._26_2_ = 0x26;
              auVar102._28_2_ = 0x26;
              auVar102._30_2_ = 0x26;
              uVar13 = dy;
              do {
                iVar14 = (int)uVar13 >> 6;
                lVar19 = lVar9;
                if (iVar14 < 0x27) {
                  uVar6 = (ushort)(uVar13 >> 1);
                  uVar116 = uVar6 & 0x1f;
                  auVar123._0_8_ =
                       CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
                  auVar123._8_2_ = uVar116;
                  auVar123._10_2_ = uVar116;
                  auVar123._12_2_ = uVar116;
                  auVar123._14_2_ = uVar116;
                  auVar123._16_2_ = uVar116;
                  auVar123._18_2_ = uVar116;
                  auVar123._20_2_ = uVar116;
                  auVar123._22_2_ = uVar116;
                  auVar123._24_2_ = uVar116;
                  auVar123._26_2_ = uVar116;
                  auVar123._28_2_ = uVar116;
                  auVar123._30_2_ = uVar116;
                  lVar19 = (long)iVar14;
                  lVar24 = 0;
                  do {
                    auVar154 = auVar51;
                    if (lVar19 + lVar24 < 0x27) {
                      auVar154 = vpsubw_avx2(*(undefined1 (*) [32])(left + lVar19 + lVar24 + 1),
                                             *(undefined1 (*) [32])(left + lVar19 + lVar24));
                      auVar155 = vpmullw_avx2(auVar154,auVar123);
                      auVar154 = vpsllw_avx2(*(undefined1 (*) [32])(left + lVar19 + lVar24),5);
                      auVar154 = vpaddw_avx2(auVar154,auVar74);
                      auVar154 = vpaddw_avx2(auVar155,auVar154);
                      auVar155 = vpsrlw_avx2(auVar154,5);
                      iVar23 = (int)lVar24;
                      auVar171._0_2_ = (undefined2)(iVar14 + iVar23);
                      auVar171._2_2_ = auVar171._0_2_;
                      auVar171._4_2_ = auVar171._0_2_;
                      auVar171._6_2_ = auVar171._0_2_;
                      auVar171._8_2_ = auVar171._0_2_;
                      auVar171._10_2_ = auVar171._0_2_;
                      auVar171._12_2_ = auVar171._0_2_;
                      auVar171._14_2_ = auVar171._0_2_;
                      auVar185 = vpaddw_avx(auVar171,auVar277);
                      auVar278 = vpslldq_avx(auVar185,2);
                      auVar278 = vpblendw_avx(auVar278,ZEXT416((uint)(iVar14 + iVar23)),1);
                      auVar185 = vpsrldq_avx(auVar185,0xe);
                      auVar220._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar34;
                      auVar220._16_16_ = ZEXT116(0) * auVar51._16_16_ + ZEXT116(1) * auVar185;
                      auVar290._0_2_ = (undefined2)(iVar14 + 9 + iVar23);
                      auVar290._2_2_ = auVar290._0_2_;
                      auVar290._4_2_ = auVar290._0_2_;
                      auVar290._6_2_ = auVar290._0_2_;
                      auVar290._8_2_ = auVar290._0_2_;
                      auVar290._10_2_ = auVar290._0_2_;
                      auVar290._12_2_ = auVar290._0_2_;
                      auVar290._14_2_ = auVar290._0_2_;
                      auVar290._16_2_ = auVar290._0_2_;
                      auVar290._18_2_ = auVar290._0_2_;
                      auVar290._20_2_ = auVar290._0_2_;
                      auVar290._22_2_ = auVar290._0_2_;
                      auVar290._24_2_ = auVar290._0_2_;
                      auVar290._26_2_ = auVar290._0_2_;
                      auVar290._28_2_ = auVar290._0_2_;
                      auVar290._30_2_ = auVar290._0_2_;
                      auVar154 = vpblendw_avx2(auVar220,auVar290,2);
                      auVar291._0_2_ = (undefined2)(iVar14 + 10 + iVar23);
                      auVar291._2_2_ = auVar291._0_2_;
                      auVar291._4_2_ = auVar291._0_2_;
                      auVar291._6_2_ = auVar291._0_2_;
                      auVar291._8_2_ = auVar291._0_2_;
                      auVar291._10_2_ = auVar291._0_2_;
                      auVar291._12_2_ = auVar291._0_2_;
                      auVar291._14_2_ = auVar291._0_2_;
                      auVar291._16_2_ = auVar291._0_2_;
                      auVar291._18_2_ = auVar291._0_2_;
                      auVar291._20_2_ = auVar291._0_2_;
                      auVar291._22_2_ = auVar291._0_2_;
                      auVar291._24_2_ = auVar291._0_2_;
                      auVar291._26_2_ = auVar291._0_2_;
                      auVar291._28_2_ = auVar291._0_2_;
                      auVar291._30_2_ = auVar291._0_2_;
                      auVar154 = vpblendw_avx2(auVar154,auVar291,4);
                      auVar292._0_2_ = (undefined2)(iVar14 + 0xb + iVar23);
                      auVar292._2_2_ = auVar292._0_2_;
                      auVar292._4_2_ = auVar292._0_2_;
                      auVar292._6_2_ = auVar292._0_2_;
                      auVar292._8_2_ = auVar292._0_2_;
                      auVar292._10_2_ = auVar292._0_2_;
                      auVar292._12_2_ = auVar292._0_2_;
                      auVar292._14_2_ = auVar292._0_2_;
                      auVar292._16_2_ = auVar292._0_2_;
                      auVar292._18_2_ = auVar292._0_2_;
                      auVar292._20_2_ = auVar292._0_2_;
                      auVar292._22_2_ = auVar292._0_2_;
                      auVar292._24_2_ = auVar292._0_2_;
                      auVar292._26_2_ = auVar292._0_2_;
                      auVar292._28_2_ = auVar292._0_2_;
                      auVar292._30_2_ = auVar292._0_2_;
                      auVar154 = vpblendw_avx2(auVar154,auVar292,8);
                      auVar293._0_2_ = (undefined2)(iVar14 + 0xc + iVar23);
                      auVar293._2_2_ = auVar293._0_2_;
                      auVar293._4_2_ = auVar293._0_2_;
                      auVar293._6_2_ = auVar293._0_2_;
                      auVar293._8_2_ = auVar293._0_2_;
                      auVar293._10_2_ = auVar293._0_2_;
                      auVar293._12_2_ = auVar293._0_2_;
                      auVar293._14_2_ = auVar293._0_2_;
                      auVar293._16_2_ = auVar293._0_2_;
                      auVar293._18_2_ = auVar293._0_2_;
                      auVar293._20_2_ = auVar293._0_2_;
                      auVar293._22_2_ = auVar293._0_2_;
                      auVar293._24_2_ = auVar293._0_2_;
                      auVar293._26_2_ = auVar293._0_2_;
                      auVar293._28_2_ = auVar293._0_2_;
                      auVar293._30_2_ = auVar293._0_2_;
                      auVar154 = vpblendw_avx2(auVar154,auVar293,0x10);
                      auVar294._0_2_ = (undefined2)(iVar14 + 0xd + iVar23);
                      auVar294._2_2_ = auVar294._0_2_;
                      auVar294._4_2_ = auVar294._0_2_;
                      auVar294._6_2_ = auVar294._0_2_;
                      auVar294._8_2_ = auVar294._0_2_;
                      auVar294._10_2_ = auVar294._0_2_;
                      auVar294._12_2_ = auVar294._0_2_;
                      auVar294._14_2_ = auVar294._0_2_;
                      auVar294._16_2_ = auVar294._0_2_;
                      auVar294._18_2_ = auVar294._0_2_;
                      auVar294._20_2_ = auVar294._0_2_;
                      auVar294._22_2_ = auVar294._0_2_;
                      auVar294._24_2_ = auVar294._0_2_;
                      auVar294._26_2_ = auVar294._0_2_;
                      auVar294._28_2_ = auVar294._0_2_;
                      auVar294._30_2_ = auVar294._0_2_;
                      auVar154 = vpblendw_avx2(auVar154,auVar294,0x20);
                      auVar295._0_2_ = (undefined2)(iVar14 + 0xe + iVar23);
                      auVar295._2_2_ = auVar295._0_2_;
                      auVar295._4_2_ = auVar295._0_2_;
                      auVar295._6_2_ = auVar295._0_2_;
                      auVar295._8_2_ = auVar295._0_2_;
                      auVar295._10_2_ = auVar295._0_2_;
                      auVar295._12_2_ = auVar295._0_2_;
                      auVar295._14_2_ = auVar295._0_2_;
                      auVar295._16_2_ = auVar295._0_2_;
                      auVar295._18_2_ = auVar295._0_2_;
                      auVar295._20_2_ = auVar295._0_2_;
                      auVar295._22_2_ = auVar295._0_2_;
                      auVar295._24_2_ = auVar295._0_2_;
                      auVar295._26_2_ = auVar295._0_2_;
                      auVar295._28_2_ = auVar295._0_2_;
                      auVar295._30_2_ = auVar295._0_2_;
                      auVar154 = vpblendw_avx2(auVar154,auVar295,0x40);
                      auVar296._0_2_ = (undefined2)(iVar14 + 0xf + iVar23);
                      auVar296._2_2_ = auVar296._0_2_;
                      auVar296._4_2_ = auVar296._0_2_;
                      auVar296._6_2_ = auVar296._0_2_;
                      auVar296._8_2_ = auVar296._0_2_;
                      auVar296._10_2_ = auVar296._0_2_;
                      auVar296._12_2_ = auVar296._0_2_;
                      auVar296._14_2_ = auVar296._0_2_;
                      auVar296._16_2_ = auVar296._0_2_;
                      auVar296._18_2_ = auVar296._0_2_;
                      auVar296._20_2_ = auVar296._0_2_;
                      auVar296._22_2_ = auVar296._0_2_;
                      auVar296._24_2_ = auVar296._0_2_;
                      auVar296._26_2_ = auVar296._0_2_;
                      auVar296._28_2_ = auVar296._0_2_;
                      auVar296._30_2_ = auVar296._0_2_;
                      auVar154 = vpblendw_avx2(auVar154,auVar296,0x80);
                      auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
                      auVar154 = vpcmpgtw_avx2(auVar154,auVar102);
                      auVar154 = vpblendvb_avx2(auVar155,auVar51,auVar154);
                    }
                    uVar20 = uVar12 | 8;
                    if (lVar24 == 0) {
                      uVar20 = uVar12;
                    }
                    *(undefined1 (*) [32])(local_2060 + uVar20 * 0x20) = auVar154;
                    lVar24 = lVar24 + 0x10;
                  } while (lVar24 == 0x10);
                  uVar13 = uVar13 + dy;
                }
                else {
                  do {
                    *(undefined1 (*) [32])(local_1f60 + lVar19) = auVar51;
                    *(undefined1 (*) [32])(local_1e60 + lVar19) = auVar51;
                    lVar19 = lVar19 + 0x20;
                  } while (lVar19 != 0);
                }
                if (0x26 < iVar14) break;
                uVar12 = uVar12 + 1;
                lVar9 = lVar9 + 0x20;
              } while (uVar12 != 8);
            }
            else {
              auVar79._8_4_ = 0x10;
              auVar79._0_8_ = 0x1000000010;
              auVar79._12_4_ = 0x10;
              auVar79._16_4_ = 0x10;
              auVar79._20_4_ = 0x10;
              auVar79._24_4_ = 0x10;
              auVar79._28_4_ = 0x10;
              auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
              auVar107._8_2_ = 0x26;
              auVar107._0_8_ = 0x26002600260026;
              auVar107._10_2_ = 0x26;
              auVar107._12_2_ = 0x26;
              auVar107._14_2_ = 0x26;
              auVar107._16_2_ = 0x26;
              auVar107._18_2_ = 0x26;
              auVar107._20_2_ = 0x26;
              auVar107._22_2_ = 0x26;
              auVar107._24_2_ = 0x26;
              auVar107._26_2_ = 0x26;
              auVar107._28_2_ = 0x26;
              auVar107._30_2_ = 0x26;
              uVar13 = dy;
              do {
                iVar14 = (int)uVar13 >> 6;
                lVar19 = lVar9;
                if (iVar14 < 0x27) {
                  uVar17 = uVar13 >> 1;
                  uVar18 = uVar17 & 0x1f801f;
                  auVar128._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f801f001f801f;
                  auVar128._8_4_ = uVar18;
                  auVar128._12_4_ = uVar18;
                  auVar128._16_4_ = uVar18;
                  auVar128._20_4_ = uVar18;
                  auVar128._24_4_ = uVar18;
                  auVar128._28_4_ = uVar18;
                  lVar19 = (long)iVar14;
                  lVar24 = 0;
                  do {
                    auVar154 = auVar51;
                    if (lVar19 + lVar24 < 0x27) {
                      auVar185 = auVar34;
                      if (lVar19 + lVar24 < 0x1f) {
                        auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24 + 8)
                                                 );
                        auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24 + 9)
                                                 );
                        auVar155 = vpsubd_avx2(auVar155,auVar154);
                        auVar154 = vpslld_avx2(auVar154,5);
                        auVar155 = vpmulld_avx2(auVar155,auVar128);
                        auVar154 = vpaddd_avx2(auVar154,auVar79);
                        auVar154 = vpaddd_avx2(auVar155,auVar154);
                        auVar154 = vpsrld_avx2(auVar154,5);
                        auVar176._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar154._16_16_;
                        auVar176._16_16_ =
                             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar34;
                        auVar154 = vpackusdw_avx2(auVar154,auVar176);
                        auVar185 = auVar154._0_16_;
                      }
                      auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24));
                      auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + lVar19 + lVar24 + 1));
                      auVar155 = vpsubd_avx2(auVar155,auVar154);
                      auVar154 = vpslld_avx2(auVar154,5);
                      auVar155 = vpmulld_avx2(auVar155,auVar128);
                      auVar154 = vpaddd_avx2(auVar154,auVar79);
                      auVar154 = vpaddd_avx2(auVar155,auVar154);
                      auVar154 = vpsrld_avx2(auVar154,5);
                      auVar154 = vpackusdw_avx2(auVar154,ZEXT1632(auVar154._16_16_));
                      iVar23 = (int)lVar24;
                      auVar188._0_2_ = (undefined2)(iVar14 + iVar23);
                      auVar188._2_2_ = auVar188._0_2_;
                      auVar188._4_2_ = auVar188._0_2_;
                      auVar188._6_2_ = auVar188._0_2_;
                      auVar188._8_2_ = auVar188._0_2_;
                      auVar188._10_2_ = auVar188._0_2_;
                      auVar188._12_2_ = auVar188._0_2_;
                      auVar188._14_2_ = auVar188._0_2_;
                      auVar278 = vpaddw_avx(auVar188,auVar277);
                      auVar310 = vpslldq_avx(auVar278,2);
                      auVar310 = vpblendw_avx(auVar310,ZEXT416((uint)(iVar14 + iVar23)),1);
                      auVar278 = vpsrldq_avx(auVar278,0xe);
                      auVar304._0_16_ = ZEXT116(0) * auVar278 + ZEXT116(1) * auVar34;
                      auVar304._16_16_ = ZEXT116(0) * auVar51._16_16_ + ZEXT116(1) * auVar278;
                      auVar331._0_2_ = (undefined2)(iVar14 + 9 + iVar23);
                      auVar331._2_2_ = auVar331._0_2_;
                      auVar331._4_2_ = auVar331._0_2_;
                      auVar331._6_2_ = auVar331._0_2_;
                      auVar331._8_2_ = auVar331._0_2_;
                      auVar331._10_2_ = auVar331._0_2_;
                      auVar331._12_2_ = auVar331._0_2_;
                      auVar331._14_2_ = auVar331._0_2_;
                      auVar331._16_2_ = auVar331._0_2_;
                      auVar331._18_2_ = auVar331._0_2_;
                      auVar331._20_2_ = auVar331._0_2_;
                      auVar331._22_2_ = auVar331._0_2_;
                      auVar331._24_2_ = auVar331._0_2_;
                      auVar331._26_2_ = auVar331._0_2_;
                      auVar331._28_2_ = auVar331._0_2_;
                      auVar331._30_2_ = auVar331._0_2_;
                      auVar155 = vpblendw_avx2(auVar304,auVar331,2);
                      auVar332._0_2_ = (undefined2)(iVar14 + 10 + iVar23);
                      auVar332._2_2_ = auVar332._0_2_;
                      auVar332._4_2_ = auVar332._0_2_;
                      auVar332._6_2_ = auVar332._0_2_;
                      auVar332._8_2_ = auVar332._0_2_;
                      auVar332._10_2_ = auVar332._0_2_;
                      auVar332._12_2_ = auVar332._0_2_;
                      auVar332._14_2_ = auVar332._0_2_;
                      auVar332._16_2_ = auVar332._0_2_;
                      auVar332._18_2_ = auVar332._0_2_;
                      auVar332._20_2_ = auVar332._0_2_;
                      auVar332._22_2_ = auVar332._0_2_;
                      auVar332._24_2_ = auVar332._0_2_;
                      auVar332._26_2_ = auVar332._0_2_;
                      auVar332._28_2_ = auVar332._0_2_;
                      auVar332._30_2_ = auVar332._0_2_;
                      auVar155 = vpblendw_avx2(auVar155,auVar332,4);
                      auVar333._0_2_ = (undefined2)(iVar14 + 0xb + iVar23);
                      auVar333._2_2_ = auVar333._0_2_;
                      auVar333._4_2_ = auVar333._0_2_;
                      auVar333._6_2_ = auVar333._0_2_;
                      auVar333._8_2_ = auVar333._0_2_;
                      auVar333._10_2_ = auVar333._0_2_;
                      auVar333._12_2_ = auVar333._0_2_;
                      auVar333._14_2_ = auVar333._0_2_;
                      auVar333._16_2_ = auVar333._0_2_;
                      auVar333._18_2_ = auVar333._0_2_;
                      auVar333._20_2_ = auVar333._0_2_;
                      auVar333._22_2_ = auVar333._0_2_;
                      auVar333._24_2_ = auVar333._0_2_;
                      auVar333._26_2_ = auVar333._0_2_;
                      auVar333._28_2_ = auVar333._0_2_;
                      auVar333._30_2_ = auVar333._0_2_;
                      auVar155 = vpblendw_avx2(auVar155,auVar333,8);
                      auVar334._0_2_ = (undefined2)(iVar14 + 0xc + iVar23);
                      auVar334._2_2_ = auVar334._0_2_;
                      auVar334._4_2_ = auVar334._0_2_;
                      auVar334._6_2_ = auVar334._0_2_;
                      auVar334._8_2_ = auVar334._0_2_;
                      auVar334._10_2_ = auVar334._0_2_;
                      auVar334._12_2_ = auVar334._0_2_;
                      auVar334._14_2_ = auVar334._0_2_;
                      auVar334._16_2_ = auVar334._0_2_;
                      auVar334._18_2_ = auVar334._0_2_;
                      auVar334._20_2_ = auVar334._0_2_;
                      auVar334._22_2_ = auVar334._0_2_;
                      auVar334._24_2_ = auVar334._0_2_;
                      auVar334._26_2_ = auVar334._0_2_;
                      auVar334._28_2_ = auVar334._0_2_;
                      auVar334._30_2_ = auVar334._0_2_;
                      auVar155 = vpblendw_avx2(auVar155,auVar334,0x10);
                      auVar335._0_2_ = (undefined2)(iVar14 + 0xd + iVar23);
                      auVar335._2_2_ = auVar335._0_2_;
                      auVar335._4_2_ = auVar335._0_2_;
                      auVar335._6_2_ = auVar335._0_2_;
                      auVar335._8_2_ = auVar335._0_2_;
                      auVar335._10_2_ = auVar335._0_2_;
                      auVar335._12_2_ = auVar335._0_2_;
                      auVar335._14_2_ = auVar335._0_2_;
                      auVar335._16_2_ = auVar335._0_2_;
                      auVar335._18_2_ = auVar335._0_2_;
                      auVar335._20_2_ = auVar335._0_2_;
                      auVar335._22_2_ = auVar335._0_2_;
                      auVar335._24_2_ = auVar335._0_2_;
                      auVar335._26_2_ = auVar335._0_2_;
                      auVar335._28_2_ = auVar335._0_2_;
                      auVar335._30_2_ = auVar335._0_2_;
                      auVar155 = vpblendw_avx2(auVar155,auVar335,0x20);
                      auVar336._0_2_ = (undefined2)(iVar14 + 0xe + iVar23);
                      auVar336._2_2_ = auVar336._0_2_;
                      auVar336._4_2_ = auVar336._0_2_;
                      auVar336._6_2_ = auVar336._0_2_;
                      auVar336._8_2_ = auVar336._0_2_;
                      auVar336._10_2_ = auVar336._0_2_;
                      auVar336._12_2_ = auVar336._0_2_;
                      auVar336._14_2_ = auVar336._0_2_;
                      auVar336._16_2_ = auVar336._0_2_;
                      auVar336._18_2_ = auVar336._0_2_;
                      auVar336._20_2_ = auVar336._0_2_;
                      auVar336._22_2_ = auVar336._0_2_;
                      auVar336._24_2_ = auVar336._0_2_;
                      auVar336._26_2_ = auVar336._0_2_;
                      auVar336._28_2_ = auVar336._0_2_;
                      auVar336._30_2_ = auVar336._0_2_;
                      auVar155 = vpblendw_avx2(auVar155,auVar336,0x40);
                      auVar337._0_2_ = (undefined2)(iVar14 + 0xf + iVar23);
                      auVar337._2_2_ = auVar337._0_2_;
                      auVar337._4_2_ = auVar337._0_2_;
                      auVar337._6_2_ = auVar337._0_2_;
                      auVar337._8_2_ = auVar337._0_2_;
                      auVar337._10_2_ = auVar337._0_2_;
                      auVar337._12_2_ = auVar337._0_2_;
                      auVar337._14_2_ = auVar337._0_2_;
                      auVar337._16_2_ = auVar337._0_2_;
                      auVar337._18_2_ = auVar337._0_2_;
                      auVar337._20_2_ = auVar337._0_2_;
                      auVar337._22_2_ = auVar337._0_2_;
                      auVar337._24_2_ = auVar337._0_2_;
                      auVar337._26_2_ = auVar337._0_2_;
                      auVar337._28_2_ = auVar337._0_2_;
                      auVar337._30_2_ = auVar337._0_2_;
                      auVar155 = vpblendw_avx2(auVar155,auVar337,0x80);
                      auVar155 = vpblendd_avx2(ZEXT1632(auVar310),auVar155,0xf0);
                      auVar155 = vpcmpgtw_avx2(auVar155,auVar107);
                      auVar163._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar154._0_16_;
                      auVar163._16_16_ = ZEXT116(0) * auVar154._16_16_ + ZEXT116(1) * auVar185;
                      auVar154 = vpblendvb_avx2(auVar163,auVar51,auVar155);
                    }
                    uVar20 = uVar12 | 8;
                    if (lVar24 == 0) {
                      uVar20 = uVar12;
                    }
                    *(undefined1 (*) [32])(local_2060 + uVar20 * 0x20) = auVar154;
                    lVar24 = lVar24 + 0x10;
                  } while (lVar24 == 0x10);
                  uVar13 = uVar13 + dy;
                }
                else {
                  do {
                    *(undefined1 (*) [32])(local_1f60 + lVar19) = auVar51;
                    *(undefined1 (*) [32])(local_1e60 + lVar19) = auVar51;
                    lVar19 = lVar19 + 0x20;
                  } while (lVar19 != 0);
                }
                if (0x26 < iVar14) break;
                uVar12 = uVar12 + 1;
                lVar9 = lVar9 + 0x20;
              } while (uVar12 != 8);
            }
            lVar9 = 0xe0;
            do {
              auVar155 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_2140 + lVar9),
                                         *(undefined1 (*) [32])(auStack_2120 + lVar9));
              auVar210 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_2100 + lVar9),
                                         *(undefined1 (*) [32])(auStack_20e0 + lVar9));
              auVar381 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_20c0 + lVar9),
                                         *(undefined1 (*) [32])(auStack_20a0 + lVar9));
              auVar42 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_2080 + lVar9),
                                        *(undefined1 (*) [32])(local_2060 + lVar9));
              auVar154 = vpunpckldq_avx2(auVar155,auVar210);
              auVar73 = vpunpckldq_avx2(auVar381,auVar42);
              auVar101 = vpunpcklqdq_avx2(auVar154,auVar73);
              *(undefined1 (*) [32])(auStackY_2740 + lVar9) = auVar101;
              auVar154 = vpunpckhqdq_avx2(auVar154,auVar73);
              *(undefined1 (*) [32])(auStackY_2720 + lVar9) = auVar154;
              auVar154 = vpunpckhdq_avx2(auVar155,auVar210);
              auVar155 = vpunpckhdq_avx2(auVar381,auVar42);
              auVar210 = vpunpcklqdq_avx2(auVar154,auVar155);
              *(undefined1 (*) [32])(auStackY_2700 + lVar9) = auVar210;
              auVar154 = vpunpckhqdq_avx2(auVar154,auVar155);
              *(undefined1 (*) [32])((long)auStackY_26e0 + lVar9) = auVar154;
              auVar154 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_2140 + lVar9),
                                         *(undefined1 (*) [32])(auStack_2120 + lVar9));
              auVar155 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_2100 + lVar9),
                                         *(undefined1 (*) [32])(auStack_20e0 + lVar9));
              auVar210 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_20c0 + lVar9),
                                         *(undefined1 (*) [32])(auStack_20a0 + lVar9));
              auVar381 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_2080 + lVar9),
                                         *(undefined1 (*) [32])(local_2060 + lVar9));
              auVar42 = vpunpckldq_avx2(auVar154,auVar155);
              auVar73 = vpunpckldq_avx2(auVar210,auVar381);
              auVar101 = vpunpcklqdq_avx2(auVar42,auVar73);
              *(undefined1 (*) [32])(auStackY_26c0 + lVar9) = auVar101;
              auVar42 = vpunpckhqdq_avx2(auVar42,auVar73);
              *(undefined1 (*) [32])(auStackY_26a0 + lVar9) = auVar42;
              auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
              auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
              auVar210 = vpunpcklqdq_avx2(auVar154,auVar155);
              *(undefined1 (*) [32])(local_2660 + lVar9 + -0x20) = auVar210;
              auVar154 = vpunpckhqdq_avx2(auVar154,auVar155);
              *(undefined1 (*) [32])(local_2660 + lVar9) = auVar154;
              lVar9 = lVar9 + 0x100;
            } while (lVar9 == 0x1e0);
            lVar9 = 0;
            puVar10 = dst;
            do {
              uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
              *(undefined8 *)puVar10 = *(undefined8 *)(local_2660 + lVar9);
              *(undefined8 *)(puVar10 + 4) = uVar5;
              lVar9 = lVar9 + 0x20;
              puVar10 = puVar10 + stride;
            } while (lVar9 != 0x100);
            puVar10 = dst + stride * 8;
            lVar9 = 0;
            do {
              uVar5 = *(undefined8 *)(local_2640 + lVar9 + -8);
              *(undefined8 *)(puVar10 + 8) = *(undefined8 *)(local_2660 + lVar9 + 0x10);
              *(undefined8 *)(puVar10 + 0xc) = uVar5;
              puVar10 = puVar10 + stride;
              lVar9 = lVar9 + 0x20;
            } while (lVar9 != 0x100);
            puVar10 = dst + stride * 0x10;
            lVar9 = 0x100;
            do {
              uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
              *(undefined8 *)puVar10 = *(undefined8 *)(local_2660 + lVar9);
              *(undefined8 *)(puVar10 + 4) = uVar5;
              lVar9 = lVar9 + 0x20;
              puVar10 = puVar10 + stride;
            } while (lVar9 != 0x200);
            puVar10 = dst + stride * 0x18;
            lVar9 = 0x100;
            do {
              uVar5 = *(undefined8 *)(local_2640 + lVar9 + -8);
              *(undefined8 *)(puVar10 + 8) = *(undefined8 *)(local_2660 + lVar9 + 0x10);
              *(undefined8 *)(puVar10 + 0xc) = uVar5;
              puVar10 = puVar10 + stride;
              lVar9 = lVar9 + 0x20;
            } while (lVar9 != 0x200);
            return;
          }
          if (bw != 4) {
            return;
          }
          uVar4 = left[0x13];
          auVar30._2_2_ = uVar4;
          auVar30._0_2_ = uVar4;
          auVar30._4_2_ = uVar4;
          auVar30._6_2_ = uVar4;
          auVar30._8_2_ = uVar4;
          auVar30._10_2_ = uVar4;
          auVar30._12_2_ = uVar4;
          auVar30._14_2_ = uVar4;
          auVar43._16_2_ = uVar4;
          auVar43._0_16_ = auVar30;
          auVar43._18_2_ = uVar4;
          auVar43._20_2_ = uVar4;
          auVar43._22_2_ = uVar4;
          auVar43._24_2_ = uVar4;
          auVar43._26_2_ = uVar4;
          auVar43._28_2_ = uVar4;
          auVar43._30_2_ = uVar4;
          lVar9 = 0;
          if (bd < 0xc) {
            auVar68._8_2_ = 0x10;
            auVar68._0_8_ = 0x10001000100010;
            auVar68._10_2_ = 0x10;
            auVar68._12_2_ = 0x10;
            auVar68._14_2_ = 0x10;
            auVar68._16_2_ = 0x10;
            auVar68._18_2_ = 0x10;
            auVar68._20_2_ = 0x10;
            auVar68._22_2_ = 0x10;
            auVar68._24_2_ = 0x10;
            auVar68._26_2_ = 0x10;
            auVar68._28_2_ = 0x10;
            auVar68._30_2_ = 0x10;
            auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar96._8_2_ = 0x12;
            auVar96._0_8_ = 0x12001200120012;
            auVar96._10_2_ = 0x12;
            auVar96._12_2_ = 0x12;
            auVar96._14_2_ = 0x12;
            auVar96._16_2_ = 0x12;
            auVar96._18_2_ = 0x12;
            auVar96._20_2_ = 0x12;
            auVar96._22_2_ = 0x12;
            auVar96._24_2_ = 0x12;
            auVar96._26_2_ = 0x12;
            auVar96._28_2_ = 0x12;
            auVar96._30_2_ = 0x12;
            lVar19 = 0;
            uVar13 = dy;
            do {
              uVar17 = (int)uVar13 >> 6;
              lVar24 = lVar9;
              if ((int)uVar17 < 0x13) {
                uVar6 = (ushort)(uVar13 >> 1);
                uVar116 = uVar6 & 0x1f;
                auVar117._0_8_ =
                     CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
                auVar117._8_2_ = uVar116;
                auVar117._10_2_ = uVar116;
                auVar117._12_2_ = uVar116;
                auVar117._14_2_ = uVar116;
                auVar117._16_2_ = uVar116;
                auVar117._18_2_ = uVar116;
                auVar117._20_2_ = uVar116;
                auVar117._22_2_ = uVar116;
                auVar117._24_2_ = uVar116;
                auVar117._26_2_ = uVar116;
                auVar117._28_2_ = uVar116;
                auVar117._30_2_ = uVar116;
                auVar154 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar17 + 1),
                                       *(undefined1 (*) [32])(left + (int)uVar17));
                auVar155 = vpmullw_avx2(auVar154,auVar117);
                auVar154 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar17),5);
                auVar154 = vpaddw_avx2(auVar154,auVar68);
                auVar154 = vpaddw_avx2(auVar155,auVar154);
                auVar155 = vpsrlw_avx2(auVar154,5);
                auVar140._0_2_ = (undefined2)uVar17;
                auVar140._2_2_ = auVar140._0_2_;
                auVar140._4_2_ = auVar140._0_2_;
                auVar140._6_2_ = auVar140._0_2_;
                auVar140._8_2_ = auVar140._0_2_;
                auVar140._10_2_ = auVar140._0_2_;
                auVar140._12_2_ = auVar140._0_2_;
                auVar140._14_2_ = auVar140._0_2_;
                auVar185 = vpaddw_avx(auVar140,auVar277);
                auVar278 = vpslldq_avx(auVar185,2);
                auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar17),1);
                auVar185 = vpsrldq_avx(auVar185,0xe);
                auVar152._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar30;
                auVar152._16_16_ = ZEXT116(0) * auVar43._16_16_ + ZEXT116(1) * auVar185;
                auVar194._0_2_ = (undefined2)(uVar17 + 9);
                auVar194._2_2_ = auVar194._0_2_;
                auVar194._4_2_ = auVar194._0_2_;
                auVar194._6_2_ = auVar194._0_2_;
                auVar194._8_2_ = auVar194._0_2_;
                auVar194._10_2_ = auVar194._0_2_;
                auVar194._12_2_ = auVar194._0_2_;
                auVar194._14_2_ = auVar194._0_2_;
                auVar194._16_2_ = auVar194._0_2_;
                auVar194._18_2_ = auVar194._0_2_;
                auVar194._20_2_ = auVar194._0_2_;
                auVar194._22_2_ = auVar194._0_2_;
                auVar194._24_2_ = auVar194._0_2_;
                auVar194._26_2_ = auVar194._0_2_;
                auVar194._28_2_ = auVar194._0_2_;
                auVar194._30_2_ = auVar194._0_2_;
                auVar154 = vpblendw_avx2(auVar152,auVar194,2);
                auVar195._0_2_ = (undefined2)(uVar17 + 10);
                auVar195._2_2_ = auVar195._0_2_;
                auVar195._4_2_ = auVar195._0_2_;
                auVar195._6_2_ = auVar195._0_2_;
                auVar195._8_2_ = auVar195._0_2_;
                auVar195._10_2_ = auVar195._0_2_;
                auVar195._12_2_ = auVar195._0_2_;
                auVar195._14_2_ = auVar195._0_2_;
                auVar195._16_2_ = auVar195._0_2_;
                auVar195._18_2_ = auVar195._0_2_;
                auVar195._20_2_ = auVar195._0_2_;
                auVar195._22_2_ = auVar195._0_2_;
                auVar195._24_2_ = auVar195._0_2_;
                auVar195._26_2_ = auVar195._0_2_;
                auVar195._28_2_ = auVar195._0_2_;
                auVar195._30_2_ = auVar195._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar195,4);
                auVar196._0_2_ = (undefined2)(uVar17 + 0xb);
                auVar196._2_2_ = auVar196._0_2_;
                auVar196._4_2_ = auVar196._0_2_;
                auVar196._6_2_ = auVar196._0_2_;
                auVar196._8_2_ = auVar196._0_2_;
                auVar196._10_2_ = auVar196._0_2_;
                auVar196._12_2_ = auVar196._0_2_;
                auVar196._14_2_ = auVar196._0_2_;
                auVar196._16_2_ = auVar196._0_2_;
                auVar196._18_2_ = auVar196._0_2_;
                auVar196._20_2_ = auVar196._0_2_;
                auVar196._22_2_ = auVar196._0_2_;
                auVar196._24_2_ = auVar196._0_2_;
                auVar196._26_2_ = auVar196._0_2_;
                auVar196._28_2_ = auVar196._0_2_;
                auVar196._30_2_ = auVar196._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar196,8);
                auVar197._0_2_ = (undefined2)(uVar17 + 0xc);
                auVar197._2_2_ = auVar197._0_2_;
                auVar197._4_2_ = auVar197._0_2_;
                auVar197._6_2_ = auVar197._0_2_;
                auVar197._8_2_ = auVar197._0_2_;
                auVar197._10_2_ = auVar197._0_2_;
                auVar197._12_2_ = auVar197._0_2_;
                auVar197._14_2_ = auVar197._0_2_;
                auVar197._16_2_ = auVar197._0_2_;
                auVar197._18_2_ = auVar197._0_2_;
                auVar197._20_2_ = auVar197._0_2_;
                auVar197._22_2_ = auVar197._0_2_;
                auVar197._24_2_ = auVar197._0_2_;
                auVar197._26_2_ = auVar197._0_2_;
                auVar197._28_2_ = auVar197._0_2_;
                auVar197._30_2_ = auVar197._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar197,0x10);
                auVar198._0_2_ = (undefined2)(uVar17 + 0xd);
                auVar198._2_2_ = auVar198._0_2_;
                auVar198._4_2_ = auVar198._0_2_;
                auVar198._6_2_ = auVar198._0_2_;
                auVar198._8_2_ = auVar198._0_2_;
                auVar198._10_2_ = auVar198._0_2_;
                auVar198._12_2_ = auVar198._0_2_;
                auVar198._14_2_ = auVar198._0_2_;
                auVar198._16_2_ = auVar198._0_2_;
                auVar198._18_2_ = auVar198._0_2_;
                auVar198._20_2_ = auVar198._0_2_;
                auVar198._22_2_ = auVar198._0_2_;
                auVar198._24_2_ = auVar198._0_2_;
                auVar198._26_2_ = auVar198._0_2_;
                auVar198._28_2_ = auVar198._0_2_;
                auVar198._30_2_ = auVar198._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar198,0x20);
                auVar199._0_2_ = (undefined2)(uVar17 + 0xe);
                auVar199._2_2_ = auVar199._0_2_;
                auVar199._4_2_ = auVar199._0_2_;
                auVar199._6_2_ = auVar199._0_2_;
                auVar199._8_2_ = auVar199._0_2_;
                auVar199._10_2_ = auVar199._0_2_;
                auVar199._12_2_ = auVar199._0_2_;
                auVar199._14_2_ = auVar199._0_2_;
                auVar199._16_2_ = auVar199._0_2_;
                auVar199._18_2_ = auVar199._0_2_;
                auVar199._20_2_ = auVar199._0_2_;
                auVar199._22_2_ = auVar199._0_2_;
                auVar199._24_2_ = auVar199._0_2_;
                auVar199._26_2_ = auVar199._0_2_;
                auVar199._28_2_ = auVar199._0_2_;
                auVar199._30_2_ = auVar199._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar199,0x40);
                auVar200._0_2_ = (undefined2)(uVar17 + 0xf);
                auVar200._2_2_ = auVar200._0_2_;
                auVar200._4_2_ = auVar200._0_2_;
                auVar200._6_2_ = auVar200._0_2_;
                auVar200._8_2_ = auVar200._0_2_;
                auVar200._10_2_ = auVar200._0_2_;
                auVar200._12_2_ = auVar200._0_2_;
                auVar200._14_2_ = auVar200._0_2_;
                auVar200._16_2_ = auVar200._0_2_;
                auVar200._18_2_ = auVar200._0_2_;
                auVar200._20_2_ = auVar200._0_2_;
                auVar200._22_2_ = auVar200._0_2_;
                auVar200._24_2_ = auVar200._0_2_;
                auVar200._26_2_ = auVar200._0_2_;
                auVar200._28_2_ = auVar200._0_2_;
                auVar200._30_2_ = auVar200._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar200,0x80);
                auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
                auVar154 = vpcmpgtw_avx2(auVar154,auVar96);
                auVar154 = vpblendvb_avx2(auVar155,auVar43,auVar154);
                *(undefined1 (*) [32])(local_2060 + lVar19 * 0x20) = auVar154;
                uVar13 = uVar13 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [32])(local_2060 + lVar24) = auVar43;
                  lVar24 = lVar24 + 0x20;
                } while (lVar24 != 0x80);
              }
              if (0x12 < (int)uVar17) break;
              lVar19 = lVar19 + 1;
              lVar9 = lVar9 + 0x20;
            } while (lVar19 != 4);
          }
          else {
            auVar82._8_4_ = 0x10;
            auVar82._0_8_ = 0x1000000010;
            auVar82._12_4_ = 0x10;
            auVar82._16_4_ = 0x10;
            auVar82._20_4_ = 0x10;
            auVar82._24_4_ = 0x10;
            auVar82._28_4_ = 0x10;
            auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar110._8_2_ = 0x12;
            auVar110._0_8_ = 0x12001200120012;
            auVar110._10_2_ = 0x12;
            auVar110._12_2_ = 0x12;
            auVar110._14_2_ = 0x12;
            auVar110._16_2_ = 0x12;
            auVar110._18_2_ = 0x12;
            auVar110._20_2_ = 0x12;
            auVar110._22_2_ = 0x12;
            auVar110._24_2_ = 0x12;
            auVar110._26_2_ = 0x12;
            auVar110._28_2_ = 0x12;
            auVar110._30_2_ = 0x12;
            lVar19 = 0;
            uVar13 = dy;
            do {
              uVar17 = (int)uVar13 >> 6;
              lVar24 = lVar9;
              if ((int)uVar17 < 0x13) {
                uVar18 = uVar13 >> 1;
                uVar16 = uVar18 & 0x1f;
                auVar131._0_8_ = CONCAT44(uVar18,uVar18) & 0x1f0000001f;
                auVar131._8_4_ = uVar16;
                auVar131._12_4_ = uVar16;
                auVar131._16_4_ = uVar16;
                auVar131._20_4_ = uVar16;
                auVar131._24_4_ = uVar16;
                auVar131._28_4_ = uVar16;
                auVar185 = auVar30;
                if ((int)uVar17 < 0xb) {
                  auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8));
                  auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 9));
                  auVar155 = vpsubd_avx2(auVar155,auVar154);
                  auVar154 = vpslld_avx2(auVar154,5);
                  auVar155 = vpmulld_avx2(auVar155,auVar131);
                  auVar154 = vpaddd_avx2(auVar154,auVar82);
                  auVar154 = vpaddd_avx2(auVar155,auVar154);
                  auVar154 = vpsrld_avx2(auVar154,5);
                  auVar179._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar154._16_16_;
                  auVar179._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
                  auVar154 = vpackusdw_avx2(auVar154,auVar179);
                  auVar185 = auVar154._0_16_;
                }
                auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar17));
                auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 1));
                auVar155 = vpsubd_avx2(auVar155,auVar154);
                auVar154 = vpslld_avx2(auVar154,5);
                auVar155 = vpmulld_avx2(auVar155,auVar131);
                auVar154 = vpaddd_avx2(auVar154,auVar82);
                auVar154 = vpaddd_avx2(auVar155,auVar154);
                auVar154 = vpsrld_avx2(auVar154,5);
                auVar154 = vpackusdw_avx2(auVar154,ZEXT1632(auVar154._16_16_));
                auVar132._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar154._0_16_;
                auVar132._16_16_ = ZEXT116(0) * auVar154._16_16_ + ZEXT116(1) * auVar185;
                auVar147._0_2_ = (undefined2)uVar17;
                auVar147._2_2_ = auVar147._0_2_;
                auVar147._4_2_ = auVar147._0_2_;
                auVar147._6_2_ = auVar147._0_2_;
                auVar147._8_2_ = auVar147._0_2_;
                auVar147._10_2_ = auVar147._0_2_;
                auVar147._12_2_ = auVar147._0_2_;
                auVar147._14_2_ = auVar147._0_2_;
                auVar185 = vpaddw_avx(auVar147,auVar277);
                auVar278 = vpslldq_avx(auVar185,2);
                auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar17),1);
                auVar185 = vpsrldq_avx(auVar185,0xe);
                auVar165._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar30;
                auVar165._16_16_ = ZEXT116(0) * auVar43._16_16_ + ZEXT116(1) * auVar185;
                auVar252._0_2_ = (undefined2)(uVar17 + 9);
                auVar252._2_2_ = auVar252._0_2_;
                auVar252._4_2_ = auVar252._0_2_;
                auVar252._6_2_ = auVar252._0_2_;
                auVar252._8_2_ = auVar252._0_2_;
                auVar252._10_2_ = auVar252._0_2_;
                auVar252._12_2_ = auVar252._0_2_;
                auVar252._14_2_ = auVar252._0_2_;
                auVar252._16_2_ = auVar252._0_2_;
                auVar252._18_2_ = auVar252._0_2_;
                auVar252._20_2_ = auVar252._0_2_;
                auVar252._22_2_ = auVar252._0_2_;
                auVar252._24_2_ = auVar252._0_2_;
                auVar252._26_2_ = auVar252._0_2_;
                auVar252._28_2_ = auVar252._0_2_;
                auVar252._30_2_ = auVar252._0_2_;
                auVar154 = vpblendw_avx2(auVar165,auVar252,2);
                auVar253._0_2_ = (undefined2)(uVar17 + 10);
                auVar253._2_2_ = auVar253._0_2_;
                auVar253._4_2_ = auVar253._0_2_;
                auVar253._6_2_ = auVar253._0_2_;
                auVar253._8_2_ = auVar253._0_2_;
                auVar253._10_2_ = auVar253._0_2_;
                auVar253._12_2_ = auVar253._0_2_;
                auVar253._14_2_ = auVar253._0_2_;
                auVar253._16_2_ = auVar253._0_2_;
                auVar253._18_2_ = auVar253._0_2_;
                auVar253._20_2_ = auVar253._0_2_;
                auVar253._22_2_ = auVar253._0_2_;
                auVar253._24_2_ = auVar253._0_2_;
                auVar253._26_2_ = auVar253._0_2_;
                auVar253._28_2_ = auVar253._0_2_;
                auVar253._30_2_ = auVar253._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar253,4);
                auVar254._0_2_ = (undefined2)(uVar17 + 0xb);
                auVar254._2_2_ = auVar254._0_2_;
                auVar254._4_2_ = auVar254._0_2_;
                auVar254._6_2_ = auVar254._0_2_;
                auVar254._8_2_ = auVar254._0_2_;
                auVar254._10_2_ = auVar254._0_2_;
                auVar254._12_2_ = auVar254._0_2_;
                auVar254._14_2_ = auVar254._0_2_;
                auVar254._16_2_ = auVar254._0_2_;
                auVar254._18_2_ = auVar254._0_2_;
                auVar254._20_2_ = auVar254._0_2_;
                auVar254._22_2_ = auVar254._0_2_;
                auVar254._24_2_ = auVar254._0_2_;
                auVar254._26_2_ = auVar254._0_2_;
                auVar254._28_2_ = auVar254._0_2_;
                auVar254._30_2_ = auVar254._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar254,8);
                auVar255._0_2_ = (undefined2)(uVar17 + 0xc);
                auVar255._2_2_ = auVar255._0_2_;
                auVar255._4_2_ = auVar255._0_2_;
                auVar255._6_2_ = auVar255._0_2_;
                auVar255._8_2_ = auVar255._0_2_;
                auVar255._10_2_ = auVar255._0_2_;
                auVar255._12_2_ = auVar255._0_2_;
                auVar255._14_2_ = auVar255._0_2_;
                auVar255._16_2_ = auVar255._0_2_;
                auVar255._18_2_ = auVar255._0_2_;
                auVar255._20_2_ = auVar255._0_2_;
                auVar255._22_2_ = auVar255._0_2_;
                auVar255._24_2_ = auVar255._0_2_;
                auVar255._26_2_ = auVar255._0_2_;
                auVar255._28_2_ = auVar255._0_2_;
                auVar255._30_2_ = auVar255._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar255,0x10);
                auVar256._0_2_ = (undefined2)(uVar17 + 0xd);
                auVar256._2_2_ = auVar256._0_2_;
                auVar256._4_2_ = auVar256._0_2_;
                auVar256._6_2_ = auVar256._0_2_;
                auVar256._8_2_ = auVar256._0_2_;
                auVar256._10_2_ = auVar256._0_2_;
                auVar256._12_2_ = auVar256._0_2_;
                auVar256._14_2_ = auVar256._0_2_;
                auVar256._16_2_ = auVar256._0_2_;
                auVar256._18_2_ = auVar256._0_2_;
                auVar256._20_2_ = auVar256._0_2_;
                auVar256._22_2_ = auVar256._0_2_;
                auVar256._24_2_ = auVar256._0_2_;
                auVar256._26_2_ = auVar256._0_2_;
                auVar256._28_2_ = auVar256._0_2_;
                auVar256._30_2_ = auVar256._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar256,0x20);
                auVar257._0_2_ = (undefined2)(uVar17 + 0xe);
                auVar257._2_2_ = auVar257._0_2_;
                auVar257._4_2_ = auVar257._0_2_;
                auVar257._6_2_ = auVar257._0_2_;
                auVar257._8_2_ = auVar257._0_2_;
                auVar257._10_2_ = auVar257._0_2_;
                auVar257._12_2_ = auVar257._0_2_;
                auVar257._14_2_ = auVar257._0_2_;
                auVar257._16_2_ = auVar257._0_2_;
                auVar257._18_2_ = auVar257._0_2_;
                auVar257._20_2_ = auVar257._0_2_;
                auVar257._22_2_ = auVar257._0_2_;
                auVar257._24_2_ = auVar257._0_2_;
                auVar257._26_2_ = auVar257._0_2_;
                auVar257._28_2_ = auVar257._0_2_;
                auVar257._30_2_ = auVar257._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar257,0x40);
                auVar258._0_2_ = (undefined2)(uVar17 + 0xf);
                auVar258._2_2_ = auVar258._0_2_;
                auVar258._4_2_ = auVar258._0_2_;
                auVar258._6_2_ = auVar258._0_2_;
                auVar258._8_2_ = auVar258._0_2_;
                auVar258._10_2_ = auVar258._0_2_;
                auVar258._12_2_ = auVar258._0_2_;
                auVar258._14_2_ = auVar258._0_2_;
                auVar258._16_2_ = auVar258._0_2_;
                auVar258._18_2_ = auVar258._0_2_;
                auVar258._20_2_ = auVar258._0_2_;
                auVar258._22_2_ = auVar258._0_2_;
                auVar258._24_2_ = auVar258._0_2_;
                auVar258._26_2_ = auVar258._0_2_;
                auVar258._28_2_ = auVar258._0_2_;
                auVar258._30_2_ = auVar258._0_2_;
                auVar154 = vpblendw_avx2(auVar154,auVar258,0x80);
                auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
                auVar154 = vpcmpgtw_avx2(auVar154,auVar110);
                auVar154 = vpblendvb_avx2(auVar132,auVar43,auVar154);
                *(undefined1 (*) [32])(local_2060 + lVar19 * 0x20) = auVar154;
                uVar13 = uVar13 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [32])(local_2060 + lVar24) = auVar43;
                  lVar24 = lVar24 + 0x20;
                } while (lVar24 != 0x80);
              }
              if (0x12 < (int)uVar17) break;
              lVar19 = lVar19 + 1;
              lVar9 = lVar9 + 0x20;
            } while (lVar19 != 4);
          }
          auVar210 = vpunpcklwd_avx2(local_2060,local_2040);
          auVar381 = vpunpcklwd_avx2(local_2020,local_2000);
          auVar154 = vpunpckhwd_avx2(local_2060,local_2040);
          auVar155 = vpunpckhwd_avx2(local_2020,local_2000);
          auVar42 = vpunpckldq_avx2(auVar210,auVar381);
          auVar73 = vpunpckldq_avx2(auVar154,auVar155);
          _local_2660 = vpunpcklqdq_avx2(auVar42,auVar73);
          local_2640 = vpunpckhqdq_avx2(auVar42,auVar73);
          auVar210 = vpunpckhdq_avx2(auVar210,auVar381);
          auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
          local_2620 = vpunpcklqdq_avx2(auVar210,auVar154);
          local_2600 = vpunpckhqdq_avx2(auVar210,auVar154);
          lVar9 = 0;
          do {
            auVar277 = *(undefined1 (*) [16])(local_2660 + lVar9);
            auVar185 = *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10);
            *(long *)dst = auVar277._0_8_;
            uVar5 = vpextrq_avx(auVar277,1);
            *(undefined8 *)(dst + stride * 4) = uVar5;
            *(long *)(dst + stride * 8) = auVar185._0_8_;
            uVar5 = vpextrq_avx(auVar185,1);
            *(undefined8 *)(dst + stride * 0xc) = uVar5;
            dst = dst + stride;
            lVar9 = lVar9 + 0x20;
          } while (lVar9 != 0x80);
          return;
        }
        if (bd < 0xc) {
          uStackY_2688 = 0x996e85;
          highbd_dr_prediction_z1_64xN_avx2(0x10,(uint16_t *)local_2060,0x40,left,dy,iVar14);
        }
        else {
          uStackY_2688 = 0x997e3c;
          highbd_dr_prediction_32bit_z1_64xN_avx2(0x10,(uint16_t *)local_2060,0x40,left,dy,iVar14);
        }
        iVar14 = 0x10;
      }
      goto LAB_009999cc;
    }
    if (bh * 2 != bw) {
      if (bh == 0x10) {
        uVar4 = left[0x4f];
        auVar36._2_2_ = uVar4;
        auVar36._0_2_ = uVar4;
        auVar36._4_2_ = uVar4;
        auVar36._6_2_ = uVar4;
        auVar36._8_2_ = uVar4;
        auVar36._10_2_ = uVar4;
        auVar36._12_2_ = uVar4;
        auVar36._14_2_ = uVar4;
        auVar53._16_2_ = uVar4;
        auVar53._0_16_ = auVar36;
        auVar53._18_2_ = uVar4;
        auVar53._20_2_ = uVar4;
        auVar53._22_2_ = uVar4;
        auVar53._24_2_ = uVar4;
        auVar53._26_2_ = uVar4;
        auVar53._28_2_ = uVar4;
        auVar53._30_2_ = uVar4;
        lVar9 = 0;
        if (bd < 0xc) {
          auVar75._8_2_ = 0x10;
          auVar75._0_8_ = 0x10001000100010;
          auVar75._10_2_ = 0x10;
          auVar75._12_2_ = 0x10;
          auVar75._14_2_ = 0x10;
          auVar75._16_2_ = 0x10;
          auVar75._18_2_ = 0x10;
          auVar75._20_2_ = 0x10;
          auVar75._22_2_ = 0x10;
          auVar75._24_2_ = 0x10;
          auVar75._26_2_ = 0x10;
          auVar75._28_2_ = 0x10;
          auVar75._30_2_ = 0x10;
          auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar103._8_2_ = 0x4e;
          auVar103._0_8_ = 0x4e004e004e004e;
          auVar103._10_2_ = 0x4e;
          auVar103._12_2_ = 0x4e;
          auVar103._14_2_ = 0x4e;
          auVar103._16_2_ = 0x4e;
          auVar103._18_2_ = 0x4e;
          auVar103._20_2_ = 0x4e;
          auVar103._22_2_ = 0x4e;
          auVar103._24_2_ = 0x4e;
          auVar103._26_2_ = 0x4e;
          auVar103._28_2_ = 0x4e;
          auVar103._30_2_ = 0x4e;
          lVar19 = 0;
          uVar12 = (ulong)(uint)dy;
          do {
            uVar13 = (int)uVar12 >> 6;
            lVar24 = lVar9;
            if ((int)uVar13 < 0x4f) {
              uVar6 = (ushort)(uVar12 >> 1);
              uVar116 = uVar6 & 0x1f;
              auVar124._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar124._8_2_ = uVar116;
              auVar124._10_2_ = uVar116;
              auVar124._12_2_ = uVar116;
              auVar124._14_2_ = uVar116;
              auVar124._16_2_ = uVar116;
              auVar124._18_2_ = uVar116;
              auVar124._20_2_ = uVar116;
              auVar124._22_2_ = uVar116;
              auVar124._24_2_ = uVar116;
              auVar124._26_2_ = uVar116;
              auVar124._28_2_ = uVar116;
              auVar124._30_2_ = uVar116;
              auVar154 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar13 + 1),
                                     *(undefined1 (*) [32])(left + (int)uVar13));
              auVar155 = vpmullw_avx2(auVar154,auVar124);
              auVar154 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar13),5);
              auVar154 = vpaddw_avx2(auVar154,auVar75);
              auVar154 = vpaddw_avx2(auVar155,auVar154);
              auVar155 = vpsrlw_avx2(auVar154,5);
              auVar143._0_2_ = (undefined2)uVar13;
              auVar143._2_2_ = auVar143._0_2_;
              auVar143._4_2_ = auVar143._0_2_;
              auVar143._6_2_ = auVar143._0_2_;
              auVar143._8_2_ = auVar143._0_2_;
              auVar143._10_2_ = auVar143._0_2_;
              auVar143._12_2_ = auVar143._0_2_;
              auVar143._14_2_ = auVar143._0_2_;
              auVar185 = vpaddw_avx(auVar143,auVar277);
              auVar278 = vpslldq_avx(auVar185,2);
              auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar13),1);
              auVar185 = vpsrldq_avx(auVar185,0xe);
              auVar159._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar36;
              auVar159._16_16_ = ZEXT116(0) * auVar53._16_16_ + ZEXT116(1) * auVar185;
              auVar221._0_2_ = (undefined2)(uVar13 + 9);
              auVar221._2_2_ = auVar221._0_2_;
              auVar221._4_2_ = auVar221._0_2_;
              auVar221._6_2_ = auVar221._0_2_;
              auVar221._8_2_ = auVar221._0_2_;
              auVar221._10_2_ = auVar221._0_2_;
              auVar221._12_2_ = auVar221._0_2_;
              auVar221._14_2_ = auVar221._0_2_;
              auVar221._16_2_ = auVar221._0_2_;
              auVar221._18_2_ = auVar221._0_2_;
              auVar221._20_2_ = auVar221._0_2_;
              auVar221._22_2_ = auVar221._0_2_;
              auVar221._24_2_ = auVar221._0_2_;
              auVar221._26_2_ = auVar221._0_2_;
              auVar221._28_2_ = auVar221._0_2_;
              auVar221._30_2_ = auVar221._0_2_;
              auVar154 = vpblendw_avx2(auVar159,auVar221,2);
              auVar222._0_2_ = (undefined2)(uVar13 + 10);
              auVar222._2_2_ = auVar222._0_2_;
              auVar222._4_2_ = auVar222._0_2_;
              auVar222._6_2_ = auVar222._0_2_;
              auVar222._8_2_ = auVar222._0_2_;
              auVar222._10_2_ = auVar222._0_2_;
              auVar222._12_2_ = auVar222._0_2_;
              auVar222._14_2_ = auVar222._0_2_;
              auVar222._16_2_ = auVar222._0_2_;
              auVar222._18_2_ = auVar222._0_2_;
              auVar222._20_2_ = auVar222._0_2_;
              auVar222._22_2_ = auVar222._0_2_;
              auVar222._24_2_ = auVar222._0_2_;
              auVar222._26_2_ = auVar222._0_2_;
              auVar222._28_2_ = auVar222._0_2_;
              auVar222._30_2_ = auVar222._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar222,4);
              auVar223._0_2_ = (undefined2)(uVar13 + 0xb);
              auVar223._2_2_ = auVar223._0_2_;
              auVar223._4_2_ = auVar223._0_2_;
              auVar223._6_2_ = auVar223._0_2_;
              auVar223._8_2_ = auVar223._0_2_;
              auVar223._10_2_ = auVar223._0_2_;
              auVar223._12_2_ = auVar223._0_2_;
              auVar223._14_2_ = auVar223._0_2_;
              auVar223._16_2_ = auVar223._0_2_;
              auVar223._18_2_ = auVar223._0_2_;
              auVar223._20_2_ = auVar223._0_2_;
              auVar223._22_2_ = auVar223._0_2_;
              auVar223._24_2_ = auVar223._0_2_;
              auVar223._26_2_ = auVar223._0_2_;
              auVar223._28_2_ = auVar223._0_2_;
              auVar223._30_2_ = auVar223._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar223,8);
              auVar224._0_2_ = (undefined2)(uVar13 + 0xc);
              auVar224._2_2_ = auVar224._0_2_;
              auVar224._4_2_ = auVar224._0_2_;
              auVar224._6_2_ = auVar224._0_2_;
              auVar224._8_2_ = auVar224._0_2_;
              auVar224._10_2_ = auVar224._0_2_;
              auVar224._12_2_ = auVar224._0_2_;
              auVar224._14_2_ = auVar224._0_2_;
              auVar224._16_2_ = auVar224._0_2_;
              auVar224._18_2_ = auVar224._0_2_;
              auVar224._20_2_ = auVar224._0_2_;
              auVar224._22_2_ = auVar224._0_2_;
              auVar224._24_2_ = auVar224._0_2_;
              auVar224._26_2_ = auVar224._0_2_;
              auVar224._28_2_ = auVar224._0_2_;
              auVar224._30_2_ = auVar224._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar224,0x10);
              auVar225._0_2_ = (undefined2)(uVar13 + 0xd);
              auVar225._2_2_ = auVar225._0_2_;
              auVar225._4_2_ = auVar225._0_2_;
              auVar225._6_2_ = auVar225._0_2_;
              auVar225._8_2_ = auVar225._0_2_;
              auVar225._10_2_ = auVar225._0_2_;
              auVar225._12_2_ = auVar225._0_2_;
              auVar225._14_2_ = auVar225._0_2_;
              auVar225._16_2_ = auVar225._0_2_;
              auVar225._18_2_ = auVar225._0_2_;
              auVar225._20_2_ = auVar225._0_2_;
              auVar225._22_2_ = auVar225._0_2_;
              auVar225._24_2_ = auVar225._0_2_;
              auVar225._26_2_ = auVar225._0_2_;
              auVar225._28_2_ = auVar225._0_2_;
              auVar225._30_2_ = auVar225._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar225,0x20);
              auVar226._0_2_ = (undefined2)(uVar13 + 0xe);
              auVar226._2_2_ = auVar226._0_2_;
              auVar226._4_2_ = auVar226._0_2_;
              auVar226._6_2_ = auVar226._0_2_;
              auVar226._8_2_ = auVar226._0_2_;
              auVar226._10_2_ = auVar226._0_2_;
              auVar226._12_2_ = auVar226._0_2_;
              auVar226._14_2_ = auVar226._0_2_;
              auVar226._16_2_ = auVar226._0_2_;
              auVar226._18_2_ = auVar226._0_2_;
              auVar226._20_2_ = auVar226._0_2_;
              auVar226._22_2_ = auVar226._0_2_;
              auVar226._24_2_ = auVar226._0_2_;
              auVar226._26_2_ = auVar226._0_2_;
              auVar226._28_2_ = auVar226._0_2_;
              auVar226._30_2_ = auVar226._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar226,0x40);
              auVar227._0_2_ = (undefined2)(uVar13 + 0xf);
              auVar227._2_2_ = auVar227._0_2_;
              auVar227._4_2_ = auVar227._0_2_;
              auVar227._6_2_ = auVar227._0_2_;
              auVar227._8_2_ = auVar227._0_2_;
              auVar227._10_2_ = auVar227._0_2_;
              auVar227._12_2_ = auVar227._0_2_;
              auVar227._14_2_ = auVar227._0_2_;
              auVar227._16_2_ = auVar227._0_2_;
              auVar227._18_2_ = auVar227._0_2_;
              auVar227._20_2_ = auVar227._0_2_;
              auVar227._22_2_ = auVar227._0_2_;
              auVar227._24_2_ = auVar227._0_2_;
              auVar227._26_2_ = auVar227._0_2_;
              auVar227._28_2_ = auVar227._0_2_;
              auVar227._30_2_ = auVar227._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar227,0x80);
              auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
              auVar154 = vpcmpgtw_avx2(auVar154,auVar103);
              auVar154 = vpblendvb_avx2(auVar155,auVar53,auVar154);
              *(undefined1 (*) [32])(local_2060 + lVar19 * 0x20) = auVar154;
              uVar12 = (ulong)(uint)((int)uVar12 + dy);
            }
            else {
              do {
                *(undefined1 (*) [32])(local_2060 + lVar24) = auVar53;
                lVar24 = lVar24 + 0x20;
              } while (lVar24 != 0x800);
            }
            if (0x4e < (int)uVar13) break;
            lVar19 = lVar19 + 1;
            lVar9 = lVar9 + 0x20;
          } while (lVar19 != 0x40);
        }
        else {
          auVar81._8_4_ = 0x10;
          auVar81._0_8_ = 0x1000000010;
          auVar81._12_4_ = 0x10;
          auVar81._16_4_ = 0x10;
          auVar81._20_4_ = 0x10;
          auVar81._24_4_ = 0x10;
          auVar81._28_4_ = 0x10;
          auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar109._8_2_ = 0x4e;
          auVar109._0_8_ = 0x4e004e004e004e;
          auVar109._10_2_ = 0x4e;
          auVar109._12_2_ = 0x4e;
          auVar109._14_2_ = 0x4e;
          auVar109._16_2_ = 0x4e;
          auVar109._18_2_ = 0x4e;
          auVar109._20_2_ = 0x4e;
          auVar109._22_2_ = 0x4e;
          auVar109._24_2_ = 0x4e;
          auVar109._26_2_ = 0x4e;
          auVar109._28_2_ = 0x4e;
          auVar109._30_2_ = 0x4e;
          lVar19 = 0;
          uVar12 = (ulong)(uint)dy;
          do {
            uVar13 = (int)uVar12 >> 6;
            lVar24 = lVar9;
            if ((int)uVar13 < 0x4f) {
              uVar17 = (uint)(uVar12 >> 1);
              uVar18 = uVar17 & 0x1f;
              auVar129._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f0000001f;
              auVar129._8_4_ = uVar18;
              auVar129._12_4_ = uVar18;
              auVar129._16_4_ = uVar18;
              auVar129._20_4_ = uVar18;
              auVar129._24_4_ = uVar18;
              auVar129._28_4_ = uVar18;
              auVar185 = auVar36;
              if ((int)uVar13 < 0x47) {
                auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar13 + 8));
                auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar13 + 9));
                auVar155 = vpsubd_avx2(auVar155,auVar154);
                auVar154 = vpslld_avx2(auVar154,5);
                auVar155 = vpmulld_avx2(auVar155,auVar129);
                auVar154 = vpaddd_avx2(auVar154,auVar81);
                auVar154 = vpaddd_avx2(auVar155,auVar154);
                auVar154 = vpsrld_avx2(auVar154,5);
                auVar178._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar154._16_16_;
                auVar178._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar36;
                auVar154 = vpackusdw_avx2(auVar154,auVar178);
                auVar185 = auVar154._0_16_;
              }
              auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar13));
              auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar13 + 1));
              auVar155 = vpsubd_avx2(auVar155,auVar154);
              auVar154 = vpslld_avx2(auVar154,5);
              auVar155 = vpmulld_avx2(auVar155,auVar129);
              auVar154 = vpaddd_avx2(auVar154,auVar81);
              auVar154 = vpaddd_avx2(auVar155,auVar154);
              auVar154 = vpsrld_avx2(auVar154,5);
              auVar154 = vpackusdw_avx2(auVar154,ZEXT1632(auVar154._16_16_));
              auVar130._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar154._0_16_;
              auVar130._16_16_ = ZEXT116(0) * auVar154._16_16_ + ZEXT116(1) * auVar185;
              auVar146._0_2_ = (undefined2)uVar13;
              auVar146._2_2_ = auVar146._0_2_;
              auVar146._4_2_ = auVar146._0_2_;
              auVar146._6_2_ = auVar146._0_2_;
              auVar146._8_2_ = auVar146._0_2_;
              auVar146._10_2_ = auVar146._0_2_;
              auVar146._12_2_ = auVar146._0_2_;
              auVar146._14_2_ = auVar146._0_2_;
              auVar185 = vpaddw_avx(auVar146,auVar277);
              auVar278 = vpslldq_avx(auVar185,2);
              auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar13),1);
              auVar185 = vpsrldq_avx(auVar185,0xe);
              auVar164._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar36;
              auVar164._16_16_ = ZEXT116(0) * auVar53._16_16_ + ZEXT116(1) * auVar185;
              auVar245._0_2_ = (undefined2)(uVar13 + 9);
              auVar245._2_2_ = auVar245._0_2_;
              auVar245._4_2_ = auVar245._0_2_;
              auVar245._6_2_ = auVar245._0_2_;
              auVar245._8_2_ = auVar245._0_2_;
              auVar245._10_2_ = auVar245._0_2_;
              auVar245._12_2_ = auVar245._0_2_;
              auVar245._14_2_ = auVar245._0_2_;
              auVar245._16_2_ = auVar245._0_2_;
              auVar245._18_2_ = auVar245._0_2_;
              auVar245._20_2_ = auVar245._0_2_;
              auVar245._22_2_ = auVar245._0_2_;
              auVar245._24_2_ = auVar245._0_2_;
              auVar245._26_2_ = auVar245._0_2_;
              auVar245._28_2_ = auVar245._0_2_;
              auVar245._30_2_ = auVar245._0_2_;
              auVar154 = vpblendw_avx2(auVar164,auVar245,2);
              auVar246._0_2_ = (undefined2)(uVar13 + 10);
              auVar246._2_2_ = auVar246._0_2_;
              auVar246._4_2_ = auVar246._0_2_;
              auVar246._6_2_ = auVar246._0_2_;
              auVar246._8_2_ = auVar246._0_2_;
              auVar246._10_2_ = auVar246._0_2_;
              auVar246._12_2_ = auVar246._0_2_;
              auVar246._14_2_ = auVar246._0_2_;
              auVar246._16_2_ = auVar246._0_2_;
              auVar246._18_2_ = auVar246._0_2_;
              auVar246._20_2_ = auVar246._0_2_;
              auVar246._22_2_ = auVar246._0_2_;
              auVar246._24_2_ = auVar246._0_2_;
              auVar246._26_2_ = auVar246._0_2_;
              auVar246._28_2_ = auVar246._0_2_;
              auVar246._30_2_ = auVar246._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar246,4);
              auVar247._0_2_ = (undefined2)(uVar13 + 0xb);
              auVar247._2_2_ = auVar247._0_2_;
              auVar247._4_2_ = auVar247._0_2_;
              auVar247._6_2_ = auVar247._0_2_;
              auVar247._8_2_ = auVar247._0_2_;
              auVar247._10_2_ = auVar247._0_2_;
              auVar247._12_2_ = auVar247._0_2_;
              auVar247._14_2_ = auVar247._0_2_;
              auVar247._16_2_ = auVar247._0_2_;
              auVar247._18_2_ = auVar247._0_2_;
              auVar247._20_2_ = auVar247._0_2_;
              auVar247._22_2_ = auVar247._0_2_;
              auVar247._24_2_ = auVar247._0_2_;
              auVar247._26_2_ = auVar247._0_2_;
              auVar247._28_2_ = auVar247._0_2_;
              auVar247._30_2_ = auVar247._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar247,8);
              auVar248._0_2_ = (undefined2)(uVar13 + 0xc);
              auVar248._2_2_ = auVar248._0_2_;
              auVar248._4_2_ = auVar248._0_2_;
              auVar248._6_2_ = auVar248._0_2_;
              auVar248._8_2_ = auVar248._0_2_;
              auVar248._10_2_ = auVar248._0_2_;
              auVar248._12_2_ = auVar248._0_2_;
              auVar248._14_2_ = auVar248._0_2_;
              auVar248._16_2_ = auVar248._0_2_;
              auVar248._18_2_ = auVar248._0_2_;
              auVar248._20_2_ = auVar248._0_2_;
              auVar248._22_2_ = auVar248._0_2_;
              auVar248._24_2_ = auVar248._0_2_;
              auVar248._26_2_ = auVar248._0_2_;
              auVar248._28_2_ = auVar248._0_2_;
              auVar248._30_2_ = auVar248._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar248,0x10);
              auVar249._0_2_ = (undefined2)(uVar13 + 0xd);
              auVar249._2_2_ = auVar249._0_2_;
              auVar249._4_2_ = auVar249._0_2_;
              auVar249._6_2_ = auVar249._0_2_;
              auVar249._8_2_ = auVar249._0_2_;
              auVar249._10_2_ = auVar249._0_2_;
              auVar249._12_2_ = auVar249._0_2_;
              auVar249._14_2_ = auVar249._0_2_;
              auVar249._16_2_ = auVar249._0_2_;
              auVar249._18_2_ = auVar249._0_2_;
              auVar249._20_2_ = auVar249._0_2_;
              auVar249._22_2_ = auVar249._0_2_;
              auVar249._24_2_ = auVar249._0_2_;
              auVar249._26_2_ = auVar249._0_2_;
              auVar249._28_2_ = auVar249._0_2_;
              auVar249._30_2_ = auVar249._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar249,0x20);
              auVar250._0_2_ = (undefined2)(uVar13 + 0xe);
              auVar250._2_2_ = auVar250._0_2_;
              auVar250._4_2_ = auVar250._0_2_;
              auVar250._6_2_ = auVar250._0_2_;
              auVar250._8_2_ = auVar250._0_2_;
              auVar250._10_2_ = auVar250._0_2_;
              auVar250._12_2_ = auVar250._0_2_;
              auVar250._14_2_ = auVar250._0_2_;
              auVar250._16_2_ = auVar250._0_2_;
              auVar250._18_2_ = auVar250._0_2_;
              auVar250._20_2_ = auVar250._0_2_;
              auVar250._22_2_ = auVar250._0_2_;
              auVar250._24_2_ = auVar250._0_2_;
              auVar250._26_2_ = auVar250._0_2_;
              auVar250._28_2_ = auVar250._0_2_;
              auVar250._30_2_ = auVar250._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar250,0x40);
              auVar251._0_2_ = (undefined2)(uVar13 + 0xf);
              auVar251._2_2_ = auVar251._0_2_;
              auVar251._4_2_ = auVar251._0_2_;
              auVar251._6_2_ = auVar251._0_2_;
              auVar251._8_2_ = auVar251._0_2_;
              auVar251._10_2_ = auVar251._0_2_;
              auVar251._12_2_ = auVar251._0_2_;
              auVar251._14_2_ = auVar251._0_2_;
              auVar251._16_2_ = auVar251._0_2_;
              auVar251._18_2_ = auVar251._0_2_;
              auVar251._20_2_ = auVar251._0_2_;
              auVar251._22_2_ = auVar251._0_2_;
              auVar251._24_2_ = auVar251._0_2_;
              auVar251._26_2_ = auVar251._0_2_;
              auVar251._28_2_ = auVar251._0_2_;
              auVar251._30_2_ = auVar251._0_2_;
              auVar154 = vpblendw_avx2(auVar154,auVar251,0x80);
              auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
              auVar154 = vpcmpgtw_avx2(auVar154,auVar109);
              auVar154 = vpblendvb_avx2(auVar130,auVar53,auVar154);
              *(undefined1 (*) [32])(local_2060 + lVar19 * 0x20) = auVar154;
              uVar12 = (ulong)(uint)((int)uVar12 + dy);
            }
            else {
              do {
                *(undefined1 (*) [32])(local_2060 + lVar24) = auVar53;
                lVar24 = lVar24 + 0x20;
              } while (lVar24 != 0x800);
            }
            if (0x4e < (int)uVar13) break;
            lVar19 = lVar19 + 1;
            lVar9 = lVar9 + 0x20;
          } while (lVar19 != 0x40);
        }
        uVar12 = 0;
        do {
          lVar9 = uVar12 * 0x20;
          auVar154 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_2060 + lVar9),
                                     *(undefined1 (*) [32])(local_2040 + lVar9));
          auVar155 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_2020 + lVar9),
                                     *(undefined1 (*) [32])(local_2000 + lVar9));
          auVar210 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1fe0 + lVar9),
                                     *(undefined1 (*) [32])(local_1fc0 + lVar9));
          auVar381 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1fa0 + lVar9),
                                     *(undefined1 (*) [32])(local_1f80 + lVar9));
          auVar42 = vpunpckldq_avx2(auVar154,auVar155);
          auVar73 = vpunpckldq_avx2(auVar210,auVar381);
          _local_2660 = vpunpcklqdq_avx2(auVar42,auVar73);
          local_2640 = vpunpckhqdq_avx2(auVar42,auVar73);
          auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
          auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
          local_2620 = vpunpcklqdq_avx2(auVar154,auVar155);
          local_2600 = vpunpckhqdq_avx2(auVar154,auVar155);
          auVar154 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_2060 + lVar9),
                                     *(undefined1 (*) [32])(local_2040 + lVar9));
          auVar155 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_2020 + lVar9),
                                     *(undefined1 (*) [32])(local_2000 + lVar9));
          auVar210 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1fe0 + lVar9),
                                     *(undefined1 (*) [32])(local_1fc0 + lVar9));
          auVar381 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1fa0 + lVar9),
                                     *(undefined1 (*) [32])(local_1f80 + lVar9));
          auVar42 = vpunpckldq_avx2(auVar154,auVar155);
          auVar73 = vpunpckldq_avx2(auVar210,auVar381);
          local_25e0 = vpunpcklqdq_avx2(auVar42,auVar73);
          local_25c0 = vpunpckhqdq_avx2(auVar42,auVar73);
          auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
          auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
          local_25a0 = vpunpcklqdq_avx2(auVar154,auVar155);
          local_2580 = vpunpckhqdq_avx2(auVar154,auVar155);
          auVar154 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1f60 + lVar9),
                                     *(undefined1 (*) [32])(local_1f40 + lVar9));
          auVar155 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1f20 + lVar9),
                                     *(undefined1 (*) [32])(local_1f00 + lVar9));
          auVar210 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1ee0 + lVar9),
                                     *(undefined1 (*) [32])(local_1ec0 + lVar9));
          auVar381 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1ea0 + lVar9),
                                     *(undefined1 (*) [32])(local_1e80 + lVar9));
          auVar42 = vpunpckldq_avx2(auVar154,auVar155);
          auVar73 = vpunpckldq_avx2(auVar210,auVar381);
          local_2560 = vpunpcklqdq_avx2(auVar42,auVar73);
          local_2540 = vpunpckhqdq_avx2(auVar42,auVar73);
          auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
          auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
          local_2520 = vpunpcklqdq_avx2(auVar154,auVar155);
          local_2500 = vpunpckhqdq_avx2(auVar154,auVar155);
          auVar154 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1f60 + lVar9),
                                     *(undefined1 (*) [32])(local_1f40 + lVar9));
          auVar155 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1f20 + lVar9),
                                     *(undefined1 (*) [32])(local_1f00 + lVar9));
          auVar210 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1ee0 + lVar9),
                                     *(undefined1 (*) [32])(local_1ec0 + lVar9));
          auVar381 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1ea0 + lVar9),
                                     *(undefined1 (*) [32])(local_1e80 + lVar9));
          auVar42 = vpunpckldq_avx2(auVar154,auVar155);
          auVar73 = vpunpckldq_avx2(auVar210,auVar381);
          local_24e0 = vpunpcklqdq_avx2(auVar42,auVar73);
          local_24c0 = vpunpckhqdq_avx2(auVar42,auVar73);
          auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
          auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
          local_24a0 = vpunpcklqdq_avx2(auVar154,auVar155);
          local_2480 = vpunpckhqdq_avx2(auVar154,auVar155);
          lVar9 = 0;
          do {
            auVar154 = *(undefined1 (*) [32])(local_2560 + lVar9);
            auVar155 = vperm2i128_avx2(auVar154,*(undefined1 (*) [32])(local_2660 + lVar9),2);
            auVar58._0_16_ =
                 ZEXT116(1) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10) +
                 ZEXT116(0) * auVar154._0_16_;
            auVar58._16_16_ =
                 ZEXT116(1) * auVar154._16_16_ +
                 ZEXT116(0) * *(undefined1 (*) [16])(local_2660 + lVar9 + 0x10);
            *(undefined1 (*) [32])((long)auStack_2260 + lVar9) = auVar155;
            *(undefined1 (*) [32])(auStack_2160 + lVar9) = auVar58;
            lVar9 = lVar9 + 0x20;
          } while (lVar9 != 0x100);
          lVar9 = 0;
          puVar10 = dst;
          do {
            uVar5 = *(undefined8 *)((long)auStack_2260 + lVar9 + 8);
            uVar7 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x10);
            uVar8 = *(undefined8 *)((long)auStack_2260 + lVar9 + 0x18);
            *(undefined8 *)puVar10 = *(undefined8 *)((long)auStack_2260 + lVar9);
            *(undefined8 *)(puVar10 + 4) = uVar5;
            *(undefined8 *)(puVar10 + 8) = uVar7;
            *(undefined8 *)(puVar10 + 0xc) = uVar8;
            lVar9 = lVar9 + 0x20;
            puVar10 = puVar10 + stride;
          } while (lVar9 != 0x200);
          dst = dst + 0x10;
          bVar26 = uVar12 < 0x30;
          uVar12 = uVar12 + 0x10;
        } while (bVar26);
        return;
      }
      if (bh == 8) {
        iVar14 = 0x27 << (bVar11 & 0x1f);
        uVar4 = left[iVar14];
        auVar35._2_2_ = uVar4;
        auVar35._0_2_ = uVar4;
        auVar35._4_2_ = uVar4;
        auVar35._6_2_ = uVar4;
        auVar35._8_2_ = uVar4;
        auVar35._10_2_ = uVar4;
        auVar35._12_2_ = uVar4;
        auVar35._14_2_ = uVar4;
        auVar52._16_2_ = uVar4;
        auVar52._0_16_ = auVar35;
        auVar52._18_2_ = uVar4;
        auVar52._20_2_ = uVar4;
        auVar52._22_2_ = uVar4;
        auVar52._24_2_ = uVar4;
        auVar52._26_2_ = uVar4;
        auVar52._28_2_ = uVar4;
        auVar52._30_2_ = uVar4;
        if (bd < 0xc) {
          auVar64._0_2_ = (undefined2)iVar14;
          auVar64._2_2_ = auVar64._0_2_;
          auVar64._4_2_ = auVar64._0_2_;
          auVar64._6_2_ = auVar64._0_2_;
          auVar64._8_2_ = auVar64._0_2_;
          auVar64._10_2_ = auVar64._0_2_;
          auVar64._12_2_ = auVar64._0_2_;
          auVar64._14_2_ = auVar64._0_2_;
          lVar9 = 0;
          auVar92._8_2_ = 0x10;
          auVar92._0_8_ = 0x10001000100010;
          auVar92._10_2_ = 0x10;
          auVar92._12_2_ = 0x10;
          auVar92._14_2_ = 0x10;
          auVar158._8_2_ = 0x1f;
          auVar158._0_8_ = 0x1f001f001f001f;
          auVar158._10_2_ = 0x1f;
          auVar158._12_2_ = 0x1f;
          auVar158._14_2_ = 0x1f;
          auVar158._16_2_ = 0x1f;
          auVar158._18_2_ = 0x1f;
          auVar158._20_2_ = 0x1f;
          auVar158._22_2_ = 0x1f;
          auVar158._24_2_ = 0x1f;
          auVar158._26_2_ = 0x1f;
          auVar158._28_2_ = 0x1f;
          auVar158._30_2_ = 0x1f;
          lVar19 = 0;
          uVar13 = dy;
          do {
            uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
            lVar24 = lVar9;
            if ((int)uVar17 < iVar14) {
              auVar277 = *(undefined1 (*) [16])(left + (int)uVar17);
              if (upsample_left == 0) {
                auVar185 = *(undefined1 (*) [16])(left + (long)(int)uVar17 + 1);
                auVar278 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 1,1);
                auVar278 = vpinsrw_avx(auVar278,uVar17 + 2,2);
                auVar278 = vpinsrw_avx(auVar278,uVar17 + 3,3);
                auVar278 = vpinsrw_avx(auVar278,uVar17 + 4,4);
                auVar278 = vpinsrw_avx(auVar278,uVar17 + 5,5);
                auVar278 = vpinsrw_avx(auVar278,uVar17 + 6,6);
                auVar278 = vpinsrw_avx(auVar278,uVar17 + 7,7);
                uVar6 = (ushort)(uVar13 >> 1);
                uVar116 = uVar6 & 0x1f;
                auVar312._0_8_ =
                     CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
                auVar312._8_2_ = uVar116;
                auVar312._10_2_ = uVar116;
                auVar312._12_2_ = uVar116;
                auVar312._14_2_ = uVar116;
              }
              else {
                auVar185 = vpblendw_avx(auVar277,(undefined1  [16])0x0,0xaa);
                auVar278 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8),
                                        (undefined1  [16])0x0,0xaa);
                auVar354 = vpsrld_avx(auVar277,0x10);
                auVar277 = vpackusdw_avx(auVar185,auVar278);
                auVar310 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8),0x10);
                auVar185 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 2,1);
                auVar185 = vpinsrw_avx(auVar185,uVar17 + 4,2);
                auVar185 = vpinsrw_avx(auVar185,uVar17 + 6,3);
                auVar185 = vpinsrw_avx(auVar185,uVar17 + 8,4);
                auVar185 = vpinsrw_avx(auVar185,uVar17 + 10,5);
                auVar185 = vpinsrw_avx(auVar185,uVar17 + 0xc,6);
                auVar278 = vpinsrw_avx(auVar185,uVar17 + 0xe,7);
                auVar329._0_2_ = (undefined2)uVar13;
                auVar329._2_2_ = auVar329._0_2_;
                auVar329._4_2_ = auVar329._0_2_;
                auVar329._6_2_ = auVar329._0_2_;
                auVar329._8_2_ = auVar329._0_2_;
                auVar329._10_2_ = auVar329._0_2_;
                auVar329._12_2_ = auVar329._0_2_;
                auVar329._14_2_ = auVar329._0_2_;
                auVar329._16_2_ = auVar329._0_2_;
                auVar329._18_2_ = auVar329._0_2_;
                auVar329._20_2_ = auVar329._0_2_;
                auVar329._22_2_ = auVar329._0_2_;
                auVar329._24_2_ = auVar329._0_2_;
                auVar329._26_2_ = auVar329._0_2_;
                auVar329._28_2_ = auVar329._0_2_;
                auVar329._30_2_ = auVar329._0_2_;
                auVar154 = vpsllw_avx2(auVar329,ZEXT416((uint)upsample_left));
                auVar185 = vpackusdw_avx(auVar354,auVar310);
                auVar154 = vpsrlw_avx2(auVar154,1);
                auVar154 = vpand_avx2(auVar154,auVar158);
                auVar312 = auVar154._0_16_;
              }
              auVar310 = vpsllw_avx(auVar277,5);
              auVar310 = vpaddw_avx(auVar310,auVar92);
              auVar277 = vpsubw_avx(auVar185,auVar277);
              auVar277 = vpmullw_avx(auVar312,auVar277);
              auVar277 = vpaddw_avx(auVar310,auVar277);
              auVar185 = vpsrlw_avx(auVar277,5);
              auVar277 = vpcmpgtw_avx(auVar64,auVar278);
              auVar277 = vpblendvb_avx(auVar35,auVar185,auVar277);
              *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar277;
              uVar13 = uVar13 + dy;
            }
            else {
              do {
                *(undefined1 (*) [16])(local_2060 + lVar24) = auVar35;
                lVar24 = lVar24 + 0x10;
              } while (lVar24 != 0x200);
            }
            if (iVar14 <= (int)uVar17) break;
            lVar19 = lVar19 + 1;
            lVar9 = lVar9 + 0x10;
          } while (lVar19 != 0x20);
        }
        else {
          auVar80._4_4_ = iVar14;
          auVar80._0_4_ = iVar14;
          auVar80._8_4_ = iVar14;
          auVar80._12_4_ = iVar14;
          auVar80._16_4_ = iVar14;
          auVar80._20_4_ = iVar14;
          auVar80._24_4_ = iVar14;
          auVar80._28_4_ = iVar14;
          lVar9 = 0;
          auVar277 = vpmovsxbd_avx(ZEXT416(0x3020104));
          auVar108._8_4_ = 0x10;
          auVar108._0_8_ = 0x1000000010;
          auVar108._12_4_ = 0x10;
          auVar108._16_4_ = 0x10;
          auVar108._20_4_ = 0x10;
          auVar108._24_4_ = 0x10;
          auVar108._28_4_ = 0x10;
          auVar185 = vpmovsxbd_avx(ZEXT416(0x6040208));
          auVar177._8_4_ = 0x1f;
          auVar177._0_8_ = 0x1f0000001f;
          auVar177._12_4_ = 0x1f;
          auVar177._16_4_ = 0x1f;
          auVar177._20_4_ = 0x1f;
          auVar177._24_4_ = 0x1f;
          auVar177._28_4_ = 0x1f;
          lVar19 = 0;
          uVar13 = dy;
          do {
            iVar23 = (int)uVar13 >> (6 - bVar11 & 0x1f);
            lVar24 = lVar9;
            if (iVar23 < iVar14) {
              auVar244 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar23));
              if (upsample_left == 0) {
                auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 1));
                auVar314._4_4_ = iVar23;
                auVar314._0_4_ = iVar23;
                auVar314._8_4_ = iVar23;
                auVar314._12_4_ = iVar23;
                iVar1 = iVar23 + 5;
                iVar2 = iVar23 + 6;
                iVar3 = iVar23 + 7;
                auVar278 = vpaddd_avx(auVar314,auVar277);
                auVar155 = vpermq_avx2(ZEXT1632(auVar278),0xc4);
                auVar155 = vpblendd_avx2(auVar155,ZEXT1632(auVar314),1);
                auVar359._4_4_ = iVar1;
                auVar359._0_4_ = iVar1;
                auVar359._8_4_ = iVar1;
                auVar359._12_4_ = iVar1;
                auVar359._16_4_ = iVar1;
                auVar359._20_4_ = iVar1;
                auVar359._24_4_ = iVar1;
                auVar359._28_4_ = iVar1;
                auVar155 = vpblendd_avx2(auVar155,auVar359,0x20);
                auVar360._4_4_ = iVar2;
                auVar360._0_4_ = iVar2;
                auVar360._8_4_ = iVar2;
                auVar360._12_4_ = iVar2;
                auVar360._16_4_ = iVar2;
                auVar360._20_4_ = iVar2;
                auVar360._24_4_ = iVar2;
                auVar360._28_4_ = iVar2;
                auVar155 = vpblendd_avx2(auVar155,auVar360,0x40);
                auVar361._4_4_ = iVar3;
                auVar361._0_4_ = iVar3;
                auVar361._8_4_ = iVar3;
                auVar361._12_4_ = iVar3;
                auVar361._16_4_ = iVar3;
                auVar361._20_4_ = iVar3;
                auVar361._24_4_ = iVar3;
                auVar361._28_4_ = iVar3;
                auVar155 = vpblendd_avx2(auVar155,auVar361,0x80);
                uVar17 = uVar13 >> 1;
                uVar18 = uVar17 & 0x1f;
                auVar362._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f0000001f;
                auVar362._8_4_ = uVar18;
                auVar362._12_4_ = uVar18;
                auVar362._16_4_ = uVar18;
                auVar362._20_4_ = uVar18;
                auVar362._24_4_ = uVar18;
                auVar362._28_4_ = uVar18;
              }
              else {
                auVar154 = vpshufd_avx2(auVar244,0xd8);
                auVar210 = vpermq_avx2(auVar154,0xd8);
                auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 8));
                auVar154 = vpshufd_avx2(auVar154,0xd8);
                auVar381 = vpermq_avx2(auVar154,0xd8);
                auVar189._4_4_ = iVar23;
                auVar189._0_4_ = iVar23;
                auVar189._8_4_ = iVar23;
                auVar189._12_4_ = iVar23;
                iVar1 = iVar23 + 10;
                iVar2 = iVar23 + 0xc;
                iVar3 = iVar23 + 0xe;
                auVar278 = vpaddd_avx(auVar189,auVar185);
                auVar154 = vpermq_avx2(ZEXT1632(auVar278),0xc4);
                auVar154 = vpblendd_avx2(auVar154,ZEXT1632(auVar189),1);
                auVar338._4_4_ = iVar1;
                auVar338._0_4_ = iVar1;
                auVar338._8_4_ = iVar1;
                auVar338._12_4_ = iVar1;
                auVar338._16_4_ = iVar1;
                auVar338._20_4_ = iVar1;
                auVar338._24_4_ = iVar1;
                auVar338._28_4_ = iVar1;
                auVar154 = vpblendd_avx2(auVar154,auVar338,0x20);
                auVar339._4_4_ = iVar2;
                auVar339._0_4_ = iVar2;
                auVar339._8_4_ = iVar2;
                auVar339._12_4_ = iVar2;
                auVar339._16_4_ = iVar2;
                auVar339._20_4_ = iVar2;
                auVar339._24_4_ = iVar2;
                auVar339._28_4_ = iVar2;
                auVar154 = vpblendd_avx2(auVar154,auVar339,0x40);
                auVar340._4_4_ = iVar3;
                auVar340._0_4_ = iVar3;
                auVar340._8_4_ = iVar3;
                auVar340._12_4_ = iVar3;
                auVar340._16_4_ = iVar3;
                auVar340._20_4_ = iVar3;
                auVar340._24_4_ = iVar3;
                auVar340._28_4_ = iVar3;
                auVar155 = vpblendd_avx2(auVar154,auVar340,0x80);
                auVar243._4_4_ = uVar13;
                auVar243._0_4_ = uVar13;
                auVar243._8_4_ = uVar13;
                auVar243._12_4_ = uVar13;
                auVar243._16_4_ = uVar13;
                auVar243._20_4_ = uVar13;
                auVar243._24_4_ = uVar13;
                auVar243._28_4_ = uVar13;
                auVar154 = vpslld_avx2(auVar243,ZEXT416((uint)upsample_left));
                auVar244._0_16_ = ZEXT116(0) * auVar381._0_16_ + ZEXT116(1) * auVar210._0_16_;
                auVar244._16_16_ = ZEXT116(0) * auVar210._16_16_ + ZEXT116(1) * auVar381._0_16_;
                auVar154 = vpsrld_avx2(auVar154,1);
                auVar362 = vpand_avx2(auVar154,auVar177);
                auVar154 = vperm2i128_avx2(auVar210,auVar381,0x31);
              }
              auVar155 = vpcmpgtd_avx2(auVar80,auVar155);
              auVar154 = vpsubd_avx2(auVar154,auVar244);
              auVar210 = vpmulld_avx2(auVar154,auVar362);
              auVar154 = vpslld_avx2(auVar244,5);
              auVar154 = vpaddd_avx2(auVar154,auVar108);
              auVar154 = vpaddd_avx2(auVar210,auVar154);
              auVar154 = vpsrld_avx2(auVar154,5);
              auVar310 = vpackusdw_avx(auVar154._0_16_,auVar154._16_16_);
              auVar278 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
              auVar154 = vpblendvb_avx2(auVar52,ZEXT1632(auVar310),ZEXT1632(auVar278));
              *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar154._0_16_;
              uVar13 = uVar13 + dy;
            }
            else {
              do {
                *(undefined1 (*) [16])(local_2060 + lVar24) = auVar35;
                lVar24 = lVar24 + 0x10;
              } while (lVar24 != 0x200);
            }
            if (iVar14 <= iVar23) break;
            lVar19 = lVar19 + 1;
            lVar9 = lVar9 + 0x10;
          } while (lVar19 != 0x20);
        }
        uVar12 = 0xfffffffffffffff8;
        lVar9 = 0x70;
        do {
          auVar185 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_20d0 + lVar9),
                                    *(undefined1 (*) [16])(auStack_20c0 + lVar9));
          auVar278 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_20b0 + lVar9),
                                    *(undefined1 (*) [16])(auStack_20a0 + lVar9));
          auVar310 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_2090 + lVar9),
                                    *(undefined1 (*) [16])(auStack_2080 + lVar9));
          auVar354 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_2070 + lVar9),
                                    *(undefined1 (*) [16])(local_2060 + lVar9));
          auVar277 = vpunpckldq_avx(auVar185,auVar278);
          auVar279 = vpunpckldq_avx(auVar310,auVar354);
          auVar170 = vpunpcklqdq_avx(auVar277,auVar279);
          *(undefined1 (*) [16])(auStackY_26d0 + lVar9) = auVar170;
          auVar277 = vpunpckhqdq_avx(auVar277,auVar279);
          *(undefined1 (*) [16])(auStackY_26c0 + lVar9) = auVar277;
          auVar277 = vpunpckhdq_avx(auVar185,auVar278);
          auVar185 = vpunpckhdq_avx(auVar310,auVar354);
          auVar278 = vpunpcklqdq_avx(auVar277,auVar185);
          *(undefined1 (*) [16])(auStackY_26b0 + lVar9) = auVar278;
          auVar277 = vpunpckhqdq_avx(auVar277,auVar185);
          *(undefined1 (*) [16])(auStackY_26a0 + lVar9) = auVar277;
          auVar277 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_20d0 + lVar9),
                                    *(undefined1 (*) [16])(auStack_20c0 + lVar9));
          auVar185 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_20b0 + lVar9),
                                    *(undefined1 (*) [16])(auStack_20a0 + lVar9));
          auVar278 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_2090 + lVar9),
                                    *(undefined1 (*) [16])(auStack_2080 + lVar9));
          auVar310 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_2070 + lVar9),
                                    *(undefined1 (*) [16])(local_2060 + lVar9));
          auVar354 = vpunpckldq_avx(auVar277,auVar185);
          auVar279 = vpunpckldq_avx(auVar278,auVar310);
          auVar170 = vpunpcklqdq_avx(auVar354,auVar279);
          *(undefined1 (*) [16])(auStackY_2690 + lVar9) = auVar170;
          auVar354 = vpunpckhqdq_avx(auVar354,auVar279);
          *(undefined1 (*) [16])(local_2660 + lVar9 + -0x20) = auVar354;
          auVar277 = vpunpckhdq_avx(auVar277,auVar185);
          auVar185 = vpunpckhdq_avx(auVar278,auVar310);
          auVar278 = vpunpcklqdq_avx(auVar277,auVar185);
          *(undefined1 (*) [16])((long)&local_2670 + lVar9) = auVar278;
          auVar277 = vpunpckhqdq_avx(auVar277,auVar185);
          *(undefined1 (*) [16])(local_2660 + lVar9) = auVar277;
          uVar12 = uVar12 + 8;
          lVar9 = lVar9 + 0x80;
        } while (uVar12 < 0x18);
        puVar10 = dst + 0x18;
        lVar9 = 0x180;
        do {
          uVar5 = *(undefined8 *)((long)auStackY_27e0 + lVar9 + 8);
          *(undefined8 *)(puVar10 + -0x18) = *(undefined8 *)((long)auStackY_27e0 + lVar9);
          *(undefined8 *)(puVar10 + -0x14) = uVar5;
          uVar5 = *(undefined8 *)((long)auStackY_2760 + lVar9 + 8);
          *(undefined8 *)(puVar10 + -0x10) = *(undefined8 *)((long)auStackY_2760 + lVar9);
          *(undefined8 *)(puVar10 + -0xc) = uVar5;
          uVar5 = *(undefined8 *)((long)auStackY_26e0 + lVar9 + 8);
          *(undefined8 *)(puVar10 + -8) = *(undefined8 *)((long)auStackY_26e0 + lVar9);
          *(undefined8 *)(puVar10 + -4) = uVar5;
          uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
          *(undefined8 *)puVar10 = *(undefined8 *)(local_2660 + lVar9);
          *(undefined8 *)(puVar10 + 4) = uVar5;
          lVar9 = lVar9 + 0x10;
          puVar10 = puVar10 + stride;
        } while (lVar9 != 0x200);
        return;
      }
      if (bh != 4) {
        return;
      }
      iVar14 = 0x13 << (bVar11 & 0x1f);
      uVar4 = left[iVar14];
      auVar31._2_2_ = uVar4;
      auVar31._0_2_ = uVar4;
      auVar31._4_2_ = uVar4;
      auVar31._6_2_ = uVar4;
      auVar31._8_2_ = uVar4;
      auVar31._10_2_ = uVar4;
      auVar31._12_2_ = uVar4;
      auVar31._14_2_ = uVar4;
      if (bd < 0xc) {
        auVar63._0_2_ = (undefined2)iVar14;
        auVar63._2_2_ = auVar63._0_2_;
        auVar63._4_2_ = auVar63._0_2_;
        auVar63._6_2_ = auVar63._0_2_;
        auVar63._8_2_ = auVar63._0_2_;
        auVar63._10_2_ = auVar63._0_2_;
        auVar63._12_2_ = auVar63._0_2_;
        auVar63._14_2_ = auVar63._0_2_;
        lVar9 = 0;
        auVar91._8_2_ = 0x10;
        auVar91._0_8_ = 0x10001000100010;
        auVar91._10_2_ = 0x10;
        auVar91._12_2_ = 0x10;
        auVar91._14_2_ = 0x10;
        auVar201._8_2_ = 0x1f;
        auVar201._0_8_ = 0x1f001f001f001f;
        auVar201._10_2_ = 0x1f;
        auVar201._12_2_ = 0x1f;
        auVar201._14_2_ = 0x1f;
        auVar201._16_2_ = 0x1f;
        auVar201._18_2_ = 0x1f;
        auVar201._20_2_ = 0x1f;
        auVar201._22_2_ = 0x1f;
        auVar201._24_2_ = 0x1f;
        auVar201._26_2_ = 0x1f;
        auVar201._28_2_ = 0x1f;
        auVar201._30_2_ = 0x1f;
        lVar19 = 0;
        uVar13 = dy;
        do {
          uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
          lVar24 = lVar9;
          if ((int)uVar17 < iVar14) {
            auVar277 = *(undefined1 (*) [16])(left + (int)uVar17);
            auVar374._0_2_ = (undefined2)uVar17;
            if (upsample_left == 0) {
              auVar185 = *(undefined1 (*) [16])(left + (long)(int)uVar17 + 1);
              auVar375._2_2_ = auVar374._0_2_;
              auVar375._0_2_ = auVar374._0_2_;
              auVar375._4_2_ = auVar374._0_2_;
              auVar375._6_2_ = auVar374._0_2_;
              auVar375._8_2_ = auVar374._0_2_;
              auVar375._10_2_ = auVar374._0_2_;
              auVar375._12_2_ = auVar374._0_2_;
              auVar375._14_2_ = auVar374._0_2_;
              auVar278 = vpaddw_avx(auVar375,ZEXT816(0x7000600050004));
              auVar310 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 1,1);
              auVar310 = vpinsrw_avx(auVar310,uVar17 + 2,2);
              auVar310 = vpinsrw_avx(auVar310,uVar17 + 3,3);
              auVar278 = vpunpcklqdq_avx(auVar310,auVar278);
              uVar6 = (ushort)(uVar13 >> 1);
              uVar116 = uVar6 & 0x1f;
              auVar376._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar376._8_2_ = uVar116;
              auVar376._10_2_ = uVar116;
              auVar376._12_2_ = uVar116;
              auVar376._14_2_ = uVar116;
            }
            else {
              auVar277 = vpshufb_avx(auVar277,_DAT_00d475e0);
              auVar185 = vpsrldq_avx(auVar277,8);
              auVar374._2_2_ = auVar374._0_2_;
              auVar374._4_2_ = auVar374._0_2_;
              auVar374._6_2_ = auVar374._0_2_;
              auVar374._8_2_ = auVar374._0_2_;
              auVar374._10_2_ = auVar374._0_2_;
              auVar374._12_2_ = auVar374._0_2_;
              auVar374._14_2_ = auVar374._0_2_;
              auVar278 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 2,1);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 4,2);
              auVar310 = vpinsrw_avx(auVar278,uVar17 + 6,3);
              auVar278 = vpaddw_avx(auVar374,ZEXT816(0xe000c000a0008));
              auVar278 = vpunpcklqdq_avx(auVar310,auVar278);
              auVar380._0_2_ = (undefined2)uVar13;
              auVar380._2_2_ = auVar380._0_2_;
              auVar380._4_2_ = auVar380._0_2_;
              auVar380._6_2_ = auVar380._0_2_;
              auVar380._8_2_ = auVar380._0_2_;
              auVar380._10_2_ = auVar380._0_2_;
              auVar380._12_2_ = auVar380._0_2_;
              auVar380._14_2_ = auVar380._0_2_;
              auVar380._16_2_ = auVar380._0_2_;
              auVar380._18_2_ = auVar380._0_2_;
              auVar380._20_2_ = auVar380._0_2_;
              auVar380._22_2_ = auVar380._0_2_;
              auVar380._24_2_ = auVar380._0_2_;
              auVar380._26_2_ = auVar380._0_2_;
              auVar380._28_2_ = auVar380._0_2_;
              auVar380._30_2_ = auVar380._0_2_;
              auVar154 = vpsllw_avx2(auVar380,ZEXT416((uint)upsample_left));
              auVar154 = vpsrlw_avx2(auVar154,1);
              auVar154 = vpand_avx2(auVar154,auVar201);
              auVar376 = auVar154._0_16_;
            }
            auVar278 = vpcmpgtw_avx(auVar63,auVar278);
            auVar185 = vpsubw_avx(auVar185,auVar277);
            auVar185 = vpmullw_avx(auVar185,auVar376);
            auVar277 = vpsllw_avx(auVar277,5);
            auVar277 = vpaddw_avx(auVar277,auVar91);
            auVar277 = vpaddw_avx(auVar185,auVar277);
            auVar277 = vpsrlw_avx(auVar277,5);
            auVar277 = vpblendvb_avx(auVar31,auVar277,auVar278);
            *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar277;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [16])(local_2060 + lVar24) = auVar31;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 != 0x100);
          }
          if (iVar14 <= (int)uVar17) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar19 != 0x10);
      }
      else {
        auVar66._4_4_ = iVar14;
        auVar66._0_4_ = iVar14;
        auVar66._8_4_ = iVar14;
        auVar66._12_4_ = iVar14;
        lVar9 = 0;
        auVar94._8_4_ = 0x10;
        auVar94._0_8_ = 0x1000000010;
        auVar94._12_4_ = 0x10;
        auVar133._8_4_ = 0x1f;
        auVar133._0_8_ = 0x1f0000001f;
        auVar133._12_4_ = 0x1f;
        auVar133._16_4_ = 0x1f;
        auVar133._20_4_ = 0x1f;
        auVar133._24_4_ = 0x1f;
        auVar133._28_4_ = 0x1f;
        lVar19 = 0;
        uVar13 = dy;
        do {
          uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
          lVar24 = lVar9;
          if ((int)uVar17 < iVar14) {
            auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar17));
            auVar277 = auVar154._0_16_;
            if (upsample_left == 0) {
              auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 1));
              auVar278 = auVar154._0_16_;
              auVar185 = vpinsrd_avx(ZEXT416(uVar17),uVar17 + 1,1);
              auVar185 = vpinsrd_avx(auVar185,uVar17 + 2,2);
              auVar185 = vpinsrd_avx(auVar185,uVar17 + 3,3);
              uVar18 = uVar13 >> 1;
              auVar280._0_8_ = CONCAT44(uVar18,uVar18) & 0x1f0000001f;
              auVar280._8_4_ = uVar18 & 0x1f;
              auVar280._12_4_ = uVar18 & 0x1f;
            }
            else {
              auVar154 = vpshufd_avx2(auVar154,0xd8);
              auVar154 = vpermq_avx2(auVar154,0xd8);
              auVar277 = auVar154._0_16_;
              auVar278 = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar154._16_16_;
              auVar185 = vpinsrd_avx(ZEXT416(uVar17),uVar17 + 2,1);
              auVar185 = vpinsrd_avx(auVar185,uVar17 + 4,2);
              auVar185 = vpinsrd_avx(auVar185,uVar17 + 6,3);
              auVar305._4_4_ = uVar13;
              auVar305._0_4_ = uVar13;
              auVar305._8_4_ = uVar13;
              auVar305._12_4_ = uVar13;
              auVar305._16_4_ = uVar13;
              auVar305._20_4_ = uVar13;
              auVar305._24_4_ = uVar13;
              auVar305._28_4_ = uVar13;
              auVar154 = vpslld_avx2(auVar305,ZEXT416((uint)upsample_left));
              auVar154 = vpsrld_avx2(auVar154,1);
              auVar154 = vpand_avx2(auVar154,auVar133);
              auVar280 = auVar154._0_16_;
            }
            auVar310 = vpcmpgtd_avx(auVar66,auVar185);
            auVar185 = vpsubd_avx(auVar278,auVar277);
            auVar185 = vpmulld_avx(auVar185,auVar280);
            auVar277 = vpslld_avx(auVar277,5);
            auVar277 = vpaddd_avx(auVar277,auVar94);
            auVar277 = vpaddd_avx(auVar185,auVar277);
            auVar277 = vpsrld_avx(auVar277,5);
            auVar185 = vpackusdw_avx(auVar277,auVar277);
            auVar277 = vpackssdw_avx(auVar310,auVar310);
            auVar277 = vpblendvb_avx(auVar31,auVar185,auVar277);
            *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar277;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [16])(local_2060 + lVar24) = auVar31;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 != 0x100);
          }
          if (iVar14 <= (int)uVar17) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar19 != 0x10);
      }
      auVar277 = vpunpcklwd_avx(local_2060._0_16_,local_2060._16_16_);
      auVar185 = vpunpcklwd_avx(local_2040._0_16_,local_2040._16_16_);
      auVar278 = vpunpcklwd_avx(local_2020._0_16_,local_2020._16_16_);
      auVar310 = vpunpcklwd_avx(local_2000._0_16_,local_2000._16_16_);
      auVar354 = vpunpcklwd_avx(local_1fe0._0_16_,local_1fe0._16_16_);
      auVar279 = vpunpcklwd_avx(local_1fc0._0_16_,local_1fc0._16_16_);
      auVar170 = vpunpcklwd_avx(local_1fa0._0_16_,local_1fa0._16_16_);
      auVar378 = vpunpcklwd_avx(local_1f80._0_16_,local_1f80._16_16_);
      auVar377 = vpunpckldq_avx(auVar277,auVar185);
      auVar277 = vpunpckhdq_avx(auVar277,auVar185);
      auVar29 = vpunpckldq_avx(auVar278,auVar310);
      auVar185 = vpunpckhdq_avx(auVar278,auVar310);
      auVar311 = vpunpckldq_avx(auVar354,auVar279);
      auVar278 = vpunpckhdq_avx(auVar354,auVar279);
      auVar279 = vpunpckldq_avx(auVar170,auVar378);
      auVar310 = vpunpckhdq_avx(auVar170,auVar378);
      auVar170 = vpunpcklqdq_avx(auVar377,auVar29);
      auVar378 = vpunpcklqdq_avx(auVar311,auVar279);
      auVar354 = vpunpckhqdq_avx(auVar377,auVar29);
      auVar279 = vpunpckhqdq_avx(auVar311,auVar279);
      auVar377 = vpunpcklqdq_avx(auVar277,auVar185);
      auVar29 = vpunpcklqdq_avx(auVar278,auVar310);
      auVar277 = vpunpckhqdq_avx(auVar277,auVar185);
      auVar185 = vpunpckhqdq_avx(auVar278,auVar310);
      *(undefined1 (*) [16])dst = auVar170;
      *(undefined1 (*) [16])(dst + 8) = auVar378;
      *(undefined1 (*) [16])(dst + stride) = auVar354;
      *(undefined1 (*) [16])(dst + stride + 8) = auVar279;
      *(undefined1 (*) [16])(dst + stride * 2) = auVar377;
      *(undefined1 (*) [16])(dst + stride * 2 + 8) = auVar29;
      *(undefined1 (*) [16])(dst + stride * 3) = auVar277;
      *(undefined1 (*) [16])(dst + stride * 3 + 8) = auVar185;
      return;
    }
    switch(bh << 0x1e | bh - 4U >> 2) {
    case 0:
      iVar14 = 0xb << (bVar11 & 0x1f);
      uVar4 = left[iVar14];
      auVar28._2_2_ = uVar4;
      auVar28._0_2_ = uVar4;
      auVar28._4_2_ = uVar4;
      auVar28._6_2_ = uVar4;
      auVar28._8_2_ = uVar4;
      auVar28._10_2_ = uVar4;
      auVar28._12_2_ = uVar4;
      auVar28._14_2_ = uVar4;
      if (bd < 0xc) {
        auVar61._0_2_ = (undefined2)iVar14;
        auVar61._2_2_ = auVar61._0_2_;
        auVar61._4_2_ = auVar61._0_2_;
        auVar61._6_2_ = auVar61._0_2_;
        auVar61._8_2_ = auVar61._0_2_;
        auVar61._10_2_ = auVar61._0_2_;
        auVar61._12_2_ = auVar61._0_2_;
        auVar61._14_2_ = auVar61._0_2_;
        lVar9 = 0;
        auVar89._8_2_ = 0x10;
        auVar89._0_8_ = 0x10001000100010;
        auVar89._10_2_ = 0x10;
        auVar89._12_2_ = 0x10;
        auVar89._14_2_ = 0x10;
        auVar193._8_2_ = 0x1f;
        auVar193._0_8_ = 0x1f001f001f001f;
        auVar193._10_2_ = 0x1f;
        auVar193._12_2_ = 0x1f;
        auVar193._14_2_ = 0x1f;
        auVar193._16_2_ = 0x1f;
        auVar193._18_2_ = 0x1f;
        auVar193._20_2_ = 0x1f;
        auVar193._22_2_ = 0x1f;
        auVar193._24_2_ = 0x1f;
        auVar193._26_2_ = 0x1f;
        auVar193._28_2_ = 0x1f;
        auVar193._30_2_ = 0x1f;
        lVar19 = 0;
        uVar13 = dy;
        do {
          uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
          lVar24 = lVar9;
          if ((int)uVar17 < iVar14) {
            auVar277 = *(undefined1 (*) [16])(left + (int)uVar17);
            auVar371._0_2_ = (undefined2)uVar17;
            if (upsample_left == 0) {
              auVar185 = *(undefined1 (*) [16])(left + (long)(int)uVar17 + 1);
              auVar372._2_2_ = auVar371._0_2_;
              auVar372._0_2_ = auVar371._0_2_;
              auVar372._4_2_ = auVar371._0_2_;
              auVar372._6_2_ = auVar371._0_2_;
              auVar372._8_2_ = auVar371._0_2_;
              auVar372._10_2_ = auVar371._0_2_;
              auVar372._12_2_ = auVar371._0_2_;
              auVar372._14_2_ = auVar371._0_2_;
              auVar278 = vpaddw_avx(auVar372,ZEXT816(0x7000600050004));
              auVar310 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 1,1);
              auVar310 = vpinsrw_avx(auVar310,uVar17 + 2,2);
              auVar310 = vpinsrw_avx(auVar310,uVar17 + 3,3);
              auVar278 = vpunpcklqdq_avx(auVar310,auVar278);
              uVar6 = (ushort)(uVar13 >> 1);
              uVar116 = uVar6 & 0x1f;
              auVar373._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar373._8_2_ = uVar116;
              auVar373._10_2_ = uVar116;
              auVar373._12_2_ = uVar116;
              auVar373._14_2_ = uVar116;
            }
            else {
              auVar277 = vpshufb_avx(auVar277,_DAT_00d475e0);
              auVar185 = vpsrldq_avx(auVar277,8);
              auVar371._2_2_ = auVar371._0_2_;
              auVar371._4_2_ = auVar371._0_2_;
              auVar371._6_2_ = auVar371._0_2_;
              auVar371._8_2_ = auVar371._0_2_;
              auVar371._10_2_ = auVar371._0_2_;
              auVar371._12_2_ = auVar371._0_2_;
              auVar371._14_2_ = auVar371._0_2_;
              auVar278 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 2,1);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 4,2);
              auVar310 = vpinsrw_avx(auVar278,uVar17 + 6,3);
              auVar278 = vpaddw_avx(auVar371,ZEXT816(0xe000c000a0008));
              auVar278 = vpunpcklqdq_avx(auVar310,auVar278);
              auVar379._0_2_ = (undefined2)uVar13;
              auVar379._2_2_ = auVar379._0_2_;
              auVar379._4_2_ = auVar379._0_2_;
              auVar379._6_2_ = auVar379._0_2_;
              auVar379._8_2_ = auVar379._0_2_;
              auVar379._10_2_ = auVar379._0_2_;
              auVar379._12_2_ = auVar379._0_2_;
              auVar379._14_2_ = auVar379._0_2_;
              auVar379._16_2_ = auVar379._0_2_;
              auVar379._18_2_ = auVar379._0_2_;
              auVar379._20_2_ = auVar379._0_2_;
              auVar379._22_2_ = auVar379._0_2_;
              auVar379._24_2_ = auVar379._0_2_;
              auVar379._26_2_ = auVar379._0_2_;
              auVar379._28_2_ = auVar379._0_2_;
              auVar379._30_2_ = auVar379._0_2_;
              auVar154 = vpsllw_avx2(auVar379,ZEXT416((uint)upsample_left));
              auVar154 = vpsrlw_avx2(auVar154,1);
              auVar154 = vpand_avx2(auVar154,auVar193);
              auVar373 = auVar154._0_16_;
            }
            auVar278 = vpcmpgtw_avx(auVar61,auVar278);
            auVar185 = vpsubw_avx(auVar185,auVar277);
            auVar185 = vpmullw_avx(auVar185,auVar373);
            auVar277 = vpsllw_avx(auVar277,5);
            auVar277 = vpaddw_avx(auVar277,auVar89);
            auVar277 = vpaddw_avx(auVar185,auVar277);
            auVar277 = vpsrlw_avx(auVar277,5);
            auVar277 = vpblendvb_avx(auVar28,auVar277,auVar278);
            *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar277;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [16])(local_2060 + lVar24) = auVar28;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 != 0x80);
          }
          if (iVar14 <= (int)uVar17) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar19 != 8);
      }
      else {
        auVar67._4_4_ = iVar14;
        auVar67._0_4_ = iVar14;
        auVar67._8_4_ = iVar14;
        auVar67._12_4_ = iVar14;
        lVar9 = 0;
        auVar95._8_4_ = 0x10;
        auVar95._0_8_ = 0x1000000010;
        auVar95._12_4_ = 0x10;
        auVar137._8_4_ = 0x1f;
        auVar137._0_8_ = 0x1f0000001f;
        auVar137._12_4_ = 0x1f;
        auVar137._16_4_ = 0x1f;
        auVar137._20_4_ = 0x1f;
        auVar137._24_4_ = 0x1f;
        auVar137._28_4_ = 0x1f;
        lVar19 = 0;
        uVar13 = dy;
        do {
          uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
          lVar24 = lVar9;
          if ((int)uVar17 < iVar14) {
            auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar17));
            auVar277 = auVar154._0_16_;
            if (upsample_left == 0) {
              auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 1));
              auVar278 = auVar154._0_16_;
              auVar185 = vpinsrd_avx(ZEXT416(uVar17),uVar17 + 1,1);
              auVar185 = vpinsrd_avx(auVar185,uVar17 + 2,2);
              auVar185 = vpinsrd_avx(auVar185,uVar17 + 3,3);
              uVar18 = uVar13 >> 1;
              auVar281._0_8_ = CONCAT44(uVar18,uVar18) & 0x1f0000001f;
              auVar281._8_4_ = uVar18 & 0x1f;
              auVar281._12_4_ = uVar18 & 0x1f;
            }
            else {
              auVar154 = vpshufd_avx2(auVar154,0xd8);
              auVar154 = vpermq_avx2(auVar154,0xd8);
              auVar277 = auVar154._0_16_;
              auVar278 = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar154._16_16_;
              auVar185 = vpinsrd_avx(ZEXT416(uVar17),uVar17 + 2,1);
              auVar185 = vpinsrd_avx(auVar185,uVar17 + 4,2);
              auVar185 = vpinsrd_avx(auVar185,uVar17 + 6,3);
              auVar307._4_4_ = uVar13;
              auVar307._0_4_ = uVar13;
              auVar307._8_4_ = uVar13;
              auVar307._12_4_ = uVar13;
              auVar307._16_4_ = uVar13;
              auVar307._20_4_ = uVar13;
              auVar307._24_4_ = uVar13;
              auVar307._28_4_ = uVar13;
              auVar154 = vpslld_avx2(auVar307,ZEXT416((uint)upsample_left));
              auVar154 = vpsrld_avx2(auVar154,1);
              auVar154 = vpand_avx2(auVar154,auVar137);
              auVar281 = auVar154._0_16_;
            }
            auVar310 = vpcmpgtd_avx(auVar67,auVar185);
            auVar185 = vpsubd_avx(auVar278,auVar277);
            auVar185 = vpmulld_avx(auVar185,auVar281);
            auVar277 = vpslld_avx(auVar277,5);
            auVar277 = vpaddd_avx(auVar277,auVar95);
            auVar277 = vpaddd_avx(auVar185,auVar277);
            auVar277 = vpsrld_avx(auVar277,5);
            auVar185 = vpackusdw_avx(auVar277,auVar277);
            auVar277 = vpackssdw_avx(auVar310,auVar310);
            auVar277 = vpblendvb_avx(auVar28,auVar185,auVar277);
            *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar277;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [16])(local_2060 + lVar24) = auVar28;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 != 0x80);
          }
          if (iVar14 <= (int)uVar17) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar19 != 8);
      }
      auVar277 = vpunpcklwd_avx(local_2060._0_16_,local_2060._16_16_);
      auVar185 = vpunpcklwd_avx(local_2040._0_16_,local_2040._16_16_);
      auVar310 = vpunpcklwd_avx(local_2020._0_16_,local_2020._16_16_);
      auVar354 = vpunpcklwd_avx(local_2000._0_16_,local_2000._16_16_);
      auVar278 = vpunpckldq_avx(auVar277,auVar185);
      auVar279 = vpunpckldq_avx(auVar310,auVar354);
      auVar170 = vpunpcklqdq_avx(auVar278,auVar279);
      auVar278 = vpunpckhqdq_avx(auVar278,auVar279);
      auVar277 = vpunpckhdq_avx(auVar277,auVar185);
      auVar185 = vpunpckhdq_avx(auVar310,auVar354);
      auVar310 = vpunpcklqdq_avx(auVar277,auVar185);
      auVar277 = vpunpckhqdq_avx(auVar277,auVar185);
      *(undefined1 (*) [16])dst = auVar170;
      *(undefined1 (*) [16])(dst + stride) = auVar278;
      *(undefined1 (*) [16])(dst + stride * 2) = auVar310;
      *(undefined1 (*) [16])(dst + stride * 3) = auVar277;
      break;
    case 1:
      iVar14 = 0x17 << (bVar11 & 0x1f);
      uVar4 = left[iVar14];
      auVar40._2_2_ = uVar4;
      auVar40._0_2_ = uVar4;
      auVar40._4_2_ = uVar4;
      auVar40._6_2_ = uVar4;
      auVar40._8_2_ = uVar4;
      auVar40._10_2_ = uVar4;
      auVar40._12_2_ = uVar4;
      auVar40._14_2_ = uVar4;
      auVar57._16_2_ = uVar4;
      auVar57._0_16_ = auVar40;
      auVar57._18_2_ = uVar4;
      auVar57._20_2_ = uVar4;
      auVar57._22_2_ = uVar4;
      auVar57._24_2_ = uVar4;
      auVar57._26_2_ = uVar4;
      auVar57._28_2_ = uVar4;
      auVar57._30_2_ = uVar4;
      if (bd < 0xc) {
        auVar65._0_2_ = (undefined2)iVar14;
        auVar65._2_2_ = auVar65._0_2_;
        auVar65._4_2_ = auVar65._0_2_;
        auVar65._6_2_ = auVar65._0_2_;
        auVar65._8_2_ = auVar65._0_2_;
        auVar65._10_2_ = auVar65._0_2_;
        auVar65._12_2_ = auVar65._0_2_;
        auVar65._14_2_ = auVar65._0_2_;
        lVar9 = 0;
        auVar93._8_2_ = 0x10;
        auVar93._0_8_ = 0x10001000100010;
        auVar93._10_2_ = 0x10;
        auVar93._12_2_ = 0x10;
        auVar93._14_2_ = 0x10;
        auVar162._8_2_ = 0x1f;
        auVar162._0_8_ = 0x1f001f001f001f;
        auVar162._10_2_ = 0x1f;
        auVar162._12_2_ = 0x1f;
        auVar162._14_2_ = 0x1f;
        auVar162._16_2_ = 0x1f;
        auVar162._18_2_ = 0x1f;
        auVar162._20_2_ = 0x1f;
        auVar162._22_2_ = 0x1f;
        auVar162._24_2_ = 0x1f;
        auVar162._26_2_ = 0x1f;
        auVar162._28_2_ = 0x1f;
        auVar162._30_2_ = 0x1f;
        lVar19 = 0;
        uVar13 = dy;
        do {
          uVar17 = (int)uVar13 >> (6 - bVar11 & 0x1f);
          lVar24 = lVar9;
          if ((int)uVar17 < iVar14) {
            auVar277 = *(undefined1 (*) [16])(left + (int)uVar17);
            if (upsample_left == 0) {
              auVar185 = *(undefined1 (*) [16])(left + (long)(int)uVar17 + 1);
              auVar278 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 1,1);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 2,2);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 3,3);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 4,4);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 5,5);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 6,6);
              auVar278 = vpinsrw_avx(auVar278,uVar17 + 7,7);
              uVar6 = (ushort)(uVar13 >> 1);
              uVar116 = uVar6 & 0x1f;
              auVar313._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar313._8_2_ = uVar116;
              auVar313._10_2_ = uVar116;
              auVar313._12_2_ = uVar116;
              auVar313._14_2_ = uVar116;
            }
            else {
              auVar185 = vpblendw_avx(auVar277,(undefined1  [16])0x0,0xaa);
              auVar278 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8),
                                      (undefined1  [16])0x0,0xaa);
              auVar354 = vpsrld_avx(auVar277,0x10);
              auVar277 = vpackusdw_avx(auVar185,auVar278);
              auVar310 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar17 + 8),0x10);
              auVar185 = vpinsrw_avx(ZEXT416(uVar17),uVar17 + 2,1);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 4,2);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 6,3);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 8,4);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 10,5);
              auVar185 = vpinsrw_avx(auVar185,uVar17 + 0xc,6);
              auVar278 = vpinsrw_avx(auVar185,uVar17 + 0xe,7);
              auVar330._0_2_ = (undefined2)uVar13;
              auVar330._2_2_ = auVar330._0_2_;
              auVar330._4_2_ = auVar330._0_2_;
              auVar330._6_2_ = auVar330._0_2_;
              auVar330._8_2_ = auVar330._0_2_;
              auVar330._10_2_ = auVar330._0_2_;
              auVar330._12_2_ = auVar330._0_2_;
              auVar330._14_2_ = auVar330._0_2_;
              auVar330._16_2_ = auVar330._0_2_;
              auVar330._18_2_ = auVar330._0_2_;
              auVar330._20_2_ = auVar330._0_2_;
              auVar330._22_2_ = auVar330._0_2_;
              auVar330._24_2_ = auVar330._0_2_;
              auVar330._26_2_ = auVar330._0_2_;
              auVar330._28_2_ = auVar330._0_2_;
              auVar330._30_2_ = auVar330._0_2_;
              auVar154 = vpsllw_avx2(auVar330,ZEXT416((uint)upsample_left));
              auVar185 = vpackusdw_avx(auVar354,auVar310);
              auVar154 = vpsrlw_avx2(auVar154,1);
              auVar154 = vpand_avx2(auVar154,auVar162);
              auVar313 = auVar154._0_16_;
            }
            auVar310 = vpsllw_avx(auVar277,5);
            auVar310 = vpaddw_avx(auVar310,auVar93);
            auVar277 = vpsubw_avx(auVar185,auVar277);
            auVar277 = vpmullw_avx(auVar313,auVar277);
            auVar277 = vpaddw_avx(auVar310,auVar277);
            auVar185 = vpsrlw_avx(auVar277,5);
            auVar277 = vpcmpgtw_avx(auVar65,auVar278);
            auVar277 = vpblendvb_avx(auVar40,auVar185,auVar277);
            *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar277;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [16])(local_2060 + lVar24) = auVar40;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 != 0x100);
          }
          if (iVar14 <= (int)uVar17) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar19 != 0x10);
      }
      else {
        auVar87._4_4_ = iVar14;
        auVar87._0_4_ = iVar14;
        auVar87._8_4_ = iVar14;
        auVar87._12_4_ = iVar14;
        auVar87._16_4_ = iVar14;
        auVar87._20_4_ = iVar14;
        auVar87._24_4_ = iVar14;
        auVar87._28_4_ = iVar14;
        lVar9 = 0;
        auVar277 = vpmovsxbd_avx(ZEXT416(0x3020104));
        auVar115._8_4_ = 0x10;
        auVar115._0_8_ = 0x1000000010;
        auVar115._12_4_ = 0x10;
        auVar115._16_4_ = 0x10;
        auVar115._20_4_ = 0x10;
        auVar115._24_4_ = 0x10;
        auVar115._28_4_ = 0x10;
        auVar185 = vpmovsxbd_avx(ZEXT416(0x6040208));
        auVar184._8_4_ = 0x1f;
        auVar184._0_8_ = 0x1f0000001f;
        auVar184._12_4_ = 0x1f;
        auVar184._16_4_ = 0x1f;
        auVar184._20_4_ = 0x1f;
        auVar184._24_4_ = 0x1f;
        auVar184._28_4_ = 0x1f;
        lVar19 = 0;
        uVar13 = dy;
        do {
          iVar23 = (int)uVar13 >> (6 - bVar11 & 0x1f);
          lVar24 = lVar9;
          if (iVar23 < iVar14) {
            auVar276 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar23));
            if (upsample_left == 0) {
              auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 1));
              auVar316._4_4_ = iVar23;
              auVar316._0_4_ = iVar23;
              auVar316._8_4_ = iVar23;
              auVar316._12_4_ = iVar23;
              iVar1 = iVar23 + 5;
              iVar2 = iVar23 + 6;
              iVar3 = iVar23 + 7;
              auVar278 = vpaddd_avx(auVar316,auVar277);
              auVar155 = vpermq_avx2(ZEXT1632(auVar278),0xc4);
              auVar155 = vpblendd_avx2(auVar155,ZEXT1632(auVar316),1);
              auVar367._4_4_ = iVar1;
              auVar367._0_4_ = iVar1;
              auVar367._8_4_ = iVar1;
              auVar367._12_4_ = iVar1;
              auVar367._16_4_ = iVar1;
              auVar367._20_4_ = iVar1;
              auVar367._24_4_ = iVar1;
              auVar367._28_4_ = iVar1;
              auVar155 = vpblendd_avx2(auVar155,auVar367,0x20);
              auVar368._4_4_ = iVar2;
              auVar368._0_4_ = iVar2;
              auVar368._8_4_ = iVar2;
              auVar368._12_4_ = iVar2;
              auVar368._16_4_ = iVar2;
              auVar368._20_4_ = iVar2;
              auVar368._24_4_ = iVar2;
              auVar368._28_4_ = iVar2;
              auVar155 = vpblendd_avx2(auVar155,auVar368,0x40);
              auVar369._4_4_ = iVar3;
              auVar369._0_4_ = iVar3;
              auVar369._8_4_ = iVar3;
              auVar369._12_4_ = iVar3;
              auVar369._16_4_ = iVar3;
              auVar369._20_4_ = iVar3;
              auVar369._24_4_ = iVar3;
              auVar369._28_4_ = iVar3;
              auVar155 = vpblendd_avx2(auVar155,auVar369,0x80);
              uVar17 = uVar13 >> 1;
              uVar18 = uVar17 & 0x1f;
              auVar370._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f0000001f;
              auVar370._8_4_ = uVar18;
              auVar370._12_4_ = uVar18;
              auVar370._16_4_ = uVar18;
              auVar370._20_4_ = uVar18;
              auVar370._24_4_ = uVar18;
              auVar370._28_4_ = uVar18;
            }
            else {
              auVar155 = vpshufd_avx2(auVar276,0xd8);
              auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar23 + 8));
              auVar210 = vpermq_avx2(auVar155,0xd8);
              auVar154 = vpshufd_avx2(auVar154,0xd8);
              auVar381 = vpermq_avx2(auVar154,0xd8);
              auVar192._4_4_ = iVar23;
              auVar192._0_4_ = iVar23;
              auVar192._8_4_ = iVar23;
              auVar192._12_4_ = iVar23;
              iVar1 = iVar23 + 10;
              iVar2 = iVar23 + 0xc;
              iVar3 = iVar23 + 0xe;
              auVar278 = vpaddd_avx(auVar192,auVar185);
              auVar154 = vpermq_avx2(ZEXT1632(auVar278),0xc4);
              auVar154 = vpblendd_avx2(auVar154,ZEXT1632(auVar192),1);
              auVar351._4_4_ = iVar1;
              auVar351._0_4_ = iVar1;
              auVar351._8_4_ = iVar1;
              auVar351._12_4_ = iVar1;
              auVar351._16_4_ = iVar1;
              auVar351._20_4_ = iVar1;
              auVar351._24_4_ = iVar1;
              auVar351._28_4_ = iVar1;
              auVar154 = vpblendd_avx2(auVar154,auVar351,0x20);
              auVar352._4_4_ = iVar2;
              auVar352._0_4_ = iVar2;
              auVar352._8_4_ = iVar2;
              auVar352._12_4_ = iVar2;
              auVar352._16_4_ = iVar2;
              auVar352._20_4_ = iVar2;
              auVar352._24_4_ = iVar2;
              auVar352._28_4_ = iVar2;
              auVar154 = vpblendd_avx2(auVar154,auVar352,0x40);
              auVar353._4_4_ = iVar3;
              auVar353._0_4_ = iVar3;
              auVar353._8_4_ = iVar3;
              auVar353._12_4_ = iVar3;
              auVar353._16_4_ = iVar3;
              auVar353._20_4_ = iVar3;
              auVar353._24_4_ = iVar3;
              auVar353._28_4_ = iVar3;
              auVar155 = vpblendd_avx2(auVar154,auVar353,0x80);
              auVar275._4_4_ = uVar13;
              auVar275._0_4_ = uVar13;
              auVar275._8_4_ = uVar13;
              auVar275._12_4_ = uVar13;
              auVar275._16_4_ = uVar13;
              auVar275._20_4_ = uVar13;
              auVar275._24_4_ = uVar13;
              auVar275._28_4_ = uVar13;
              auVar154 = vpslld_avx2(auVar275,ZEXT416((uint)upsample_left));
              auVar276._0_16_ = ZEXT116(0) * auVar381._0_16_ + ZEXT116(1) * auVar210._0_16_;
              auVar276._16_16_ = ZEXT116(0) * auVar210._16_16_ + ZEXT116(1) * auVar381._0_16_;
              auVar154 = vpsrld_avx2(auVar154,1);
              auVar370 = vpand_avx2(auVar154,auVar184);
              auVar154 = vperm2i128_avx2(auVar210,auVar381,0x31);
            }
            auVar155 = vpcmpgtd_avx2(auVar87,auVar155);
            auVar154 = vpsubd_avx2(auVar154,auVar276);
            auVar210 = vpmulld_avx2(auVar154,auVar370);
            auVar154 = vpslld_avx2(auVar276,5);
            auVar154 = vpaddd_avx2(auVar154,auVar115);
            auVar154 = vpaddd_avx2(auVar210,auVar154);
            auVar154 = vpsrld_avx2(auVar154,5);
            auVar310 = vpackusdw_avx(auVar154._0_16_,auVar154._16_16_);
            auVar278 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
            auVar154 = vpblendvb_avx2(auVar57,ZEXT1632(auVar310),ZEXT1632(auVar278));
            *(undefined1 (*) [16])(local_2060 + lVar19 * 0x10) = auVar154._0_16_;
            uVar13 = uVar13 + dy;
          }
          else {
            do {
              *(undefined1 (*) [16])(local_2060 + lVar24) = auVar40;
              lVar24 = lVar24 + 0x10;
            } while (lVar24 != 0x100);
          }
          if (iVar14 <= iVar23) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar19 != 0x10);
      }
      lVar9 = 0x70;
      do {
        auVar185 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_20d0 + lVar9),
                                  *(undefined1 (*) [16])(auStack_20c0 + lVar9));
        auVar278 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_20b0 + lVar9),
                                  *(undefined1 (*) [16])(auStack_20a0 + lVar9));
        auVar310 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_2090 + lVar9),
                                  *(undefined1 (*) [16])(auStack_2080 + lVar9));
        auVar354 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_2070 + lVar9),
                                  *(undefined1 (*) [16])(local_2060 + lVar9));
        auVar277 = vpunpckldq_avx(auVar185,auVar278);
        auVar279 = vpunpckldq_avx(auVar310,auVar354);
        auVar170 = vpunpcklqdq_avx(auVar277,auVar279);
        *(undefined1 (*) [16])(auStackY_26d0 + lVar9) = auVar170;
        auVar277 = vpunpckhqdq_avx(auVar277,auVar279);
        *(undefined1 (*) [16])(auStackY_26c0 + lVar9) = auVar277;
        auVar277 = vpunpckhdq_avx(auVar185,auVar278);
        auVar185 = vpunpckhdq_avx(auVar310,auVar354);
        auVar278 = vpunpcklqdq_avx(auVar277,auVar185);
        *(undefined1 (*) [16])(auStackY_26b0 + lVar9) = auVar278;
        auVar277 = vpunpckhqdq_avx(auVar277,auVar185);
        *(undefined1 (*) [16])(auStackY_26a0 + lVar9) = auVar277;
        auVar277 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_20d0 + lVar9),
                                  *(undefined1 (*) [16])(auStack_20c0 + lVar9));
        auVar185 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_20b0 + lVar9),
                                  *(undefined1 (*) [16])(auStack_20a0 + lVar9));
        auVar278 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_2090 + lVar9),
                                  *(undefined1 (*) [16])(auStack_2080 + lVar9));
        auVar310 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_2070 + lVar9),
                                  *(undefined1 (*) [16])(local_2060 + lVar9));
        auVar354 = vpunpckldq_avx(auVar277,auVar185);
        auVar279 = vpunpckldq_avx(auVar278,auVar310);
        auVar170 = vpunpcklqdq_avx(auVar354,auVar279);
        *(undefined1 (*) [16])(auStackY_2690 + lVar9) = auVar170;
        auVar354 = vpunpckhqdq_avx(auVar354,auVar279);
        *(undefined1 (*) [16])(local_2660 + lVar9 + -0x20) = auVar354;
        auVar277 = vpunpckhdq_avx(auVar277,auVar185);
        auVar185 = vpunpckhdq_avx(auVar278,auVar310);
        auVar278 = vpunpcklqdq_avx(auVar277,auVar185);
        *(undefined1 (*) [16])((long)&local_2670 + lVar9) = auVar278;
        auVar277 = vpunpckhqdq_avx(auVar277,auVar185);
        *(undefined1 (*) [16])(local_2660 + lVar9) = auVar277;
        lVar9 = lVar9 + 0x80;
      } while (lVar9 == 0xf0);
      puVar10 = dst + 8;
      lVar9 = 0x80;
      do {
        uVar5 = *(undefined8 *)((long)auStackY_26e0 + lVar9 + 8);
        *(undefined8 *)(puVar10 + -8) = *(undefined8 *)((long)auStackY_26e0 + lVar9);
        *(undefined8 *)(puVar10 + -4) = uVar5;
        uVar5 = *(undefined8 *)(local_2660 + lVar9 + 8);
        *(undefined8 *)puVar10 = *(undefined8 *)(local_2660 + lVar9);
        *(undefined8 *)(puVar10 + 4) = uVar5;
        lVar9 = lVar9 + 0x10;
        puVar10 = puVar10 + stride;
      } while (lVar9 != 0x100);
      break;
    case 3:
      uVar4 = left[0x2f];
      auVar38._2_2_ = uVar4;
      auVar38._0_2_ = uVar4;
      auVar38._4_2_ = uVar4;
      auVar38._6_2_ = uVar4;
      auVar38._8_2_ = uVar4;
      auVar38._10_2_ = uVar4;
      auVar38._12_2_ = uVar4;
      auVar38._14_2_ = uVar4;
      auVar55._16_2_ = uVar4;
      auVar55._0_16_ = auVar38;
      auVar55._18_2_ = uVar4;
      auVar55._20_2_ = uVar4;
      auVar55._22_2_ = uVar4;
      auVar55._24_2_ = uVar4;
      auVar55._26_2_ = uVar4;
      auVar55._28_2_ = uVar4;
      auVar55._30_2_ = uVar4;
      lVar9 = 0;
      if (bd < 0xc) {
        auVar77._8_2_ = 0x10;
        auVar77._0_8_ = 0x10001000100010;
        auVar77._10_2_ = 0x10;
        auVar77._12_2_ = 0x10;
        auVar77._14_2_ = 0x10;
        auVar77._16_2_ = 0x10;
        auVar77._18_2_ = 0x10;
        auVar77._20_2_ = 0x10;
        auVar77._22_2_ = 0x10;
        auVar77._24_2_ = 0x10;
        auVar77._26_2_ = 0x10;
        auVar77._28_2_ = 0x10;
        auVar77._30_2_ = 0x10;
        auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar105._8_2_ = 0x2e;
        auVar105._0_8_ = 0x2e002e002e002e;
        auVar105._10_2_ = 0x2e;
        auVar105._12_2_ = 0x2e;
        auVar105._14_2_ = 0x2e;
        auVar105._16_2_ = 0x2e;
        auVar105._18_2_ = 0x2e;
        auVar105._20_2_ = 0x2e;
        auVar105._22_2_ = 0x2e;
        auVar105._24_2_ = 0x2e;
        auVar105._26_2_ = 0x2e;
        auVar105._28_2_ = 0x2e;
        auVar105._30_2_ = 0x2e;
        lVar19 = 0;
        uVar12 = (ulong)(uint)dy;
        do {
          uVar13 = (int)uVar12 >> 6;
          lVar24 = lVar9;
          if ((int)uVar13 < 0x2f) {
            uVar6 = (ushort)(uVar12 >> 1);
            uVar116 = uVar6 & 0x1f;
            auVar126._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar126._8_2_ = uVar116;
            auVar126._10_2_ = uVar116;
            auVar126._12_2_ = uVar116;
            auVar126._14_2_ = uVar116;
            auVar126._16_2_ = uVar116;
            auVar126._18_2_ = uVar116;
            auVar126._20_2_ = uVar116;
            auVar126._22_2_ = uVar116;
            auVar126._24_2_ = uVar116;
            auVar126._26_2_ = uVar116;
            auVar126._28_2_ = uVar116;
            auVar126._30_2_ = uVar116;
            auVar154 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar13 + 1),
                                   *(undefined1 (*) [32])(left + (int)uVar13));
            auVar155 = vpmullw_avx2(auVar154,auVar126);
            auVar154 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar13),5);
            auVar154 = vpaddw_avx2(auVar154,auVar77);
            auVar154 = vpaddw_avx2(auVar155,auVar154);
            auVar155 = vpsrlw_avx2(auVar154,5);
            auVar144._0_2_ = (undefined2)uVar13;
            auVar144._2_2_ = auVar144._0_2_;
            auVar144._4_2_ = auVar144._0_2_;
            auVar144._6_2_ = auVar144._0_2_;
            auVar144._8_2_ = auVar144._0_2_;
            auVar144._10_2_ = auVar144._0_2_;
            auVar144._12_2_ = auVar144._0_2_;
            auVar144._14_2_ = auVar144._0_2_;
            auVar185 = vpaddw_avx(auVar144,auVar277);
            auVar278 = vpslldq_avx(auVar185,2);
            auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar13),1);
            auVar185 = vpsrldq_avx(auVar185,0xe);
            auVar160._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar38;
            auVar160._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar185;
            auVar229._0_2_ = (undefined2)(uVar13 + 9);
            auVar229._2_2_ = auVar229._0_2_;
            auVar229._4_2_ = auVar229._0_2_;
            auVar229._6_2_ = auVar229._0_2_;
            auVar229._8_2_ = auVar229._0_2_;
            auVar229._10_2_ = auVar229._0_2_;
            auVar229._12_2_ = auVar229._0_2_;
            auVar229._14_2_ = auVar229._0_2_;
            auVar229._16_2_ = auVar229._0_2_;
            auVar229._18_2_ = auVar229._0_2_;
            auVar229._20_2_ = auVar229._0_2_;
            auVar229._22_2_ = auVar229._0_2_;
            auVar229._24_2_ = auVar229._0_2_;
            auVar229._26_2_ = auVar229._0_2_;
            auVar229._28_2_ = auVar229._0_2_;
            auVar229._30_2_ = auVar229._0_2_;
            auVar154 = vpblendw_avx2(auVar160,auVar229,2);
            auVar230._0_2_ = (undefined2)(uVar13 + 10);
            auVar230._2_2_ = auVar230._0_2_;
            auVar230._4_2_ = auVar230._0_2_;
            auVar230._6_2_ = auVar230._0_2_;
            auVar230._8_2_ = auVar230._0_2_;
            auVar230._10_2_ = auVar230._0_2_;
            auVar230._12_2_ = auVar230._0_2_;
            auVar230._14_2_ = auVar230._0_2_;
            auVar230._16_2_ = auVar230._0_2_;
            auVar230._18_2_ = auVar230._0_2_;
            auVar230._20_2_ = auVar230._0_2_;
            auVar230._22_2_ = auVar230._0_2_;
            auVar230._24_2_ = auVar230._0_2_;
            auVar230._26_2_ = auVar230._0_2_;
            auVar230._28_2_ = auVar230._0_2_;
            auVar230._30_2_ = auVar230._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar230,4);
            auVar231._0_2_ = (undefined2)(uVar13 + 0xb);
            auVar231._2_2_ = auVar231._0_2_;
            auVar231._4_2_ = auVar231._0_2_;
            auVar231._6_2_ = auVar231._0_2_;
            auVar231._8_2_ = auVar231._0_2_;
            auVar231._10_2_ = auVar231._0_2_;
            auVar231._12_2_ = auVar231._0_2_;
            auVar231._14_2_ = auVar231._0_2_;
            auVar231._16_2_ = auVar231._0_2_;
            auVar231._18_2_ = auVar231._0_2_;
            auVar231._20_2_ = auVar231._0_2_;
            auVar231._22_2_ = auVar231._0_2_;
            auVar231._24_2_ = auVar231._0_2_;
            auVar231._26_2_ = auVar231._0_2_;
            auVar231._28_2_ = auVar231._0_2_;
            auVar231._30_2_ = auVar231._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar231,8);
            auVar232._0_2_ = (undefined2)(uVar13 + 0xc);
            auVar232._2_2_ = auVar232._0_2_;
            auVar232._4_2_ = auVar232._0_2_;
            auVar232._6_2_ = auVar232._0_2_;
            auVar232._8_2_ = auVar232._0_2_;
            auVar232._10_2_ = auVar232._0_2_;
            auVar232._12_2_ = auVar232._0_2_;
            auVar232._14_2_ = auVar232._0_2_;
            auVar232._16_2_ = auVar232._0_2_;
            auVar232._18_2_ = auVar232._0_2_;
            auVar232._20_2_ = auVar232._0_2_;
            auVar232._22_2_ = auVar232._0_2_;
            auVar232._24_2_ = auVar232._0_2_;
            auVar232._26_2_ = auVar232._0_2_;
            auVar232._28_2_ = auVar232._0_2_;
            auVar232._30_2_ = auVar232._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar232,0x10);
            auVar233._0_2_ = (undefined2)(uVar13 + 0xd);
            auVar233._2_2_ = auVar233._0_2_;
            auVar233._4_2_ = auVar233._0_2_;
            auVar233._6_2_ = auVar233._0_2_;
            auVar233._8_2_ = auVar233._0_2_;
            auVar233._10_2_ = auVar233._0_2_;
            auVar233._12_2_ = auVar233._0_2_;
            auVar233._14_2_ = auVar233._0_2_;
            auVar233._16_2_ = auVar233._0_2_;
            auVar233._18_2_ = auVar233._0_2_;
            auVar233._20_2_ = auVar233._0_2_;
            auVar233._22_2_ = auVar233._0_2_;
            auVar233._24_2_ = auVar233._0_2_;
            auVar233._26_2_ = auVar233._0_2_;
            auVar233._28_2_ = auVar233._0_2_;
            auVar233._30_2_ = auVar233._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar233,0x20);
            auVar234._0_2_ = (undefined2)(uVar13 + 0xe);
            auVar234._2_2_ = auVar234._0_2_;
            auVar234._4_2_ = auVar234._0_2_;
            auVar234._6_2_ = auVar234._0_2_;
            auVar234._8_2_ = auVar234._0_2_;
            auVar234._10_2_ = auVar234._0_2_;
            auVar234._12_2_ = auVar234._0_2_;
            auVar234._14_2_ = auVar234._0_2_;
            auVar234._16_2_ = auVar234._0_2_;
            auVar234._18_2_ = auVar234._0_2_;
            auVar234._20_2_ = auVar234._0_2_;
            auVar234._22_2_ = auVar234._0_2_;
            auVar234._24_2_ = auVar234._0_2_;
            auVar234._26_2_ = auVar234._0_2_;
            auVar234._28_2_ = auVar234._0_2_;
            auVar234._30_2_ = auVar234._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar234,0x40);
            auVar235._0_2_ = (undefined2)(uVar13 + 0xf);
            auVar235._2_2_ = auVar235._0_2_;
            auVar235._4_2_ = auVar235._0_2_;
            auVar235._6_2_ = auVar235._0_2_;
            auVar235._8_2_ = auVar235._0_2_;
            auVar235._10_2_ = auVar235._0_2_;
            auVar235._12_2_ = auVar235._0_2_;
            auVar235._14_2_ = auVar235._0_2_;
            auVar235._16_2_ = auVar235._0_2_;
            auVar235._18_2_ = auVar235._0_2_;
            auVar235._20_2_ = auVar235._0_2_;
            auVar235._22_2_ = auVar235._0_2_;
            auVar235._24_2_ = auVar235._0_2_;
            auVar235._26_2_ = auVar235._0_2_;
            auVar235._28_2_ = auVar235._0_2_;
            auVar235._30_2_ = auVar235._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar235,0x80);
            auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
            auVar154 = vpcmpgtw_avx2(auVar154,auVar105);
            auVar154 = vpblendvb_avx2(auVar155,auVar55,auVar154);
            *(undefined1 (*) [32])(local_2060 + lVar19 * 0x20) = auVar154;
            uVar12 = (ulong)(uint)((int)uVar12 + dy);
          }
          else {
            do {
              *(undefined1 (*) [32])(local_2060 + lVar24) = auVar55;
              lVar24 = lVar24 + 0x20;
            } while (lVar24 != 0x400);
          }
          if (0x2e < (int)uVar13) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x20;
        } while (lVar19 != 0x20);
      }
      else {
        auVar84._8_4_ = 0x10;
        auVar84._0_8_ = 0x1000000010;
        auVar84._12_4_ = 0x10;
        auVar84._16_4_ = 0x10;
        auVar84._20_4_ = 0x10;
        auVar84._24_4_ = 0x10;
        auVar84._28_4_ = 0x10;
        auVar277 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar112._8_2_ = 0x2e;
        auVar112._0_8_ = 0x2e002e002e002e;
        auVar112._10_2_ = 0x2e;
        auVar112._12_2_ = 0x2e;
        auVar112._14_2_ = 0x2e;
        auVar112._16_2_ = 0x2e;
        auVar112._18_2_ = 0x2e;
        auVar112._20_2_ = 0x2e;
        auVar112._22_2_ = 0x2e;
        auVar112._24_2_ = 0x2e;
        auVar112._26_2_ = 0x2e;
        auVar112._28_2_ = 0x2e;
        auVar112._30_2_ = 0x2e;
        lVar19 = 0;
        uVar12 = (ulong)(uint)dy;
        do {
          uVar13 = (int)uVar12 >> 6;
          lVar24 = lVar9;
          if ((int)uVar13 < 0x2f) {
            uVar17 = (uint)(uVar12 >> 1);
            uVar18 = uVar17 & 0x1f;
            auVar135._0_8_ = CONCAT44(uVar17,uVar17) & 0x1f0000001f;
            auVar135._8_4_ = uVar18;
            auVar135._12_4_ = uVar18;
            auVar135._16_4_ = uVar18;
            auVar135._20_4_ = uVar18;
            auVar135._24_4_ = uVar18;
            auVar135._28_4_ = uVar18;
            auVar185 = auVar38;
            if ((int)uVar13 < 0x27) {
              auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar13 + 8));
              auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar13 + 9));
              auVar155 = vpsubd_avx2(auVar155,auVar154);
              auVar154 = vpslld_avx2(auVar154,5);
              auVar155 = vpmulld_avx2(auVar155,auVar135);
              auVar154 = vpaddd_avx2(auVar154,auVar84);
              auVar154 = vpaddd_avx2(auVar155,auVar154);
              auVar154 = vpsrld_avx2(auVar154,5);
              auVar181._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar154._16_16_;
              auVar181._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
              auVar154 = vpackusdw_avx2(auVar154,auVar181);
              auVar185 = auVar154._0_16_;
            }
            auVar154 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar13));
            auVar155 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar13 + 1));
            auVar155 = vpsubd_avx2(auVar155,auVar154);
            auVar154 = vpslld_avx2(auVar154,5);
            auVar155 = vpmulld_avx2(auVar155,auVar135);
            auVar154 = vpaddd_avx2(auVar154,auVar84);
            auVar154 = vpaddd_avx2(auVar155,auVar154);
            auVar154 = vpsrld_avx2(auVar154,5);
            auVar154 = vpackusdw_avx2(auVar154,ZEXT1632(auVar154._16_16_));
            auVar136._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar154._0_16_;
            auVar136._16_16_ = ZEXT116(0) * auVar154._16_16_ + ZEXT116(1) * auVar185;
            auVar148._0_2_ = (undefined2)uVar13;
            auVar148._2_2_ = auVar148._0_2_;
            auVar148._4_2_ = auVar148._0_2_;
            auVar148._6_2_ = auVar148._0_2_;
            auVar148._8_2_ = auVar148._0_2_;
            auVar148._10_2_ = auVar148._0_2_;
            auVar148._12_2_ = auVar148._0_2_;
            auVar148._14_2_ = auVar148._0_2_;
            auVar185 = vpaddw_avx(auVar148,auVar277);
            auVar278 = vpslldq_avx(auVar185,2);
            auVar278 = vpblendw_avx(auVar278,ZEXT416(uVar13),1);
            auVar185 = vpsrldq_avx(auVar185,0xe);
            auVar167._0_16_ = ZEXT116(0) * auVar185 + ZEXT116(1) * auVar38;
            auVar167._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar185;
            auVar259._0_2_ = (undefined2)(uVar13 + 9);
            auVar259._2_2_ = auVar259._0_2_;
            auVar259._4_2_ = auVar259._0_2_;
            auVar259._6_2_ = auVar259._0_2_;
            auVar259._8_2_ = auVar259._0_2_;
            auVar259._10_2_ = auVar259._0_2_;
            auVar259._12_2_ = auVar259._0_2_;
            auVar259._14_2_ = auVar259._0_2_;
            auVar259._16_2_ = auVar259._0_2_;
            auVar259._18_2_ = auVar259._0_2_;
            auVar259._20_2_ = auVar259._0_2_;
            auVar259._22_2_ = auVar259._0_2_;
            auVar259._24_2_ = auVar259._0_2_;
            auVar259._26_2_ = auVar259._0_2_;
            auVar259._28_2_ = auVar259._0_2_;
            auVar259._30_2_ = auVar259._0_2_;
            auVar154 = vpblendw_avx2(auVar167,auVar259,2);
            auVar260._0_2_ = (undefined2)(uVar13 + 10);
            auVar260._2_2_ = auVar260._0_2_;
            auVar260._4_2_ = auVar260._0_2_;
            auVar260._6_2_ = auVar260._0_2_;
            auVar260._8_2_ = auVar260._0_2_;
            auVar260._10_2_ = auVar260._0_2_;
            auVar260._12_2_ = auVar260._0_2_;
            auVar260._14_2_ = auVar260._0_2_;
            auVar260._16_2_ = auVar260._0_2_;
            auVar260._18_2_ = auVar260._0_2_;
            auVar260._20_2_ = auVar260._0_2_;
            auVar260._22_2_ = auVar260._0_2_;
            auVar260._24_2_ = auVar260._0_2_;
            auVar260._26_2_ = auVar260._0_2_;
            auVar260._28_2_ = auVar260._0_2_;
            auVar260._30_2_ = auVar260._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar260,4);
            auVar261._0_2_ = (undefined2)(uVar13 + 0xb);
            auVar261._2_2_ = auVar261._0_2_;
            auVar261._4_2_ = auVar261._0_2_;
            auVar261._6_2_ = auVar261._0_2_;
            auVar261._8_2_ = auVar261._0_2_;
            auVar261._10_2_ = auVar261._0_2_;
            auVar261._12_2_ = auVar261._0_2_;
            auVar261._14_2_ = auVar261._0_2_;
            auVar261._16_2_ = auVar261._0_2_;
            auVar261._18_2_ = auVar261._0_2_;
            auVar261._20_2_ = auVar261._0_2_;
            auVar261._22_2_ = auVar261._0_2_;
            auVar261._24_2_ = auVar261._0_2_;
            auVar261._26_2_ = auVar261._0_2_;
            auVar261._28_2_ = auVar261._0_2_;
            auVar261._30_2_ = auVar261._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar261,8);
            auVar262._0_2_ = (undefined2)(uVar13 + 0xc);
            auVar262._2_2_ = auVar262._0_2_;
            auVar262._4_2_ = auVar262._0_2_;
            auVar262._6_2_ = auVar262._0_2_;
            auVar262._8_2_ = auVar262._0_2_;
            auVar262._10_2_ = auVar262._0_2_;
            auVar262._12_2_ = auVar262._0_2_;
            auVar262._14_2_ = auVar262._0_2_;
            auVar262._16_2_ = auVar262._0_2_;
            auVar262._18_2_ = auVar262._0_2_;
            auVar262._20_2_ = auVar262._0_2_;
            auVar262._22_2_ = auVar262._0_2_;
            auVar262._24_2_ = auVar262._0_2_;
            auVar262._26_2_ = auVar262._0_2_;
            auVar262._28_2_ = auVar262._0_2_;
            auVar262._30_2_ = auVar262._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar262,0x10);
            auVar263._0_2_ = (undefined2)(uVar13 + 0xd);
            auVar263._2_2_ = auVar263._0_2_;
            auVar263._4_2_ = auVar263._0_2_;
            auVar263._6_2_ = auVar263._0_2_;
            auVar263._8_2_ = auVar263._0_2_;
            auVar263._10_2_ = auVar263._0_2_;
            auVar263._12_2_ = auVar263._0_2_;
            auVar263._14_2_ = auVar263._0_2_;
            auVar263._16_2_ = auVar263._0_2_;
            auVar263._18_2_ = auVar263._0_2_;
            auVar263._20_2_ = auVar263._0_2_;
            auVar263._22_2_ = auVar263._0_2_;
            auVar263._24_2_ = auVar263._0_2_;
            auVar263._26_2_ = auVar263._0_2_;
            auVar263._28_2_ = auVar263._0_2_;
            auVar263._30_2_ = auVar263._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar263,0x20);
            auVar264._0_2_ = (undefined2)(uVar13 + 0xe);
            auVar264._2_2_ = auVar264._0_2_;
            auVar264._4_2_ = auVar264._0_2_;
            auVar264._6_2_ = auVar264._0_2_;
            auVar264._8_2_ = auVar264._0_2_;
            auVar264._10_2_ = auVar264._0_2_;
            auVar264._12_2_ = auVar264._0_2_;
            auVar264._14_2_ = auVar264._0_2_;
            auVar264._16_2_ = auVar264._0_2_;
            auVar264._18_2_ = auVar264._0_2_;
            auVar264._20_2_ = auVar264._0_2_;
            auVar264._22_2_ = auVar264._0_2_;
            auVar264._24_2_ = auVar264._0_2_;
            auVar264._26_2_ = auVar264._0_2_;
            auVar264._28_2_ = auVar264._0_2_;
            auVar264._30_2_ = auVar264._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar264,0x40);
            auVar265._0_2_ = (undefined2)(uVar13 + 0xf);
            auVar265._2_2_ = auVar265._0_2_;
            auVar265._4_2_ = auVar265._0_2_;
            auVar265._6_2_ = auVar265._0_2_;
            auVar265._8_2_ = auVar265._0_2_;
            auVar265._10_2_ = auVar265._0_2_;
            auVar265._12_2_ = auVar265._0_2_;
            auVar265._14_2_ = auVar265._0_2_;
            auVar265._16_2_ = auVar265._0_2_;
            auVar265._18_2_ = auVar265._0_2_;
            auVar265._20_2_ = auVar265._0_2_;
            auVar265._22_2_ = auVar265._0_2_;
            auVar265._24_2_ = auVar265._0_2_;
            auVar265._26_2_ = auVar265._0_2_;
            auVar265._28_2_ = auVar265._0_2_;
            auVar265._30_2_ = auVar265._0_2_;
            auVar154 = vpblendw_avx2(auVar154,auVar265,0x80);
            auVar154 = vpblendd_avx2(ZEXT1632(auVar278),auVar154,0xf0);
            auVar154 = vpcmpgtw_avx2(auVar154,auVar112);
            auVar154 = vpblendvb_avx2(auVar136,auVar55,auVar154);
            *(undefined1 (*) [32])(local_2060 + lVar19 * 0x20) = auVar154;
            uVar12 = (ulong)(uint)((int)uVar12 + dy);
          }
          else {
            do {
              *(undefined1 (*) [32])(local_2060 + lVar24) = auVar55;
              lVar24 = lVar24 + 0x20;
            } while (lVar24 != 0x400);
          }
          if (0x2e < (int)uVar13) break;
          lVar19 = lVar19 + 1;
          lVar9 = lVar9 + 0x20;
        } while (lVar19 != 0x20);
      }
      lVar9 = 0;
      do {
        lVar19 = lVar9 * 0x20;
        auVar154 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_2060 + lVar19),
                                   *(undefined1 (*) [32])(local_2040 + lVar19));
        auVar155 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_2020 + lVar19),
                                   *(undefined1 (*) [32])(local_2000 + lVar19));
        auVar210 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1fe0 + lVar19),
                                   *(undefined1 (*) [32])(local_1fc0 + lVar19));
        auVar381 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1fa0 + lVar19),
                                   *(undefined1 (*) [32])(local_1f80 + lVar19));
        auVar42 = vpunpckldq_avx2(auVar154,auVar155);
        auVar73 = vpunpckldq_avx2(auVar210,auVar381);
        _local_2660 = vpunpcklqdq_avx2(auVar42,auVar73);
        local_2640 = vpunpckhqdq_avx2(auVar42,auVar73);
        auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
        auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
        local_2620 = vpunpcklqdq_avx2(auVar154,auVar155);
        local_2600 = vpunpckhqdq_avx2(auVar154,auVar155);
        auVar154 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_2060 + lVar19),
                                   *(undefined1 (*) [32])(local_2040 + lVar19));
        auVar155 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_2020 + lVar19),
                                   *(undefined1 (*) [32])(local_2000 + lVar19));
        auVar210 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1fe0 + lVar19),
                                   *(undefined1 (*) [32])(local_1fc0 + lVar19));
        auVar381 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1fa0 + lVar19),
                                   *(undefined1 (*) [32])(local_1f80 + lVar19));
        auVar42 = vpunpckldq_avx2(auVar154,auVar155);
        auVar73 = vpunpckldq_avx2(auVar210,auVar381);
        local_25e0 = vpunpcklqdq_avx2(auVar42,auVar73);
        local_25c0 = vpunpckhqdq_avx2(auVar42,auVar73);
        auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
        auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
        local_25a0 = vpunpcklqdq_avx2(auVar154,auVar155);
        local_2580 = vpunpckhqdq_avx2(auVar154,auVar155);
        auVar154 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1f60 + lVar19),
                                   *(undefined1 (*) [32])(local_1f40 + lVar19));
        auVar155 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1f20 + lVar19),
                                   *(undefined1 (*) [32])(local_1f00 + lVar19));
        auVar210 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1ee0 + lVar19),
                                   *(undefined1 (*) [32])(local_1ec0 + lVar19));
        auVar381 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_1ea0 + lVar19),
                                   *(undefined1 (*) [32])(local_1e80 + lVar19));
        auVar42 = vpunpckldq_avx2(auVar154,auVar155);
        auVar73 = vpunpckldq_avx2(auVar210,auVar381);
        local_2560 = vpunpcklqdq_avx2(auVar42,auVar73);
        local_2540 = vpunpckhqdq_avx2(auVar42,auVar73);
        auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
        auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
        local_2520 = vpunpcklqdq_avx2(auVar154,auVar155);
        local_2500 = vpunpckhqdq_avx2(auVar154,auVar155);
        auVar154 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1f60 + lVar19),
                                   *(undefined1 (*) [32])(local_1f40 + lVar19));
        auVar155 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1f20 + lVar19),
                                   *(undefined1 (*) [32])(local_1f00 + lVar19));
        auVar210 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1ee0 + lVar19),
                                   *(undefined1 (*) [32])(local_1ec0 + lVar19));
        auVar381 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_1ea0 + lVar19),
                                   *(undefined1 (*) [32])(local_1e80 + lVar19));
        auVar42 = vpunpckldq_avx2(auVar154,auVar155);
        auVar73 = vpunpckldq_avx2(auVar210,auVar381);
        local_24e0 = vpunpcklqdq_avx2(auVar42,auVar73);
        local_24c0 = vpunpckhqdq_avx2(auVar42,auVar73);
        auVar154 = vpunpckhdq_avx2(auVar154,auVar155);
        auVar155 = vpunpckhdq_avx2(auVar210,auVar381);
        local_24a0 = vpunpcklqdq_avx2(auVar154,auVar155);
        local_2480 = vpunpckhqdq_avx2(auVar154,auVar155);
        lVar19 = 0;
        do {
          auVar154 = *(undefined1 (*) [32])(local_2560 + lVar19);
          auVar155 = vperm2i128_avx2(auVar154,*(undefined1 (*) [32])(local_2660 + lVar19),2);
          auVar59._0_16_ =
               ZEXT116(1) * *(undefined1 (*) [16])(local_2660 + lVar19 + 0x10) +
               ZEXT116(0) * auVar154._0_16_;
          auVar59._16_16_ =
               ZEXT116(1) * auVar154._16_16_ +
               ZEXT116(0) * *(undefined1 (*) [16])(local_2660 + lVar19 + 0x10);
          *(undefined1 (*) [32])((long)auStack_2260 + lVar19) = auVar155;
          *(undefined1 (*) [32])(auStack_2160 + lVar19) = auVar59;
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0x100);
        lVar19 = 0;
        puVar10 = dst;
        do {
          uVar5 = *(undefined8 *)((long)auStack_2260 + lVar19 + 8);
          uVar7 = *(undefined8 *)((long)auStack_2260 + lVar19 + 0x10);
          uVar8 = *(undefined8 *)((long)auStack_2260 + lVar19 + 0x18);
          *(undefined8 *)puVar10 = *(undefined8 *)((long)auStack_2260 + lVar19);
          *(undefined8 *)(puVar10 + 4) = uVar5;
          *(undefined8 *)(puVar10 + 8) = uVar7;
          *(undefined8 *)(puVar10 + 0xc) = uVar8;
          lVar19 = lVar19 + 0x20;
          puVar10 = puVar10 + stride;
        } while (lVar19 != 0x200);
        dst = dst + 0x10;
        bVar26 = lVar9 == 0;
        lVar9 = lVar9 + 0x10;
      } while (bVar26);
      break;
    case 7:
      uStackY_2688 = 0x99773b;
      highbd_dr_prediction_z1_32xN_avx2
                (0x40,(uint16_t *)local_2060,0x20,left,dy,bd,in_stack_ffffffffffffd980);
      pitchSrc = 0x20;
      iVar14 = 0x40;
      iVar23 = 0x20;
      goto LAB_009999d2;
    }
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z3_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_left,
                                      int dx, int dy, int bd) {
  (void)above;
  (void)dx;

  assert(dx == 1);
  assert(dy > 0);
  if (bw == bh) {
    switch (bw) {
      case 4:
        highbd_dr_prediction_z3_4x4_avx2(dst, stride, left, upsample_left, dy,
                                         bd);
        break;
      case 8:
        highbd_dr_prediction_z3_8x8_avx2(dst, stride, left, upsample_left, dy,
                                         bd);
        break;
      case 16:
        highbd_dr_prediction_z3_16x16_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
      case 32:
        highbd_dr_prediction_z3_32x32_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
      case 64:
        highbd_dr_prediction_z3_64x64_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            highbd_dr_prediction_z3_4x8_avx2(dst, stride, left, upsample_left,
                                             dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_8x16_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_16x32_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
          case 32:
            highbd_dr_prediction_z3_32x64_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            highbd_dr_prediction_z3_4x16_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_8x32_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_16x64_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            highbd_dr_prediction_z3_8x4_avx2(dst, stride, left, upsample_left,
                                             dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_16x8_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_32x16_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
          case 32:
            highbd_dr_prediction_z3_64x32_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            highbd_dr_prediction_z3_16x4_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_32x8_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_64x16_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
  return;
}